

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void * generate_func_code(MIR_context_t ctx,MIR_item_t func_item,int machine_code_p)

{
  DLIST_LINK_bb_t *pDVar1;
  size_t *psVar2;
  MIR_insn_t pMVar3;
  bitmap_t *ppVVar4;
  undefined1 (*pauVar5) [32];
  undefined8 uVar6;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar7 [32];
  undefined8 uVar10;
  undefined2 uVar11;
  undefined4 uVar12;
  uint uVar13;
  gen_ctx_t gen_ctx;
  void *pvVar14;
  MIR_context_t pMVar15;
  MIR_func_t pMVar16;
  MIR_item_t_conflict func_item_00;
  VARR_MIR_op_t *varr;
  MIR_lref_data *pMVar17;
  VARR_mem_expr_t *pVVar18;
  VARR_bb_t *varr_00;
  VARR_expr_t *pVVar19;
  MIR_context_t ctx_00;
  MIR_func_t func;
  undefined8 *puVar20;
  undefined8 *puVar21;
  ssa_edge_t_conflict ssa_edge;
  long *plVar22;
  edge_t_conflict e;
  in_edge_t peVar23;
  in_edge_t peVar24;
  in_edge_t peVar25;
  VARR_mv_t *pVVar26;
  loop_node_t plVar27;
  var_ref_t *pvVar28;
  MIR_insn_t pMVar29;
  bb_insn_t pbVar30;
  const_bitmap_t bm;
  target_ctx *ptVar31;
  VARR_uint8_t *varr_01;
  uint8_t *base;
  MIR_item_t pMVar32;
  undefined1 auVar33 [16];
  undefined8 uVar34;
  undefined8 uVar35;
  MIR_insn_t pMVar36;
  MIR_insn_t pMVar37;
  void *pvVar38;
  MIR_insn_t *ppMVar39;
  MIR_disp_t MVar40;
  MIR_disp_t MVar41;
  MIR_insn_t pMVar42;
  MIR_op_t obj;
  MIR_op_t op;
  undefined1 auVar43 [32];
  anon_union_32_12_57d33f68_for_u aVar44;
  undefined1 auVar45 [32];
  anon_union_32_12_57d33f68_for_u aVar46;
  anon_union_32_12_57d33f68_for_u aVar47;
  undefined1 uVar48;
  undefined1 uVar51;
  undefined6 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  undefined8 uVar166;
  undefined1 uVar57;
  undefined1 uVar60;
  undefined6 uVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined8 uVar168;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  MIR_insn_code_t code;
  bool bVar68;
  bool bVar69;
  undefined1 auVar70 [32];
  DLIST_LINK_MIR_insn_t DVar71;
  char cVar72;
  undefined6 uVar73;
  char cVar74;
  MIR_reg_t MVar76;
  uint uVar77;
  int iVar78;
  MIR_type_t MVar79;
  MIR_reg_t MVar80;
  int iVar81;
  MIR_op_mode_t MVar82;
  MIR_reg_t MVar83;
  int iVar84;
  MIR_reg_t var_00;
  int iVar85;
  uint uVar86;
  uint uVar87;
  char *pcVar88;
  func_cfg_t pfVar89;
  size_t sVar90;
  FILE *pFVar91;
  FILE *pFVar92;
  MIR_insn_t_conflict pMVar93;
  MIR_op_t *pMVar94;
  bb_t_conflict pbVar95;
  bb_t_conflict pbVar96;
  FILE *pFVar97;
  FILE *pFVar98;
  MIR_insn_t pMVar99;
  VARR_reg_info_t *pVVar100;
  reg_info_t *prVar101;
  bitmap_t pVVar102;
  bb_insn_t_conflict pbVar103;
  MIR_insn_t_conflict pMVar104;
  mem_expr_t pmVar105;
  mem_expr_t *__ptr;
  bb_t_conflict *__base;
  DLIST_bb_t *pDVar106;
  char *pcVar107;
  MIR_insn_t_conflict pMVar108;
  MIR_insn_t_conflict pMVar109;
  MIR_insn_t_conflict pMVar110;
  _IO_FILE *p_Var111;
  MIR_insn_t_conflict by;
  bb_t_conflict pbVar112;
  mem_attr_t *pmVar113;
  DLIST_out_edge_t *pDVar114;
  MIR_op_t *pMVar115;
  FILE *pFVar116;
  bb_t pbVar117;
  in_edge_t_conflict peVar118;
  mv_t *__ptr_00;
  bb_insn_t pbVar119;
  combine_ctx *pcVar120;
  loop_node_t_conflict plVar121;
  size_t sVar122;
  uint8_t *puVar123;
  uint64_t uVar124;
  uint8_t *puVar125;
  int64_t iVar126;
  MIR_code_reloc_t *relocs;
  DLIST_MIR_insn_t *pDVar127;
  bool bVar128;
  MIR_insn_code_t MVar129;
  bb_insn_t_conflict use;
  FILE *pFVar130;
  uint uVar131;
  long lVar132;
  int i;
  MIR_insn_code_t MVar133;
  MIR_lref_data **ppMVar134;
  long lVar135;
  DLIST_bb_insn_t *pDVar136;
  MIR_insn_t pMVar137;
  MIR_insn_code_t code_00;
  bb_t *ppbVar138;
  ulong uVar139;
  DLIST_in_edge_t *pDVar140;
  size_t sVar141;
  bb_insn_t_conflict def;
  size_t __nmemb;
  ulong ix;
  loop_node_t_conflict plVar142;
  VARR_MIR_insn_t *pVVar143;
  bb_t pbVar144;
  VARR_MIR_reg_t *pVVar145;
  size_t i_1;
  anon_union_32_12_57d33f68_for_u *paVar146;
  bb_insn_t pbVar147;
  in_edge_t_conflict peVar148;
  ulong uVar149;
  anon_union_32_12_57d33f68_for_u *paVar150;
  long lVar151;
  uint *puVar152;
  MIR_reg_t *pMVar153;
  void **ppvVar154;
  ulong uVar155;
  bool bVar156;
  bool bVar157;
  undefined1 auVar159 [16];
  double dVar160;
  double dVar161;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 in_ZMM1 [64];
  mv_t mVar164;
  MIR_code_reloc_t obj_00;
  size_t sStackY_4a0;
  MIR_context_t local_400;
  bb_t_conflict local_3f8;
  size_t *local_3f0;
  bb_t_conflict local_3e8;
  FILE *local_3e0;
  MIR_reg_t last_reg1;
  MIR_insn_t_conflict local_3c0;
  int out_p_1;
  undefined4 uStack_3a4;
  undefined1 auStack_3a0 [8];
  undefined1 auStack_398 [8];
  MIR_op_t *pMStack_390;
  char *local_388;
  MIR_context_t local_378;
  int local_36c;
  int op_num_1;
  undefined4 uStack_364;
  MIR_insn_t pMStack_360;
  anon_union_32_12_57d33f68_for_u aStack_358;
  MIR_insn_t_conflict local_338;
  MIR_reg_t var_1;
  undefined4 uStack_324;
  char *pcStack_320;
  anon_union_32_12_57d33f68_for_u aStack_318;
  bb_t_conflict local_2f0;
  int op_num;
  MIR_item_t local_2e0;
  MIR_reg_t var;
  MIR_op_t *op_ref;
  int64_t c;
  MIR_reg_t type_regs [19];
  int out_p;
  MIR_op_t temp_op;
  MIR_op_t local_f8 [2];
  insn_var_iterator_t iter;
  undefined2 uVar49;
  undefined8 uVar50;
  undefined1 auVar165 [24];
  undefined2 uVar58;
  undefined8 uVar59;
  undefined1 auVar167 [24];
  ushort uVar75;
  undefined8 uVar158;
  
  gen_ctx = ctx->gen_ctx;
  local_378 = ctx;
  local_36c = machine_code_p;
  dVar160 = real_usec_time();
  if ((func_item->item_type != MIR_func_item) || (func_item->data != (void *)0x0)) {
    __assert_fail("func_item->item_type == MIR_func_item && func_item->data == ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x240e,"void *generate_func_code(MIR_context_t, MIR_item_t, int)");
  }
  if (((func_item->u).func)->machine_code != (void *)0x0) {
    pvVar14 = ((func_item->u).func)->call_addr;
    if (pvVar14 == (void *)0x0) {
      __assert_fail("func_item->u.func->call_addr != ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x2410,"void *generate_func_code(MIR_context_t, MIR_item_t, int)");
    }
    ppvVar154 = &func_item->addr;
    _MIR_redirect_thunk(local_378,func_item->addr,pvVar14);
    pFVar130 = (FILE *)gen_ctx->debug_file;
    if ((pFVar130 != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      pcVar88 = MIR_item_name(local_378,func_item);
      fprintf(pFVar130,"+++++++++++++The code for %s has been already generated\n",pcVar88);
    }
LAB_00129a53:
    return *ppvVar154;
  }
  pFVar130 = (FILE *)gen_ctx->debug_file;
  if ((pFVar130 != (FILE *)0x0) && (-1 < gen_ctx->debug_level)) {
    pcVar88 = MIR_item_name(local_378,func_item);
    fprintf(pFVar130,"Code generation of function %s:\n",pcVar88);
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fwrite("+++++++++++++MIR before generator:\n",0x23,1,(FILE *)gen_ctx->debug_file);
      MIR_output_item(local_378,gen_ctx->debug_file,func_item);
    }
  }
  gen_ctx->curr_func_item = func_item;
  _MIR_duplicate_func_insns(local_378,func_item);
  pfVar89 = (func_cfg_t)gen_malloc(gen_ctx,0x30);
  func_item->data = pfVar89;
  gen_ctx->curr_cfg = pfVar89;
  pMVar15 = gen_ctx->ctx;
  pMVar16 = (gen_ctx->curr_func_item->u).func;
  (pfVar89->bbs).head = (bb_t_conflict)0x0;
  (pfVar89->bbs).tail = (bb_t_conflict)0x0;
  pfVar89->max_var = 0x21;
  pfVar89->curr_bb_insn_index = 0;
  pfVar89->root_loop_node = (loop_node_t_conflict)0x0;
  gen_ctx->curr_bb_index = 0;
  local_2e0 = func_item;
  for (uVar149 = 0; sVar90 = VARR_MIR_var_tlength(pMVar16->vars), uVar149 < sVar90;
      uVar149 = uVar149 + 1) {
    VARR_MIR_var_tget((MIR_var_t *)type_regs,pMVar16->vars,uVar149);
    MVar76 = MIR_reg(pMVar15,(char *)type_regs._8_8_,pMVar16);
    uVar77 = MVar76 + 0x21;
    if ((uVar77 != 0xffffffff) && (gen_ctx->curr_cfg->max_var < uVar77)) {
      gen_ctx->curr_cfg->max_var = uVar77;
    }
  }
  local_3f8 = (bb_t_conflict)0x0;
  pFVar91 = (FILE *)create_bb(gen_ctx,(MIR_insn_t)0x0);
  add_new_bb(gen_ctx,(bb_t_conflict)pFVar91);
  pFVar92 = (FILE *)create_bb(gen_ctx,(MIR_insn_t)0x0);
  add_new_bb(gen_ctx,(bb_t_conflict)pFVar92);
  func_item_00 = gen_ctx->curr_func_item;
  pMVar93 = MIR_new_label(pMVar15);
  MIR_prepend_insn(pMVar15,func_item_00,pMVar93);
  local_3e8 = create_bb(gen_ctx,(MIR_insn_t)0x0);
  pbVar96 = local_3e8;
  add_new_bb(gen_ctx,local_3e8);
  bitmap_clear(gen_ctx->tied_regs);
  bitmap_clear(gen_ctx->addr_regs);
  gen_ctx->addr_insn_p = 0;
  VARR_MIR_insn_ttrunc(gen_ctx->temp_insns,(size_t)pbVar96);
  VARR_MIR_insn_ttrunc(gen_ctx->temp_insns2,(size_t)pbVar96);
  local_3e0 = (FILE *)(pMVar16->insns).head;
LAB_00121ee0:
LAB_00121ef0:
  pbVar112 = (bb_t_conflict)local_3e0;
  if (pbVar112 != (bb_t_conflict)0x0) {
    local_3e0 = (FILE *)pbVar112->rpost;
    iVar78 = (int)pbVar112->bfs;
    if (iVar78 - 0x22U < 0xfffffffc) {
      if (iVar78 == 0xab) {
        if (local_3f8 == (bb_t_conflict)0x0) {
          if (pMVar16->global_vars != (VARR_MIR_var_t *)0x0) goto code_r0x00121f4a;
        }
        else if (local_3f8 != pbVar112) {
          __assert_fail("ret_insn == insn",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x63a,"void build_func_cfg(gen_ctx_t)");
        }
      }
      else if (0xfffffffc < iVar78 - 0xaaU) {
        local_3e8->call_p = '\x01';
      }
    }
    else {
      gen_ctx->addr_insn_p = 1;
      bitmap_set_bit_p(gen_ctx->addr_regs,(ulong)(*(int *)&pbVar112->call_p + 0x21));
    }
    local_3f0 = &pbVar112->bfs;
    if (pbVar112->index == 0) {
      if (gen_ctx->optimize_level == 0) {
        setup_insn_data(gen_ctx,(MIR_insn_t)pbVar112,local_3e8);
      }
      else {
        add_new_bb_insn(gen_ctx,(MIR_insn_t)pbVar112,local_3e8,1);
      }
    }
    if ((int)*local_3f0 == 0xa6) {
      pVVar143 = gen_ctx->temp_insns;
      pbVar96 = pbVar112;
LAB_00122147:
      VARR_MIR_insn_tpush(pVVar143,(MIR_insn_t)pbVar96);
    }
    else if ((int)*local_3f0 == 0xa5) {
      if (*(char *)&(pbVar112->bb_insns).tail != '\f') {
        __assert_fail("insn->ops[1].mode == MIR_OP_LABEL",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x6f6,"void build_func_cfg(gen_ctx_t)");
      }
      pVVar143 = gen_ctx->temp_insns2;
      pbVar96 = *(bb_t_conflict *)&pbVar112->call_p;
      goto LAB_00122147;
    }
    pbVar96 = pbVar112;
    sVar90 = MIR_insn_nops(pMVar15,(MIR_insn_t_conflict)pbVar112);
    if ((local_3e0 == (FILE *)0x0) ||
       (((int)*local_3f0 - 0xa5U < 0xffffffd1 &&
        (((uVar77 = (int)*local_3f0 - 0xa6, 0x12 < uVar77 ||
          ((0x60071U >> (uVar77 & 0x1f) & 1) == 0)) &&
         ((int)((bb_t_conflict)local_3e0)->bfs != 0xb4)))))) {
      _last_reg1 = local_3e8;
    }
    else {
      if (((int)((bb_t_conflict)local_3e0)->bfs == 0xb4) &&
         ((void *)((bb_t_conflict)local_3e0)->index != (void *)0x0)) {
        _last_reg1 = get_insn_bb(gen_ctx,(MIR_insn_t)local_3e0);
      }
      else {
        _last_reg1 = create_bb(gen_ctx,(MIR_insn_t)local_3e0);
      }
      pbVar96 = _last_reg1;
      add_new_bb(gen_ctx,_last_reg1);
      uVar77 = (int)*local_3f0 - 0x76;
      if ((0x36 < uVar77) || ((0x71000000000001U >> ((ulong)uVar77 & 0x3f) & 1) == 0)) {
        create_edge(gen_ctx,local_3e8,_last_reg1,1,1);
        pbVar96 = local_3e8;
      }
    }
    ppbVar138 = &(pbVar112->bb_link).next;
    while (bVar156 = sVar90 != 0, sVar90 = sVar90 - 1, bVar156) {
      uVar75 = *(ushort *)ppbVar138;
      if ((char)uVar75 == '\n') {
        uVar75 = uVar75 | 0xb;
        auVar33 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
        *(ushort *)ppbVar138 = uVar75;
        auVar162._8_8_ = 0;
        auVar162._0_8_ = ppbVar138[3];
        uVar149 = vptestmd_avx512vl(auVar162,auVar162);
        uVar149 = uVar149 & 0xf;
        auVar159._8_4_ = 0x21;
        auVar159._0_8_ = 0x2100000021;
        auVar159._12_4_ = 0x21;
        auVar163._8_8_ = 0;
        auVar163._0_8_ = ppbVar138[3];
        auVar159 = vpaddd_avx512vl(auVar163,auVar159);
        bVar156 = (bool)((byte)uVar149 & 1);
        bVar157 = (bool)((byte)(uVar149 >> 1) & 1);
        uVar158 = CONCAT44((uint)bVar157 * auVar159._4_4_ | (uint)!bVar157 * auVar33._4_4_,
                           (uint)bVar156 * auVar159._0_4_ | (uint)!bVar156 * auVar33._0_4_);
        bVar156 = (bool)((byte)(uVar149 >> 2) & 1);
        bVar157 = SUB81(uVar149 >> 3,0);
        in_ZMM1 = ZEXT1664(CONCAT412((uint)bVar157 * auVar159._12_4_ |
                                     (uint)!bVar157 * auVar33._12_4_,
                                     CONCAT48((uint)bVar156 * auVar159._8_4_ |
                                              (uint)!bVar156 * auVar33._8_4_,uVar158)));
        ppbVar138[3] = (bb_t)uVar158;
      }
      else if ((char)uVar75 == '\x01') {
        uVar75 = uVar75 & 0xff00 | 2;
        *(ushort *)ppbVar138 = uVar75;
        *(uint *)(ppbVar138 + 1) =
             -(uint)(*(int *)(ppbVar138 + 1) == 0) | *(int *)(ppbVar138 + 1) + 0x21U;
      }
      cVar74 = (char)uVar75;
      if (cVar74 == '\x02') {
        uVar77 = *(uint *)(ppbVar138 + 1);
        pbVar96 = (bb_t_conflict)0xffffffffffffffff;
        if (uVar77 != 0xffffffff) {
          if (gen_ctx->curr_cfg->max_var < uVar77) {
            gen_ctx->curr_cfg->max_var = uVar77;
            pbVar96 = (bb_t_conflict)(ulong)*(uint *)(ppbVar138 + 1);
          }
          else {
            pbVar96 = (bb_t_conflict)(ulong)uVar77;
          }
        }
LAB_001223c3:
        update_tied_regs(gen_ctx,(MIR_reg_t)pbVar96);
      }
      else {
        if (cVar74 == '\v') {
          uVar77 = *(uint *)(ppbVar138 + 3);
          MVar76 = 0xffffffff;
          if ((uVar77 != 0xffffffff) && (MVar76 = uVar77, gen_ctx->curr_cfg->max_var < uVar77)) {
            gen_ctx->curr_cfg->max_var = uVar77;
            MVar76 = *(MIR_reg_t *)(ppbVar138 + 3);
          }
          update_tied_regs(gen_ctx,MVar76);
          uVar77 = *(uint *)((long)ppbVar138 + 0x1c);
          pbVar96 = (bb_t_conflict)0xffffffffffffffff;
          if (uVar77 != 0xffffffff) {
            if (gen_ctx->curr_cfg->max_var < uVar77) {
              gen_ctx->curr_cfg->max_var = uVar77;
              uVar77 = *(uint *)((long)ppbVar138 + 0x1c);
            }
            pbVar96 = (bb_t_conflict)(ulong)uVar77;
          }
          goto LAB_001223c3;
        }
        if (cVar74 == '\f') {
          pbVar96 = ppbVar138[1];
          if ((void *)pbVar96->index == (void *)0x0) {
            create_bb(gen_ctx,(MIR_insn_t)pbVar96);
          }
          if ((int)*local_3f0 != 0xa5) {
            pbVar95 = get_insn_bb(gen_ctx,(MIR_insn_t)ppbVar138[1]);
            pbVar96 = get_insn_bb(gen_ctx,(MIR_insn_t)pbVar112);
            create_edge(gen_ctx,pbVar96,pbVar95,0,1);
          }
        }
      }
      ppbVar138 = ppbVar138 + 6;
    }
    local_3e8 = _last_reg1;
    goto LAB_00121ee0;
  }
  ppMVar134 = &pMVar16->first_lref;
  while( true ) {
    pMVar17 = *ppMVar134;
    pVVar143 = gen_ctx->temp_insns2;
    if (pMVar17 == (MIR_lref_data *)0x0) break;
    VARR_MIR_insn_tpush(pVVar143,pMVar17->label);
    if (pMVar17->label2 != (MIR_insn_t)0x0) {
      VARR_MIR_insn_tpush(gen_ctx->temp_insns2,pMVar17->label2);
    }
    ppMVar134 = &pMVar17->next;
  }
  if (pVVar143 == (VARR_MIR_insn_t *)0x0) {
    mir_varr_assert_fail("addr","MIR_insn_t");
  }
  pcVar88 = (char *)pVVar143->els_num;
  qsort(pVVar143->varr,(size_t)pcVar88,8,label_cmp);
  for (uVar149 = 0; sVar90 = VARR_MIR_insn_tlength(gen_ctx->temp_insns), uVar149 < sVar90;
      uVar149 = uVar149 + 1) {
    pcVar88 = (char *)VARR_MIR_insn_tget(gen_ctx->temp_insns,uVar149);
    if (*(int *)&((FILE *)pcVar88)->_IO_read_base != 0xa6) {
      __assert_fail("insn->code == MIR_JMPI",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x72d,"void build_func_cfg(gen_ctx_t)");
    }
    pFVar97 = (FILE *)get_insn_bb(gen_ctx,(MIR_insn_t)pcVar88);
    pMVar137 = (MIR_insn_t)0x0;
    for (pFVar116 = (FILE *)0x0; pFVar98 = (FILE *)VARR_MIR_insn_tlength(gen_ctx->temp_insns2),
        pFVar116 < pFVar98; pFVar116 = (FILE *)((long)&pFVar116->_flags + 1)) {
      pcVar88 = (char *)pFVar116;
      pMVar99 = VARR_MIR_insn_tget(gen_ctx->temp_insns2,(size_t)pFVar116);
      if (pMVar99 != pMVar137) {
        if (*(int *)&pMVar99->field_0x18 != 0xb4) {
          __assert_fail("insn2->code == MIR_LABEL",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x733,"void build_func_cfg(gen_ctx_t)");
        }
        pbVar96 = get_insn_bb(gen_ctx,pMVar99);
        pcVar88 = (char *)pFVar97;
        create_edge(gen_ctx,(bb_t_conflict)pFVar97,pbVar96,0,1);
        pMVar137 = pMVar99;
      }
    }
  }
  for (uVar149 = 0; sVar90 = VARR_MIR_insn_tlength(gen_ctx->temp_insns2), uVar149 < sVar90;
      uVar149 = uVar149 + 1) {
    pcVar88 = (char *)VARR_MIR_insn_tget(gen_ctx->temp_insns2,uVar149);
    if (*(int *)&((FILE *)pcVar88)->_IO_read_base != 0xb4) {
      __assert_fail("insn->code == MIR_LABEL",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x73b,"void build_func_cfg(gen_ctx_t)");
    }
    pbVar96 = get_insn_bb(gen_ctx,(MIR_insn_t)pcVar88);
    pbVar96->reachable_p = '\x01';
  }
  if (gen_ctx->optimize_level != 0) {
    remove_unreachable_bbs(gen_ctx);
  }
  pDVar106 = &gen_ctx->curr_cfg->bbs;
  while (pFVar97 = (FILE *)pDVar106->head, pFVar97 != (FILE *)0x0) {
    if ((pFVar97 != pFVar91) &&
       (((DLIST_in_edge_t *)&pFVar97->_IO_write_end)->head == (in_edge_t_conflict)0x0)) {
      pcVar88 = (char *)pFVar91;
      create_edge(gen_ctx,(bb_t_conflict)pFVar91,(bb_t_conflict)pFVar97,0,1);
    }
    if ((pFVar97 != pFVar92) &&
       (((DLIST_out_edge_t *)&pFVar97->_IO_buf_end)->head == (out_edge_t)0x0)) {
      pcVar88 = (char *)pFVar97;
      create_edge(gen_ctx,(bb_t_conflict)pFVar97,(bb_t_conflict)pFVar92,0,1);
    }
    pDVar106 = (DLIST_bb_t *)&pFVar97->_IO_write_ptr;
  }
  enumerate_bbs(gen_ctx);
  pfVar89 = gen_ctx->curr_cfg;
  pcVar107 = &DAT_00000018;
  pVVar100 = (VARR_reg_info_t *)malloc(0x18);
  pfVar89->reg_info = pVVar100;
  if (pVVar100 == (VARR_reg_info_t *)0x0) {
    mir_varr_error(pcVar107);
  }
  pVVar100->els_num = 0;
  pVVar100->size = 0x80;
  prVar101 = (reg_info_t *)malloc(0x800);
  pVVar100->varr = prVar101;
  pVVar102 = bitmap_create2((ulong)gen_ctx->curr_cfg->max_var);
  gen_ctx->curr_cfg->call_crossed_regs = pVVar102;
  if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
    fwrite("+++++++++++++MIR after building CFG:\n",0x25,1,(FILE *)gen_ctx->debug_file);
    pcVar88 = (char *)0x1;
    print_CFG(gen_ctx,1,0,1,0,(_func_void_gen_ctx_t_bb_t *)0x0);
  }
  if (1 < gen_ctx->optimize_level) {
    pcVar88 = (char *)0x0;
    if (gen_ctx->addr_insn_p == 0) {
      iVar78 = clone_bbs(gen_ctx);
      if (((iVar78 != 0) && ((FILE *)gen_ctx->debug_file != (FILE *)0x0)) &&
         (1 < gen_ctx->debug_level)) {
        fwrite("+++++++++++++MIR after cloning BBs:\n",0x24,1,(FILE *)gen_ctx->debug_file);
        pcVar88 = (char *)0x1;
        print_CFG(gen_ctx,1,0,1,0,(_func_void_gen_ctx_t_bb_t *)0x0);
      }
      if (gen_ctx->optimize_level < 2) goto LAB_001268ca;
      pcVar88 = (char *)(ulong)(gen_ctx->addr_insn_p == 0);
    }
    build_ssa(gen_ctx,(int)pcVar88);
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      pcVar88 = " for address transformation";
      if (gen_ctx->addr_insn_p == 0) {
        pcVar88 = "";
      }
      fprintf((FILE *)gen_ctx->debug_file,"+++++++++++++MIR after building SSA%s:\n",pcVar88);
      print_varr_insns(gen_ctx,"undef init",gen_ctx->ssa_ctx->undef_insns);
      print_varr_insns(gen_ctx,"arg init",gen_ctx->ssa_ctx->arg_bb_insns);
      fputc(10,(FILE *)gen_ctx->debug_file);
      pcVar88 = (char *)0x1;
      print_CFG(gen_ctx,1,0,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
    }
    if (gen_ctx->optimize_level < 2) goto LAB_001268ca;
    pFVar130 = (FILE *)gen_ctx->debug_file;
    if (gen_ctx->addr_insn_p != 0) {
      if (((pFVar130 != (FILE *)0x0) && (1 < gen_ctx->debug_level)) &&
         (fwrite("+++++++++++++Transform Addr Insns and cloning BBs:\n",0x33,1,pFVar130),
         gen_ctx->addr_insn_p == 0)) {
        __assert_fail("gen_ctx->addr_insn_p",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0xb42,"void transform_addrs(gen_ctx_t)");
      }
      pMVar15 = gen_ctx->ctx;
      pMVar16 = (gen_ctx->curr_func_item->u).func;
      bitmap_clear(gen_ctx->addr_regs);
      VARR_bb_insn_ttrunc(gen_ctx->temp_bb_insns,0);
      pDVar106 = &gen_ctx->curr_cfg->bbs;
      while (pbVar96 = pDVar106->head, pbVar96 != (bb_t_conflict)0x0) {
        pDVar136 = &pbVar96->bb_insns;
        while (pbVar103 = pDVar136->head, pbVar103 != (bb_insn_t_conflict)0x0) {
          pMVar137 = pbVar103->insn;
          if (*(int *)&pMVar137->field_0x18 - 0x22U < 0xfffffffc) {
            iVar78 = move_p(pMVar137);
            if ((iVar78 != 0) && (pMVar137[1].data == (void *)0x0)) {
              __assert_fail("bb_insn->insn->ops[1].data != ((void*)0)",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0xb4b,"void transform_addrs(gen_ctx_t)");
            }
          }
          else {
            VARR_bb_insn_tpush(gen_ctx->temp_bb_insns,pbVar103);
          }
          pDVar136 = (DLIST_bb_insn_t *)&(pbVar103->bb_insn_link).next;
        }
        pDVar106 = (DLIST_bb_t *)&(pbVar96->bb_link).next;
      }
      sVar90 = VARR_bb_insn_tlength(gen_ctx->temp_bb_insns);
      if (sVar90 != 0) {
        for (uVar149 = 0; sVar90 = VARR_bb_insn_tlength(gen_ctx->temp_bb_insns), uVar149 < sVar90;
            uVar149 = uVar149 + 1) {
          pbVar103 = VARR_bb_insn_tget(gen_ctx->temp_bb_insns,uVar149);
          pMVar137 = pbVar103->insn;
          if (((*(int *)&pMVar137->field_0x18 - 0x22U < 0xfffffffc) ||
              (pMVar137->ops[0].field_0x8 != '\x02')) ||
             (*(char *)&pMVar137[1].insn_link.prev != '\x02')) {
            __assert_fail("MIR_addr_code_p (insn->code) && insn->ops[0].mode == MIR_OP_VAR && insn->ops[1].mode == MIR_OP_VAR"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0xb53,"void transform_addrs(gen_ctx_t)");
          }
          iVar78 = addr_eliminable_p(gen_ctx,pbVar103,(VARR_bb_insn_t *)0x0);
          if (iVar78 == 0) {
            bitmap_set_bit_p(gen_ctx->addr_regs,(ulong)*(uint *)&pMVar137[1].insn_link.next);
          }
        }
        bVar156 = false;
        local_3c0 = (MIR_insn_t_conflict)0x0;
        MVar76 = 0xffffffff;
        pDVar106 = &gen_ctx->curr_cfg->bbs;
        while (pbVar96 = pDVar106->head, pbVar96 != (bb_t_conflict)0x0) {
          pbVar119 = (pbVar96->bb_insns).head;
          local_2f0 = pbVar96;
LAB_001228f2:
          pbVar103 = pbVar119;
          if (pbVar103 != (bb_insn_t_conflict)0x0) {
            pMVar93 = pbVar103->insn;
            pbVar119 = (pbVar103->bb_insn_link).next;
            uVar149 = *(ulong *)&pMVar93->field_0x18;
            iVar78 = (int)uVar149;
            if (iVar78 == 0xba) goto LAB_00122a17;
            if (iVar78 == 0xb9) {
              uVar155 = 0;
              bVar157 = true;
              do {
                paVar150 = &pMVar93->ops[uVar155].u;
                paVar146 = &pMVar93[1].ops[uVar155 - 1].u;
                uVar139 = uVar155;
                while( true ) {
                  uVar139 = uVar139 + 1;
                  if (uVar149 >> 0x20 <= uVar155) {
                    if (((!bVar157) && ((FILE *)gen_ctx->debug_file != (FILE *)0x0)) &&
                       (1 < gen_ctx->debug_level)) {
                      fwrite("  modifying use to ",0x13,1,(FILE *)gen_ctx->debug_file);
                      print_bb_insn(gen_ctx,(bb_insn_t_conflict)pMVar93->data,1);
                    }
                    goto LAB_001228f2;
                  }
                  if ((char)(&paVar150->reg)[-2] != '\x02') {
                    __assert_fail("insn->ops[i].mode == MIR_OP_VAR",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                  ,0xb69,"void transform_addrs(gen_ctx_t)");
                  }
                  iVar78 = bitmap_bit_p(gen_ctx->addr_regs,(ulong)paVar150->reg);
                  if (iVar78 != 0) break;
                  uVar149 = *(ulong *)&pMVar93->field_0x18;
                  uVar155 = uVar155 + 1;
                  paVar150 = (anon_union_32_12_57d33f68_for_u *)(&paVar150->reg + 0xc);
                  paVar146 = (anon_union_32_12_57d33f68_for_u *)(&paVar146[1].str + 1);
                }
                remove_ssa_edge(*(ssa_edge_t_conflict *)(&paVar150->reg + -4));
                for (; uVar149 = *(ulong *)&pMVar93->field_0x18, uVar139 < uVar149 >> 0x20;
                    uVar139 = uVar139 + 1) {
                  paVar146[-1] = *(anon_union_32_12_57d33f68_for_u *)(&paVar146->str + 1);
                  *(anon_union_32_12_57d33f68_for_u *)(&paVar146[-2].str + 1) = *paVar146;
                  paVar146 = (anon_union_32_12_57d33f68_for_u *)(&paVar146[1].str + 1);
                }
                bVar157 = false;
                uVar149 = uVar149 & 0xffffffff | (uVar149 & 0xffffffff00000000) - 0x100000000;
                *(ulong *)&pMVar93->field_0x18 = uVar149;
              } while( true );
            }
            if (iVar78 - 0x22U < 0xfffffffc) {
              uVar77 = 0;
              for (sVar90 = 0; (long)sVar90 < (long)uVar149 >> 0x20; sVar90 = sVar90 + 1) {
                paVar150 = (anon_union_32_12_57d33f68_for_u *)(pMVar93->ops + sVar90);
                cVar74 = pMVar93->ops[sVar90].field_0x8;
                if (cVar74 == '\v') {
                  MVar83 = paVar150[1].reg;
                  if (MVar83 != 0xffffffff) {
                    out_p = 0;
                    goto LAB_00122b05;
                  }
                }
                else if (cVar74 == '\x02') {
                  MVar83 = ((anon_union_32_12_57d33f68_for_u *)((long)&paVar150->mem + 0x10))->reg;
                  MIR_insn_op_mode(gen_ctx->ctx,pMVar93,sVar90,&out_p);
LAB_00122b05:
                  if ((0x21 < MVar83) &&
                     (iVar78 = bitmap_bit_p(gen_ctx->addr_regs,(ulong)MVar83), iVar78 != 0)) {
                    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level))
                    {
                      fwrite("  ",2,1,(FILE *)gen_ctx->debug_file);
                      print_bb_insn(gen_ctx,pbVar103,1);
                    }
                    if (MVar83 != uVar77) {
                      MVar76 = gen_new_temp_reg(gen_ctx,MIR_T_I64,pMVar16);
                      _MIR_new_var_op(pMVar15,MVar76);
                      _MIR_new_var_op(pMVar15,MVar83);
                      local_3c0 = MIR_new_insn(pMVar15,MIR_ADDR);
                      gen_add_insn_before(gen_ctx,pMVar93,local_3c0);
                      uVar77 = MVar83;
                      if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)
                         ) {
                        fwrite("    adding before: ",0x13,1,(FILE *)gen_ctx->debug_file);
                        print_bb_insn(gen_ctx,(bb_insn_t_conflict)local_3c0->data,1);
                      }
                    }
                    MVar129 = MIR_FMOV;
                    MVar79 = MIR_reg_type(pMVar15,MVar83 - 0x21,pMVar16);
                    if (MVar79 != MIR_T_F) {
                      if (MVar79 == MIR_T_D) {
                        MVar129 = MIR_DMOV;
                      }
                      else {
                        MVar129 = (uint)(MVar79 == MIR_T_LD) * 3;
                      }
                    }
                    MVar80 = gen_new_temp_reg(gen_ctx,MVar79,pMVar16);
                    if (out_p == 0) {
                      _MIR_new_var_op(pMVar15,MVar80);
                      _MIR_new_var_mem_op(&temp_op,pMVar15,MVar79,0,MVar76,0xffffffff,'\0');
                      pMVar104 = MIR_new_insn(pMVar15,MVar129);
                      gen_add_insn_before(gen_ctx,pMVar93,pMVar104);
                      if (*(undefined1 *)((long)&paVar150->str + 8) == '\v') {
                        if (paVar150[1].reg != MVar83) goto LAB_00129b60;
                        paVar146 = (anon_union_32_12_57d33f68_for_u *)((long)paVar150 + 0x10);
                      }
                      else {
                        paVar146 = paVar150;
                        if (*(undefined1 *)((long)&paVar150->str + 8) != '\x02') {
LAB_00129b60:
                          __assert_fail("insn->ops[op_num].mode == MIR_OP_VAR_MEM && insn->ops[op_num].u.var_mem.base == reg"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                        ,0xbad,"void transform_addrs(gen_ctx_t)");
                        }
                      }
                      (paVar146->mem).base = MVar80;
                      if ((ssa_edge_t_conflict)(paVar150->str).len != (ssa_edge_t_conflict)0x0) {
                        remove_ssa_edge((ssa_edge_t_conflict)(paVar150->str).len);
                      }
                      if (!bVar156) {
                        add_ssa_edge(gen_ctx,(bb_insn_t_conflict)local_3c0->data,0,
                                     (bb_insn_t_conflict)pMVar104->data,1);
                        def = (bb_insn_t_conflict)pMVar104->data;
                        iVar78 = 0;
                        use = pbVar103;
                        sVar141 = sVar90;
                        goto LAB_00122f21;
                      }
                    }
                    else {
                      _MIR_new_var_mem_op((MIR_op_t *)&var_1,pMVar15,MVar79,0,MVar76,0xffffffff,'\0'
                                         );
                      _MIR_new_var_op(pMVar15,MVar80);
                      pMVar104 = MIR_new_insn(pMVar15,MVar129);
                      gen_add_insn_after(gen_ctx,pMVar93,pMVar104);
                      if (*(undefined1 *)((long)&paVar150->str + 8) != '\x02') {
                        __assert_fail("insn->ops[op_num].mode == MIR_OP_VAR",
                                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                      ,0xb9e,"void transform_addrs(gen_ctx_t)");
                      }
                      ((anon_union_32_12_57d33f68_for_u *)((long)&paVar150->mem + 0x10))->reg =
                           MVar80;
                      while (paVar150->ref != (MIR_item_t)0x0) {
                        remove_ssa_edge((ssa_edge_t_conflict)paVar150->ref);
                      }
                      if (!bVar156) {
                        add_ssa_edge(gen_ctx,(bb_insn_t_conflict)local_3c0->data,0,
                                     (bb_insn_t_conflict)pMVar104->data,0);
                        iVar78 = (int)sVar90;
                        use = (bb_insn_t_conflict)pMVar104->data;
                        def = pbVar103;
                        sVar141 = 1;
LAB_00122f21:
                        add_ssa_edge(gen_ctx,def,iVar78,use,(int)sVar141);
                      }
                    }
                    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level))
                    {
                      pcVar88 = "after";
                      if (out_p == 0) {
                        pcVar88 = "before";
                      }
                      fprintf((FILE *)gen_ctx->debug_file,"    adding %s: ",pcVar88);
                      print_bb_insn(gen_ctx,(bb_insn_t_conflict)pMVar104->data,1);
                      fwrite("    changing to ",0x10,1,(FILE *)gen_ctx->debug_file);
                      print_bb_insn(gen_ctx,pbVar103,1);
                    }
                  }
                }
                uVar149 = *(ulong *)&pMVar93->field_0x18;
              }
            }
            else {
              iVar78 = bitmap_bit_p(gen_ctx->addr_regs,(ulong)*(uint *)&pMVar93[1].insn_link.next);
              if (iVar78 == 0) {
                iVar78 = addr_eliminable_p(gen_ctx,pbVar103,gen_ctx->temp_bb_insns);
                if (iVar78 == 0) {
                  __assert_fail("res",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                ,0xbc1,"void transform_addrs(gen_ctx_t)");
                }
                while (sVar90 = VARR_bb_insn_tlength(gen_ctx->temp_bb_insns), sVar90 != 0) {
                  pbVar103 = VARR_bb_insn_tpop(gen_ctx->temp_bb_insns);
                  pMVar137 = pbVar103->insn;
                  uVar149 = *(ulong *)&pMVar137->field_0x18;
                  if ((uVar149 & 0xfffffffc) != 0) {
                    __assert_fail("move_code_p (use_insn->code)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                  ,0xbc6,"void transform_addrs(gen_ctx_t)");
                  }
                  bVar156 = pMVar137->ops[0].field_0x8 != '\v';
                  switch(*(undefined1 *)&pMVar137->ops[bVar156].u) {
                  case 0:
                    uVar149 = uVar149 & 0xffffffff00000000 | 4;
                    break;
                  case 1:
                    uVar149 = uVar149 | 7;
                    break;
                  case 2:
                    uVar149 = uVar149 & 0xffffffff00000000 | 5;
                    break;
                  case 3:
                    uVar149 = uVar149 & 0xffffffff00000000 | 8;
                    break;
                  case 4:
                    uVar149 = uVar149 & 0xffffffff00000000 | 6;
                    break;
                  case 5:
                    uVar149 = uVar149 & 0xffffffff00000000 | 9;
                    break;
                  default:
                    goto switchD_001230c5_default;
                  }
                  *(ulong *)&pMVar137->field_0x18 = uVar149;
switchD_001230c5_default:
                  pMVar94 = pMVar137->ops + bVar156;
                  if ((ssa_edge_t_conflict)pMVar94->data != (ssa_edge_t_conflict)0x0) {
                    remove_ssa_edge((ssa_edge_t_conflict)pMVar94->data);
                  }
                  pMVar94->field_0x8 = 2;
                  (pMVar94->u).reg = *(MIR_reg_t *)&pMVar93[1].insn_link.next;
                  bVar156 = true;
                }
                pFVar130 = (FILE *)gen_ctx->debug_file;
                if ((pFVar130 != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                  pcVar88 = "  deleting ";
                  sStackY_4a0 = 0xb;
LAB_00123186:
                  fwrite(pcVar88,sStackY_4a0,1,pFVar130);
                  print_bb_insn(gen_ctx,(bb_insn_t_conflict)pMVar93->data,1);
                }
                goto LAB_0012319e;
              }
            }
            goto LAB_001228f2;
          }
          pDVar106 = (DLIST_bb_t *)&(local_2f0->bb_link).next;
        }
      }
      undo_build_ssa(gen_ctx);
      clone_bbs(gen_ctx);
      pcVar88 = (char *)0x1;
      build_ssa(gen_ctx,1);
      if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
        fwrite("+++++++++++++MIR after Addr Insns Transformation and cloning BBs:\n",0x42,1,
               (FILE *)gen_ctx->debug_file);
        print_varr_insns(gen_ctx,"undef init",gen_ctx->ssa_ctx->undef_insns);
        print_varr_insns(gen_ctx,"arg init",gen_ctx->ssa_ctx->arg_bb_insns);
        fputc(10,(FILE *)gen_ctx->debug_file);
        pcVar88 = (char *)0x1;
        print_CFG(gen_ctx,1,0,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
      }
      if (gen_ctx->optimize_level < 2) goto LAB_001268ca;
      pFVar130 = (FILE *)gen_ctx->debug_file;
    }
    if ((pFVar130 == (FILE *)0x0) || (gen_ctx->debug_level < 2)) {
      local_400 = gen_ctx->ctx;
    }
    else {
      fwrite("+++++++++++++GVN:\n",0x12,1,pFVar130);
      local_400 = gen_ctx->ctx;
      if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
        fwrite("Calculate memory availability:\n",0x1f,1,(FILE *)gen_ctx->debug_file);
      }
    }
    sVar90 = VARR_mem_expr_tlength(gen_ctx->gvn_ctx->mem_exprs);
    if (sVar90 != 0) {
      __assert_fail("(VARR_mem_expr_tlength (gen_ctx->gvn_ctx->mem_exprs)) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0xdba,"void calculate_memory_availability(gen_ctx_t)");
    }
    pDVar106 = &gen_ctx->curr_cfg->bbs;
    while (pbVar96 = pDVar106->head, pbVar96 != (bb_t_conflict)0x0) {
      if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
        fprintf((FILE *)gen_ctx->debug_file,"  BB%lu:\n",pbVar96->index);
      }
      bitmap_clear(pbVar96->gen);
      pDVar136 = &pbVar96->bb_insns;
      while (pbVar103 = pDVar136->head, pbVar103 != (bb_insn_t_conflict)0x0) {
        pMVar93 = pbVar103->insn;
        if (*(uint *)&pMVar93->field_0x18 - 0xaa < 0xfffffffd) {
          if ((*(uint *)&pMVar93->field_0x18 < 4) &&
             ((pMVar93->ops[0].field_0x8 == '\v' || (*(char *)&pMVar93[1].insn_link.prev == '\v'))))
          {
            sVar90 = VARR_mem_expr_tlength(gen_ctx->gvn_ctx->mem_exprs);
            pbVar103->mem_index = (uint32_t)sVar90;
            if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
              fprintf((FILE *)gen_ctx->debug_file,"     Adding mem insn %-5llu:",sVar90);
              MIR_output_insn(local_400,gen_ctx->debug_file,pMVar93,
                              (gen_ctx->curr_func_item->u).func,1);
            }
            pmVar105 = (mem_expr_t)gen_malloc(gen_ctx,0x18);
            pmVar105->insn = pbVar103->insn;
            pmVar105->temp_reg = 0xffffffff;
            pmVar105->mem_num = (uint32_t)sVar90;
            pmVar105->next = (mem_expr *)0x0;
            pVVar18 = gen_ctx->gvn_ctx->mem_exprs;
            __ptr = pVVar18->varr;
            if (__ptr == (mem_expr_t *)0x0) {
              pcVar88 = "expand";
              goto LAB_00129ba5;
            }
            sVar90 = pVVar18->els_num;
            uVar149 = sVar90 + 1;
            if (pVVar18->size < uVar149) {
              sVar90 = (uVar149 >> 1) + uVar149;
              __ptr = (mem_expr_t *)realloc(__ptr,sVar90 * 8);
              pVVar18->varr = __ptr;
              pVVar18->size = sVar90;
              sVar90 = pVVar18->els_num;
              uVar149 = sVar90 + 1;
            }
            pVVar18->els_num = uVar149;
            __ptr[sVar90] = pmVar105;
            if ((pMVar93->ops[0].field_0x8 == '\v') || (*(char *)&pMVar93[1].insn_link.prev == '\v')
               ) {
              update_mem_availability(gen_ctx,pbVar96->gen,pbVar103);
            }
          }
        }
        else {
          bitmap_clear(pbVar96->gen);
        }
        pDVar136 = (DLIST_bb_insn_t *)&(pbVar103->bb_insn_link).next;
      }
      if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
        output_bitmap(gen_ctx,"   Mem availabilty gen:",pbVar96->gen,0,(MIR_reg_t *)0x0);
      }
      pDVar106 = (DLIST_bb_t *)&(pbVar96->bb_link).next;
    }
    pDVar106 = &gen_ctx->curr_cfg->bbs;
    while (pbVar96 = pDVar106->head, pbVar96 != (bb_t_conflict)0x0) {
      pVVar102 = pbVar96->out;
      sVar90 = VARR_mem_expr_tlength(gen_ctx->gvn_ctx->mem_exprs);
      bitmap_set_bit_range_p(pVVar102,0,sVar90);
      pDVar106 = (DLIST_bb_t *)&(pbVar96->bb_link).next;
    }
    solve_dataflow(gen_ctx,1,mem_av_con_func_0,mem_av_con_func_n,mem_av_trans_func);
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fwrite("BB mem availability in/out:\n",0x1c,1,(FILE *)gen_ctx->debug_file);
      pDVar106 = &gen_ctx->curr_cfg->bbs;
      while (pbVar96 = pDVar106->head, pbVar96 != (bb_t_conflict)0x0) {
        fprintf((FILE *)gen_ctx->debug_file,"  BB%lu:\n",pbVar96->index);
        output_bitmap(gen_ctx,"    mem av in:",pbVar96->in,0,(MIR_reg_t *)0x0);
        output_bitmap(gen_ctx,"    mem av out:",pbVar96->out,0,(MIR_reg_t *)0x0);
        pDVar106 = (DLIST_bb_t *)&(pbVar96->bb_link).next;
      }
    }
    pbVar96 = (gen_ctx->curr_cfg->bbs).head;
    bitmap_clear(pbVar96->dom_out);
    while (pbVar96 = (pbVar96->bb_link).next, pbVar96 != (bb_t)0x0) {
      bitmap_set_bit_range_p(pbVar96->dom_out,0,(ulong)gen_ctx->curr_bb_index);
    }
    sVar90 = 1;
    solve_dataflow(gen_ctx,1,dom_con_func_0,dom_con_func_n,dom_trans_func);
    VARR_bb_ttrunc(gen_ctx->data_flow_ctx->worklist,sVar90);
    pDVar106 = &gen_ctx->curr_cfg->bbs;
    while( true ) {
      pbVar96 = pDVar106->head;
      varr_00 = gen_ctx->data_flow_ctx->worklist;
      if (pbVar96 == (bb_t_conflict)0x0) break;
      VARR_bb_tpush(varr_00,pbVar96);
      pDVar106 = (DLIST_bb_t *)&(pbVar96->bb_link).next;
    }
    __base = VARR_bb_taddr(varr_00);
    pcVar88 = (char *)VARR_bb_tlength(gen_ctx->data_flow_ctx->worklist);
    qsort(__base,(size_t)pcVar88,8,post_cmp);
    gvn_modify(gen_ctx);
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fwrite("+++++++++++++MIR after GVN:\n",0x1c,1,(FILE *)gen_ctx->debug_file);
      pcVar88 = (char *)0x1;
      print_CFG(gen_ctx,1,0,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
    }
    HTAB_expr_t_clear(gen_ctx->gvn_ctx->expr_tab);
LAB_001236a0:
    pVVar19 = gen_ctx->gvn_ctx->exprs;
    if (pVVar19 == (VARR_expr_t *)0x0) {
      pcVar88 = "length";
LAB_00129cf8:
      mir_varr_assert_fail(pcVar88,"expr_t");
    }
    sVar90 = pVVar19->els_num;
    if (sVar90 != 0) goto code_r0x001236bc;
    HTAB_mem_expr_t_clear(gen_ctx->gvn_ctx->mem_expr_tab);
    while (sVar90 = VARR_mem_expr_tlength(gen_ctx->gvn_ctx->mem_exprs), sVar90 != 0) {
      pVVar18 = gen_ctx->gvn_ctx->mem_exprs;
      if (((pVVar18 == (VARR_mem_expr_t *)0x0) || (pVVar18->varr == (mem_expr_t *)0x0)) ||
         (sVar90 = pVVar18->els_num, sVar90 == 0)) {
        pcVar88 = "pop";
LAB_00129ba5:
        mir_varr_assert_fail(pcVar88,"mem_expr_t");
      }
      pcVar88 = (char *)(sVar90 - 1);
      pVVar18->els_num = (size_t)pcVar88;
      free(pVVar18->varr[sVar90 - 1]);
    }
    if (gen_ctx->optimize_level < 2) goto LAB_001268ca;
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      pcVar88 = (char *)0x1f;
      fwrite("+++++++++++++Copy Propagation:\n",0x1f,1,(FILE *)gen_ctx->debug_file);
    }
    pMVar15 = gen_ctx->ctx;
    pMVar16 = (gen_ctx->curr_func_item->u).func;
    pDVar106 = &gen_ctx->curr_cfg->bbs;
    while (pbVar117 = pDVar106->head, pbVar117 != (bb_t)0x0) {
      pFVar91 = (FILE *)(pbVar117->bb_insns).head;
      local_2f0 = pbVar117;
LAB_001237c6:
      pFVar92 = pFVar91;
      if (pFVar92 != (FILE *)0x0) {
        pFVar97 = *(FILE **)pFVar92;
        pFVar91 = (FILE *)pFVar92->_IO_write_ptr;
        pcVar88 = (char *)pFVar92;
        if ((int)pFVar97->_IO_read_base - 0x22U < 0xfffffffc) {
          pDVar1 = (DLIST_LINK_bb_t *)&pFVar97->_IO_write_base;
          iter.nops = (ulong)pFVar97->_IO_read_base >> 0x20;
          iter.op_num = 0;
          iter.op_part_num = 0;
          pFVar116 = pFVar91;
          iter.insn = (MIR_insn_t)pFVar97;
LAB_0012382d:
          pcVar88 = (char *)&iter;
          iVar78 = input_insn_var_iterator_next(gen_ctx,(insn_var_iterator_t *)pcVar88,&var,&op_num)
          ;
          if (iVar78 != 0) {
            if (0x21 < var) {
              iVar78 = 0x1e;
              MVar76 = var;
              while (iVar84 = op_num, bVar156 = iVar78 != 0, iVar78 = iVar78 + -1, bVar156) {
                pbVar117 = pDVar1[(long)op_num * 3].prev;
                pbVar103 = (bb_insn_t_conflict)pbVar117->pre;
                if (pbVar103->bb->index == 0) break;
                pMVar137 = pbVar103->insn;
                iVar81 = move_p(pMVar137);
                if (iVar81 == 0) break;
                uVar77 = pMVar137->ops[0].u.reg;
                uVar87 = *(uint *)&pMVar137[1].insn_link.next;
                if (uVar77 == uVar87) break;
                if (uVar87 < 0x22) {
                  __assert_fail("src_reg > ST1_HARD_REG",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                ,0xc8d,"void copy_prop(gen_ctx_t)");
                }
                pcVar88 = MIR_reg_hard_reg_name(pMVar15,uVar77 - 0x21,pMVar16);
                pcVar107 = MIR_reg_hard_reg_name(pMVar15,uVar87 - 0x21,pMVar16);
                if (pcVar88 != pcVar107) break;
                if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                  fwrite("  Propagate from copy insn ",0x1b,1,(FILE *)gen_ctx->debug_file);
                  print_bb_insn(gen_ctx,pbVar103,0);
                }
                uVar77 = *(uint *)&pMVar137[1].insn_link.next;
                if (uVar77 < 0x22) {
                  __assert_fail("reg > ST1_HARD_REG && new_reg > ST1_HARD_REG",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                ,0xc96,"void copy_prop(gen_ctx_t)");
                }
                remove_ssa_edge((ssa_edge_t_conflict)pbVar117);
                add_ssa_edge(gen_ctx,*(bb_insn_t_conflict *)((long)pMVar137[1].data + 8),
                             (uint)*(ushort *)((long)pMVar137[1].data + 0x12),
                             (bb_insn_t_conflict)pFVar92,iVar84);
                rename_op_reg(gen_ctx,(MIR_op_t *)(pDVar1 + (long)op_num * 3),MVar76,uVar77,
                              (MIR_insn_t)pFVar97,(int)pFVar116);
                MVar76 = uVar77;
              }
            }
            goto LAB_0012382d;
          }
          iVar78 = move_p((MIR_insn_t)pFVar97);
          if ((((((iVar78 == 0) || (pDVar1->prev == (bb_t)0x0)) ||
                (pbVar119 = ((DLIST_bb_insn_t *)&pFVar97->_IO_backup_base)->head,
                pbVar119 == (bb_insn_t)0x0)) ||
               ((*(bb_t *)&pbVar119->gvn_val_const_p !=
                 ((DLIST_LINK_bb_t *)&pFVar92->_IO_write_base)->prev ||
                (puVar20 = *(undefined8 **)
                            ((*(bb_t *)&pbVar119->gvn_val_const_p)->index + 0x20 +
                            (ulong)*(ushort *)((long)&pbVar119->mem_index + 2) * 0x30),
                puVar20 == (undefined8 *)0x0)))) ||
              ((puVar21 = (undefined8 *)puVar20[4], puVar21 == (undefined8 *)0x0 ||
               (puVar21[4] != 0)))) ||
             (((bb_t)*puVar20 != (bb_t)pFVar92->_IO_write_ptr &&
              ((bb_t)*puVar21 != (bb_t)pFVar92->_IO_write_ptr)))) {
            uVar87 = *(uint *)&pFVar97->_IO_read_base;
            uVar77 = uVar87 - 0x2c;
            if ((uVar77 < 9) && ((0x1e3U >> (uVar77 & 0x1f) & 1) != 0)) {
              ctx_00 = gen_ctx->ctx;
              pcVar88 = (char *)&op_ref;
              MVar129 = *(MIR_insn_code_t *)(&DAT_0017e7e4 + (ulong)uVar77 * 4);
              func = (gen_ctx->curr_func_item->u).func;
              uVar77 = power2_int_op(*(ssa_edge_t_conflict *)&pFVar97->_cur_column,
                                     (MIR_op_t **)pcVar88);
              if ((int)uVar77 < 0) {
                if ((uVar87 & 0x3e) == 0x2c) {
                  pcVar88 = (char *)&op_ref;
                  uVar77 = power2_int_op((ssa_edge_t_conflict)
                                         ((DLIST_bb_insn_t *)&pFVar97->_IO_backup_base)->head,
                                         (MIR_op_t **)pcVar88);
                  if (-1 < (int)uVar77) {
                    pDVar136 = (DLIST_bb_insn_t *)&pFVar97->_IO_backup_base;
                    ppVVar4 = (bitmap_t *)&pFVar97->_cur_column;
                    pbVar119 = pDVar136->head;
                    type_regs._8_8_ = pFVar97->_IO_save_end;
                    type_regs._16_8_ = pFVar97->_markers;
                    type_regs._24_8_ = pFVar97->_chain;
                    type_regs._32_8_ = *(undefined8 *)&pFVar97->_fileno;
                    type_regs._40_8_ = pFVar97->_old_offset;
                    type_regs[0]._0_1_ = (char)pbVar119;
                    type_regs[0]._1_1_ = (char)((ulong)pbVar119 >> 8);
                    type_regs._2_6_ = (undefined6)((ulong)pbVar119 >> 0x10);
                    pbVar147 = (bb_insn_t)pFVar97->_lock;
                    pVVar102 = (bitmap_t)pFVar97->_offset;
                    p_Var111 = (_IO_FILE *)pFVar97->_codecvt;
                    pFVar97->_markers = (_IO_marker *)pFVar97->_offset;
                    pFVar97->_chain = (_IO_FILE *)pFVar97->_codecvt;
                    *(bitmap_t *)&pFVar97->_fileno = (bitmap_t)pFVar97->_wide_data;
                    pFVar97->_old_offset = (__off_t)pFVar97->_freeres_list;
                    pDVar136->head = (bb_insn_t)*ppVVar4;
                    pFVar97->_IO_save_end = (char *)pbVar147;
                    pFVar97->_markers = (_IO_marker *)pVVar102;
                    pFVar97->_chain = p_Var111;
                    pFVar97->_offset = type_regs._16_8_;
                    pFVar97->_codecvt = (_IO_codecvt *)type_regs._24_8_;
                    pFVar97->_wide_data = (_IO_wide_data *)type_regs._32_8_;
                    pFVar97->_freeres_list = (_IO_FILE *)type_regs._40_8_;
                    *ppVVar4 = (bitmap_t)pbVar119;
                    pFVar97->_lock = (_IO_lock_t *)type_regs._8_8_;
                    pFVar97->_offset = type_regs._16_8_;
                    pFVar97->_codecvt = (_IO_codecvt *)type_regs._24_8_;
                    *(undefined4 *)&pDVar136->head->field_0x14 = 1;
                    *(undefined4 *)((long)&(*ppVVar4)->varr + 4) = 2;
                    goto LAB_00123a6a;
                  }
                }
              }
              else {
LAB_00123a6a:
                if (uVar77 == 0) {
                  pMVar93 = MIR_new_insn(ctx_00,MIR_MOV);
                  op_num_1 = (int)pMVar93;
                  uStack_364 = (undefined4)((ulong)pMVar93 >> 0x20);
                  pMVar93[1].data = (void *)0x0;
                  gen_add_insn_before(gen_ctx,(MIR_insn_t)pFVar97,pMVar93);
                  redirect_def(gen_ctx,(MIR_insn_t)pFVar97,pMVar93,0);
                  pbVar119 = ((DLIST_bb_insn_t *)&pFVar97->_IO_backup_base)->head;
                  add_ssa_edge(gen_ctx,*(bb_insn_t_conflict *)&pbVar119->gvn_val_const_p,
                               (uint)*(ushort *)((long)&pbVar119->mem_index + 2),
                               (bb_insn_t_conflict)pMVar93->data,1);
                  uVar77 = 1;
                }
                else if (*(int *)&pFVar97->_IO_read_base - 0x31U < 2) {
                  for (lVar135 = 0; lVar135 != 0x120; lVar135 = lVar135 + 0x30) {
                    MVar76 = gen_new_temp_reg(gen_ctx,MIR_T_I64,func);
                    _MIR_new_var_op(ctx_00,MVar76);
                    *(int64_t *)((long)type_regs + lVar135 + 0x10) = aStack_358.i;
                    *(char **)((long)type_regs + lVar135 + 0x18) = aStack_358.str.s;
                    *(undefined8 *)((long)type_regs + lVar135 + 0x20) = aStack_358._16_8_;
                    *(MIR_disp_t *)((long)type_regs + lVar135 + 0x28) = aStack_358.mem.disp;
                    *(ulong *)((long)type_regs + lVar135) = CONCAT44(uStack_364,op_num_1);
                    *(MIR_insn_t *)((long)type_regs + lVar135 + 8) = pMStack_360;
                    *(int64_t *)((long)type_regs + lVar135 + 0x10) = aStack_358.i;
                    *(char **)((long)type_regs + lVar135 + 0x18) = aStack_358.str.s;
                  }
                  if (*(int *)&pFVar97->_IO_read_base == 0x31) {
                    MIR_new_int_op(ctx_00,0x3f);
                    MVar133 = MIR_RSH;
                    code_00 = MIR_AND;
                    code = MIR_ADD;
                  }
                  else {
                    MIR_new_int_op(ctx_00,0x1f);
                    MVar133 = MIR_RSHS;
                    code_00 = MIR_ANDS;
                    code = MIR_ADDS;
                  }
                  pMVar93 = MIR_new_insn(ctx_00,MIR_MOV);
                  pMVar104 = MIR_new_insn(ctx_00,MVar133);
                  MIR_new_int_op(ctx_00,(op_ref->u).i + -1);
                  pMVar108 = MIR_new_insn(ctx_00,MIR_MOV);
                  pMVar109 = MIR_new_insn(ctx_00,code_00);
                  pMVar110 = MIR_new_insn(ctx_00,code);
                  op_num_1 = (int)pMVar93;
                  uStack_364 = (undefined4)((ulong)pMVar93 >> 0x20);
                  pMVar104[1].data = (void *)0x0;
                  pMVar110[1].ops[0].u.i = 0;
                  pMStack_360 = pMVar104;
                  aStack_358.ref = (MIR_item_t)pMVar108;
                  aStack_358.str.s = (char *)pMVar109;
                  aStack_358._16_8_ = pMVar110;
                  MIR_new_int_op(ctx_00,(ulong)uVar77);
                  p_Var111 = (_IO_FILE *)MIR_new_insn(ctx_00,MIR_MOV);
                  aStack_358._24_8_ = p_Var111;
                  by = MIR_new_insn(ctx_00,MVar129);
                  local_338 = by;
                  for (lVar135 = 0; lVar135 != 7; lVar135 = lVar135 + 1) {
                    gen_add_insn_before(gen_ctx,(MIR_insn_t)pFVar97,
                                        *(MIR_insn_t *)(&op_num_1 + lVar135 * 2));
                  }
                  add_ssa_edge(gen_ctx,(bb_insn_t_conflict)pMVar93->data,0,
                               (bb_insn_t_conflict)pMVar104->data,2);
                  add_ssa_edge(gen_ctx,(bb_insn_t_conflict)pMVar104->data,0,
                               (bb_insn_t_conflict)pMVar109->data,1);
                  add_ssa_edge(gen_ctx,(bb_insn_t_conflict)pMVar108->data,0,
                               (bb_insn_t_conflict)pMVar109->data,2);
                  add_ssa_edge(gen_ctx,(bb_insn_t_conflict)pMVar109->data,0,
                               (bb_insn_t_conflict)pMVar110->data,1);
                  add_ssa_edge(gen_ctx,(bb_insn_t_conflict)pMVar110->data,0,
                               (bb_insn_t_conflict)by->data,1);
                  add_ssa_edge(gen_ctx,*(bb_insn_t_conflict *)p_Var111,0,
                               (bb_insn_t_conflict)by->data,2);
                  pbVar119 = ((DLIST_bb_insn_t *)&pFVar97->_IO_backup_base)->head;
                  add_ssa_edge(gen_ctx,*(bb_insn_t_conflict *)&pbVar119->gvn_val_const_p,
                               (uint)*(ushort *)((long)&pbVar119->mem_index + 2),
                               (bb_insn_t_conflict)pMVar104->data,1);
                  add_ssa_edge(gen_ctx,*(bb_insn_t_conflict *)&pbVar119->gvn_val_const_p,
                               (uint)*(ushort *)((long)&pbVar119->mem_index + 2),
                               (bb_insn_t_conflict)pMVar110->data,2);
                  redirect_def(gen_ctx,(MIR_insn_t)pFVar97,by,0);
                  uVar77 = 7;
                }
                else {
                  MVar76 = gen_new_temp_reg(gen_ctx,MIR_T_I64,func);
                  _MIR_new_var_op(ctx_00,MVar76);
                  MIR_new_int_op(ctx_00,(ulong)uVar77);
                  pMVar93 = MIR_new_insn(ctx_00,MIR_MOV);
                  op_num_1 = (int)pMVar93;
                  uStack_364 = (undefined4)((ulong)pMVar93 >> 0x20);
                  gen_add_insn_before(gen_ctx,(MIR_insn_t)pFVar97,pMVar93);
                  pMVar104 = MIR_new_insn(ctx_00,MVar129);
                  pMVar104[1].data = (void *)0x0;
                  pMStack_360 = pMVar104;
                  gen_add_insn_before(gen_ctx,(MIR_insn_t)pFVar97,pMVar104);
                  redirect_def(gen_ctx,(MIR_insn_t)pFVar97,pMVar104,0);
                  pbVar119 = ((DLIST_bb_insn_t *)&pFVar97->_IO_backup_base)->head;
                  add_ssa_edge(gen_ctx,*(bb_insn_t_conflict *)&pbVar119->gvn_val_const_p,
                               (uint)*(ushort *)((long)&pbVar119->mem_index + 2),
                               (bb_insn_t_conflict)pMVar104->data,1);
                  uVar77 = 2;
                  add_ssa_edge(gen_ctx,(bb_insn_t_conflict)pMVar93->data,0,
                               (bb_insn_t_conflict)pMVar104->data,2);
                }
                pFVar130 = (FILE *)gen_ctx->debug_file;
                if ((pFVar130 != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                  for (uVar149 = 0; uVar77 != uVar149; uVar149 = uVar149 + 1) {
                    pcVar88 = "        and ";
                    if (uVar149 == 0) {
                      pcVar88 = "      adding ";
                    }
                    fprintf(pFVar130,pcVar88);
                    print_bb_insn(gen_ctx,(bb_insn_t_conflict)
                                          **(undefined8 **)(&op_num_1 + uVar149 * 2),1);
                    pFVar130 = (FILE *)gen_ctx->debug_file;
                  }
                  fwrite("        and deleting ",0x15,1,pFVar130);
                  print_bb_insn(gen_ctx,*(bb_insn_t_conflict *)pFVar97,1);
                }
                ssa_delete_insn(gen_ctx,(MIR_insn_t)pFVar97);
                pcVar88 = (char *)pFVar97;
                pFVar97 = *(FILE **)(&op_num_1 + (ulong)(uVar77 - 1) * 2);
              }
            }
            pcVar107 = pFVar97->_IO_read_base;
            uVar77 = (int)pcVar107 - 4;
            if ((uVar77 < 6) && (*(char *)&pFVar97->_IO_save_end == '\x02')) {
              pbVar119 = ((DLIST_bb_insn_t *)&pFVar97->_IO_backup_base)->head;
              pFVar92 = *(FILE **)pFVar97;
              uVar149 = *(ulong *)(&DAT_0017e808 + (ulong)uVar77 * 8);
              pcVar88 = (char *)(ulong)*(uint *)(&DAT_0017e838 + (ulong)uVar77 * 4);
              lVar135 = **(long **)&pbVar119->gvn_val_const_p;
              uVar87 = (uint)*(ulong *)(lVar135 + 0x18);
              if ((uVar87 - 0x48 < 0x26) &&
                 ((0x3af5ebd7bdU >> ((ulong)(uVar87 - 0x48) & 0x3f) & 1) != 0)) {
                if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                  fprintf((FILE *)gen_ctx->debug_file,"    Change code of insn %lu ",
                          (ulong)*(uint *)((long)&pFVar92->_IO_read_ptr + 4));
                  MIR_output_insn(pMVar15,gen_ctx->debug_file,(MIR_insn_t_conflict)pFVar97,pMVar16,0
                                 );
                  pcVar88 = (char *)0xc;
                  fwrite("    to move\n",0xc,1,(FILE *)gen_ctx->debug_file);
                  pcVar107 = pFVar97->_IO_read_base;
                }
                pFVar97->_IO_read_base = (char *)((ulong)pcVar107 & 0xffffffff00000000);
                pFVar91 = pFVar92;
                goto LAB_001237c6;
              }
              if (uVar87 < 10) {
                uVar86 = 8;
                if ((0x90U >> (uVar87 & 0x1f) & 1) == 0) {
                  if ((0x120U >> (uVar87 & 0x1f) & 1) == 0) {
                    if ((0x240U >> (uVar87 & 0x1f) & 1) == 0) goto LAB_00124686;
                    uVar86 = 0x20;
                  }
                  else {
                    uVar86 = 0x10;
                  }
                }
                if (uVar86 < *(uint *)(&DAT_0017e838 + (ulong)uVar77 * 4)) {
                  if ((2 < uVar77) && (0xfffffffc < uVar87 - 7)) goto LAB_001237c6;
                  uVar149 = *(ulong *)(lVar135 + 0x18) & 0xffffffff;
                  if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                    fprintf((FILE *)gen_ctx->debug_file,"    Change code of insn %lu: before",
                            (ulong)*(uint *)((long)&pFVar92->_IO_read_ptr + 4));
                    MIR_output_insn(pMVar15,gen_ctx->debug_file,(MIR_insn_t_conflict)pFVar97,pMVar16
                                    ,0);
                    uVar149 = (ulong)*(uint *)(lVar135 + 0x18);
                    pcVar107 = pFVar97->_IO_read_base;
                  }
                  pFVar97->_IO_read_base = (char *)((ulong)pcVar107 & 0xffffffff00000000 | uVar149);
                }
                else if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level))
                {
                  fprintf((FILE *)gen_ctx->debug_file,"    Change code of insn %lu: before",
                          (ulong)*(uint *)((long)&pFVar92->_IO_read_ptr + 4));
                  MIR_output_insn(pMVar15,gen_ctx->debug_file,(MIR_insn_t_conflict)pFVar97,pMVar16,0
                                 );
                }
                *(undefined4 *)&pFVar97->_markers = *(undefined4 *)(lVar135 + 0x60);
                remove_ssa_edge((ssa_edge_t_conflict)pbVar119);
                pcVar88 = *(char **)(*(long *)(lVar135 + 0x50) + 8);
                add_ssa_edge(gen_ctx,(bb_insn_t_conflict)pcVar88,
                             (uint)*(ushort *)(*(long *)(lVar135 + 0x50) + 0x12),
                             (bb_insn_t_conflict)pFVar92,1);
                pFVar91 = pFVar92;
                if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                  fwrite("    after ",10,1,(FILE *)gen_ctx->debug_file);
                  pcVar88 = (char *)pFVar92;
                  print_bb_insn(gen_ctx,(bb_insn_t_conflict)pFVar92,0);
                }
                goto LAB_001237c6;
              }
LAB_00124686:
              if ((2 < uVar77) && ((uVar87 & 0xfffffffe) == 0x3c)) {
                if ((*(long *)(lVar135 + 0x50) != 0) &&
                   ((lVar151 = **(long **)(*(long *)(lVar135 + 0x50) + 8),
                    *(int *)(lVar151 + 0x18) == 0 && ((ushort)(*(byte *)(lVar151 + 0x58) - 3) < 2)))
                   ) {
                  pauVar5 = (undefined1 (*) [32])(lVar135 + 0x50);
                  temp_op._8_8_ = *(undefined8 *)(lVar135 + 0x58);
                  temp_op.u.i = *(undefined8 *)*(undefined1 (*) [32])(lVar135 + 0x60);
                  temp_op.u.str.s = (char *)*(undefined8 *)(lVar135 + 0x68);
                  temp_op.u._16_8_ = *(undefined8 *)(lVar135 + 0x70);
                  temp_op.u.mem.disp = *(MIR_disp_t *)(lVar135 + 0x78);
                  auVar7 = *(undefined1 (*) [32])(lVar135 + 0x60);
                  temp_op.data._0_4_ = (MIR_reg_t)*(undefined8 *)*pauVar5;
                  temp_op.data._4_4_ = (undefined4)((ulong)*(undefined8 *)*pauVar5 >> 0x20);
                  uVar158 = *(undefined8 *)(lVar135 + 0x88);
                  uVar34 = *(undefined8 *)(lVar135 + 0x90);
                  uVar35 = *(undefined8 *)(lVar135 + 0x98);
                  *(undefined8 *)(lVar135 + 0x60) = *(undefined8 *)(lVar135 + 0x90);
                  *(undefined8 *)(lVar135 + 0x68) = *(undefined8 *)(lVar135 + 0x98);
                  *(undefined8 *)(lVar135 + 0x70) = *(undefined8 *)(lVar135 + 0xa0);
                  *(undefined8 *)(lVar135 + 0x78) = *(undefined8 *)(lVar135 + 0xa8);
                  *(undefined8 *)*pauVar5 = *(undefined8 *)(lVar135 + 0x80);
                  *(undefined8 *)(lVar135 + 0x58) = uVar158;
                  *(undefined8 *)(lVar135 + 0x60) = uVar34;
                  *(undefined8 *)(lVar135 + 0x68) = uVar35;
                  *(undefined1 (*) [32])(lVar135 + 0x90) = auVar7;
                  *(undefined1 (*) [32])(lVar135 + 0x80) = *pauVar5;
                }
                if (((*(long *)(lVar135 + 0x80) != 0) &&
                    (lVar151 = **(long **)(*(long *)(lVar135 + 0x80) + 8),
                    *(int *)(lVar151 + 0x18) == 0)) && ((ushort)(*(byte *)(lVar151 + 0x58) - 3) < 2)
                   ) {
                  uVar155 = *(ulong *)(lVar151 + 0x60);
                  if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                    fprintf((FILE *)gen_ctx->debug_file,"    Change code of insn %lu ",
                            (ulong)*(uint *)((long)&pFVar92->_IO_read_ptr + 4));
                    MIR_output_insn(pMVar15,gen_ctx->debug_file,(MIR_insn_t_conflict)pFVar97,pMVar16
                                    ,0);
                  }
                  MVar76 = gen_new_temp_reg(gen_ctx,MIR_T_I64,pMVar16);
                  _MIR_new_var_op(pMVar15,MVar76);
                  MIR_new_int_op(pMVar15,uVar155 & uVar149);
                  pMVar104 = MIR_new_insn(pMVar15,MIR_MOV);
                  gen_add_insn_before(gen_ctx,(MIR_insn_t)pFVar97,pMVar104);
                  _MIR_new_var_op(pMVar15,*(MIR_reg_t *)(lVar135 + 0x60));
                  _MIR_new_var_op(pMVar15,MVar76);
                  pMVar108 = MIR_new_insn(pMVar15,MIR_AND);
                  gen_add_insn_before(gen_ctx,(MIR_insn_t)pFVar97,pMVar108);
                  remove_ssa_edge((ssa_edge_t_conflict)pbVar119);
                  add_ssa_edge(gen_ctx,(bb_insn_t_conflict)pMVar104->data,0,
                               (bb_insn_t_conflict)pMVar108->data,2);
                  add_ssa_edge(gen_ctx,*(bb_insn_t_conflict *)(*(long *)(lVar135 + 0x50) + 8),
                               (uint)*(ushort *)(*(long *)(lVar135 + 0x50) + 0x12),
                               (bb_insn_t_conflict)pMVar108->data,1);
                  ((DLIST_LINK_bb_t *)&pFVar97->_IO_write_base)->prev = (bb_t)0x0;
                  pMVar137 = (MIR_insn_t)pMVar108->data;
                  pMVar93 = pMVar108;
                  while (pMVar93 = (MIR_insn_t_conflict)pMVar93->ops[0].data,
                        pMVar93 != (MIR_insn_t_conflict)0x0) {
                    (pMVar93->insn_link).prev = pMVar137;
                    *(undefined2 *)((long)&(pMVar93->insn_link).next + 2) = 0;
                  }
                  ssa_delete_insn(gen_ctx,(MIR_insn_t)pFVar97);
                  pcVar88 = (char *)pFVar97;
                  if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                    fwrite(" on ",4,1,(FILE *)gen_ctx->debug_file);
                    MIR_output_insn(pMVar15,gen_ctx->debug_file,pMVar104,pMVar16,0);
                    fwrite(" and ",5,1,(FILE *)gen_ctx->debug_file);
                    pcVar88 = (char *)gen_ctx->debug_file;
                    MIR_output_insn(pMVar15,(FILE *)pcVar88,pMVar108,pMVar16,1);
                  }
                }
              }
            }
          }
          else {
            lVar135 = *(long *)puVar20[1];
            lVar151 = (ulong)*(ushort *)((long)puVar20 + 0x12) * 0x30;
            remove_ssa_edge((ssa_edge_t_conflict)pbVar119);
            puVar20 = *(undefined8 **)(lVar135 + 0x20 + lVar151);
            if ((puVar20 == (undefined8 *)0x0) ||
               ((puVar20[4] != 0 || ((bb_t)*puVar20 != (bb_t)pFVar92->_IO_write_ptr)))) {
              __assert_fail("se != ((void*)0) && se->next_use == ((void*)0) && se->use == (DLIST_bb_insn_t_next (bb_insn))"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0xca9,"void copy_prop(gen_ctx_t)");
            }
            uVar12 = *(undefined4 *)&((DLIST_in_edge_t *)&pFVar97->_IO_write_end)->head;
            *(undefined4 *)(lVar135 + lVar151 + 0x30) = uVar12;
            lVar151 = (ulong)*(uint *)((long)puVar20 + 0x14) * 0x30;
            cVar74 = *(char *)(*(long *)*puVar20 + 0x28 + lVar151);
            lVar135 = 0x10;
            if (cVar74 != '\x02') {
              if (cVar74 != '\v') {
                __assert_fail("use_op_ref->mode == MIR_OP_VAR || use_op_ref->mode == MIR_OP_VAR_MEM"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0xcac,"void copy_prop(gen_ctx_t)");
              }
              lVar135 = 0x20;
            }
            *(undefined4 *)(*(long *)*puVar20 + 0x20 + lVar151 + lVar135) = uVar12;
            sVar90 = puVar20[1];
            uVar11 = *(undefined2 *)((long)puVar20 + 0x12);
            pbVar117 = pDVar1->prev;
            for (pbVar144 = pbVar117; pbVar144 != (bb_t)0x0; pbVar144 = (pbVar144->bb_link).prev) {
              pbVar144->pre = sVar90;
              *(undefined2 *)((long)&pbVar144->rpost + 2) = uVar11;
            }
            puVar20[4] = pbVar117;
            pbVar117->bfs = (size_t)puVar20;
            ((DLIST_bb_insn_t *)&pFVar97->_IO_backup_base)->head = (bb_insn_t)0x0;
            ((DLIST_LINK_bb_t *)&pFVar97->_IO_write_base)->prev = (bb_t)0x0;
            if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
              fprintf((FILE *)gen_ctx->debug_file,"    Remove move %-5lu",
                      (ulong)*(uint *)((long)&pFVar92->_IO_read_ptr + 4));
              print_bb_insn(gen_ctx,(bb_insn_t_conflict)pFVar92,0);
            }
            gen_delete_insn(gen_ctx,(MIR_insn_t)pFVar97);
            pcVar88 = (char *)pFVar97;
          }
        }
        goto LAB_001237c6;
      }
      pDVar106 = (DLIST_bb_t *)&(local_2f0->bb_link).next;
    }
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fwrite("+++++++++++++MIR after Copy Propagation:\n",0x29,1,(FILE *)gen_ctx->debug_file);
      pcVar88 = (char *)0x1;
      print_CFG(gen_ctx,1,0,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
    }
    if (gen_ctx->optimize_level < 2) goto LAB_001268ca;
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fwrite("+++++++++++++DSE:\n",0x12,1,(FILE *)gen_ctx->debug_file);
    }
    pFVar91 = (FILE *)gen_ctx->temp_bitmap;
    pDVar106 = &gen_ctx->curr_cfg->bbs;
    pbVar96 = DLIST_bb_t_el(pDVar106,1);
    while (pbVar112 = pDVar106->head, pbVar112 != (bb_t_conflict)0x0) {
      if ((((pbVar112->in == (bitmap_t)0x0) || (pbVar112->out == (bitmap_t)0x0)) ||
          (pbVar112->gen == (bitmap_t)0x0)) || (pbVar112->kill == (bitmap_t)0x0)) {
        __assert_fail("bb->in != ((void*)0) && bb->out != ((void*)0) && bb->gen != ((void*)0) && bb->kill != ((void*)0)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x13bd,"void initiate_mem_live_info(gen_ctx_t)");
      }
      bitmap_clear(pbVar112->in);
      bitmap_clear(pbVar112->out);
      bitmap_clear(pbVar112->gen);
      bitmap_clear(pbVar112->kill);
      pDVar106 = (DLIST_bb_t *)&(pbVar112->bb_link).next;
    }
    pMVar137 = (((gen_ctx->curr_func_item->u).func)->insns).tail;
    while (pMVar137 != (MIR_insn_t)0x0) {
      pbVar112 = get_insn_bb(gen_ctx,pMVar137);
      while ((pMVar137 != (MIR_insn_t)0x0 &&
             (pbVar95 = get_insn_bb(gen_ctx,pMVar137), pbVar95 == pbVar112))) {
        uVar149 = *(ulong *)&pMVar137->field_0x18;
        if (0xfffffffc < (int)uVar149 - 0xaaU) {
          update_call_mem_live(gen_ctx,pbVar112->gen,pMVar137);
          uVar149 = *(ulong *)&pMVar137->field_0x18;
        }
        if ((uVar149 & 0xfffffffc) == 0) {
          if (pMVar137->ops[0].field_0x8 == '\v') {
            uVar149 = (ulong)pMVar137->ops[0].u.mem.nloc;
            if (uVar149 != 0) {
              bitmap_clear_bit_p(pbVar112->gen,uVar149);
              bitmap_set_bit_p(pbVar112->kill,uVar149);
            }
          }
          else if (*(char *)&pMVar137[1].insn_link.prev == '\v') {
            uVar149 = (ulong)*(uint *)&pMVar137[1].field_0x1c;
            pVVar102 = pbVar112->gen;
            if (uVar149 == 0) {
              sVar90 = VARR_mem_attr_tlength(gen_ctx->mem_attrs);
              bitmap_set_bit_range_p(pVVar102,1,sVar90);
            }
            else {
              bitmap_set_bit_p(pVVar102,uVar149);
              bitmap_clear_bit_p(pbVar112->kill,uVar149);
              pvVar14 = pMVar137[1].data;
              if (pvVar14 == (void *)0x0) {
                uVar77 = 0;
              }
              else {
                uVar77 = *(byte *)(*(long *)((long)pvVar14 + 8) + 9) >> 1 & 1;
              }
              make_live_from_mem(gen_ctx,(MIR_op_t *)(pMVar137 + 1),pbVar112->gen,pbVar112->kill,
                                 uVar77);
            }
          }
        }
        pMVar137 = (pMVar137->insn_link).prev;
      }
    }
    pmVar113 = VARR_mem_attr_taddr(gen_ctx->mem_attrs);
    uVar149 = 1;
    while( true ) {
      pmVar113 = pmVar113 + 1;
      sVar90 = VARR_mem_attr_tlength(gen_ctx->mem_attrs);
      if (sVar90 <= uVar149) break;
      if ((pmVar113->alloca_flag & 2) == 0) {
        bitmap_set_bit_p(pbVar96->in,uVar149);
        bitmap_set_bit_p(pbVar96->out,uVar149);
      }
      uVar149 = uVar149 + 1;
    }
    pcVar88 = (char *)0x0;
    solve_dataflow(gen_ctx,0,mem_live_con_func_0,mem_live_con_func_n,mem_live_trans_func);
    if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      pDVar106 = &gen_ctx->curr_cfg->bbs;
      while (pbVar96 = pDVar106->head, pbVar96 != (bb_t_conflict)0x0) {
        fprintf((FILE *)gen_ctx->debug_file,"BB %3lu:\n",pbVar96->index);
        output_bitmap(gen_ctx,"   Mem live in:",pbVar96->in,0,(MIR_reg_t *)0x0);
        output_bitmap(gen_ctx,"   Mem live out:",pbVar96->out,0,(MIR_reg_t *)0x0);
        output_bitmap(gen_ctx,"   Mem live gen:",pbVar96->gen,0,(MIR_reg_t *)0x0);
        pcVar88 = "   Mem live kill:";
        output_bitmap(gen_ctx,"   Mem live kill:",pbVar96->kill,0,(MIR_reg_t *)0x0);
        pDVar106 = (DLIST_bb_t *)&(pbVar96->bb_link).next;
      }
    }
    local_400 = (MIR_context_t)0x0;
    pDVar106 = &gen_ctx->curr_cfg->bbs;
    while (pbVar96 = pDVar106->head, pbVar96 != (bb_t_conflict)0x0) {
      pcVar88 = (char *)pbVar96->out;
      bitmap_copy((bitmap_t)pFVar91,(const_bitmap_t)pcVar88);
      pbVar119 = (pbVar96->bb_insns).tail;
      while (pbVar103 = pbVar119, pFVar92 = (FILE *)0x1, pbVar103 != (bb_insn_t_conflict)0x0) {
        pFVar97 = (FILE *)pbVar103->insn;
        pbVar119 = (pbVar103->bb_insn_link).prev;
        pcVar107 = pFVar97->_IO_read_base;
        if (0xfffffffc < (int)pcVar107 - 0xaaU) {
          pcVar88 = (char *)pFVar91;
          update_call_mem_live(gen_ctx,(bitmap_t)pFVar91,(MIR_insn_t)pFVar97);
          pcVar107 = pFVar97->_IO_read_base;
        }
        if (((ulong)pcVar107 & 0xfffffffc) == 0) {
          if (*(char *)&pFVar97->_IO_write_ptr == '\v') {
            pcVar88 = (char *)(ulong)*(uint *)((long)&pFVar97->_IO_buf_base + 4);
            if (((FILE *)pcVar88 != (FILE *)0x0) &&
               (iVar78 = bitmap_clear_bit_p((bitmap_t)pFVar91,(size_t)pcVar88), iVar78 == 0)) {
              if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                fwrite("Removing dead store ",0x14,1,(FILE *)gen_ctx->debug_file);
                print_bb_insn(gen_ctx,pbVar103,0);
              }
              ssa_delete_insn(gen_ctx,(MIR_insn_t)pFVar97);
              local_400 = (MIR_context_t)((long)local_400 + 1);
              pcVar88 = (char *)pFVar97;
            }
          }
          else if (*(char *)&pFVar97->_IO_save_end == '\v') {
            uVar149 = (ulong)*(uint *)((long)&pFVar97->_chain + 4);
            if (uVar149 == 0) {
              sVar90 = VARR_mem_attr_tlength(gen_ctx->mem_attrs);
              bitmap_set_bit_range_p((bitmap_t)pFVar91,1,sVar90);
              pcVar88 = (char *)pFVar92;
            }
            else {
              pcVar88 = (char *)&pFVar97->_IO_backup_base;
              bitmap_set_bit_p((bitmap_t)pFVar91,uVar149);
              if (((DLIST_bb_insn_t *)pcVar88)->head == (bb_insn_t)0x0) {
                uVar77 = 0;
              }
              else {
                uVar77 = *(byte *)(*(long *)&((DLIST_bb_insn_t *)pcVar88)->head->gvn_val_const_p + 9
                                  ) >> 1 & 1;
              }
              make_live_from_mem(gen_ctx,(MIR_op_t *)pcVar88,(bitmap_t)pFVar91,(bitmap_t)0x0,uVar77)
              ;
            }
          }
        }
      }
      pDVar106 = (DLIST_bb_t *)&(pbVar96->bb_link).next;
    }
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (0 < gen_ctx->debug_level)) {
      pcVar88 = "%5ld removed dead stores\n";
      fprintf((FILE *)gen_ctx->debug_file,"%5ld removed dead stores\n",local_400);
      if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
        fwrite("+++++++++++++MIR after DSE:\n",0x1c,1,(FILE *)gen_ctx->debug_file);
        pcVar88 = (char *)0x1;
        print_CFG(gen_ctx,1,0,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
      }
    }
    if (gen_ctx->optimize_level < 2) goto LAB_001268ca;
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fwrite("+++++++++++++Dead code elimination:\n",0x24,1,(FILE *)gen_ctx->debug_file);
    }
    pcVar88 = (char *)0x0;
    VARR_bb_insn_ttrunc(gen_ctx->temp_bb_insns,0);
    pDVar106 = &gen_ctx->curr_cfg->bbs;
    while (pbVar96 = pDVar106->head, pbVar96 != (bb_t_conflict)0x0) {
      pDVar136 = &pbVar96->bb_insns;
      while (pFVar91 = (FILE *)pDVar136->head, pFVar91 != (FILE *)0x0) {
        pcVar88 = (char *)pFVar91;
        iVar78 = ssa_dead_insn_p(gen_ctx,(bb_insn_t_conflict)pFVar91);
        if (iVar78 != 0) {
          pcVar88 = (char *)pFVar91;
          VARR_bb_insn_tpush(gen_ctx->temp_bb_insns,(bb_insn_t_conflict)pFVar91);
        }
        pDVar136 = (DLIST_bb_insn_t *)&pFVar91->_IO_write_ptr;
      }
      pDVar106 = (DLIST_bb_t *)&(pbVar96->bb_link).next;
    }
    lVar135 = 0;
    while (sVar90 = VARR_bb_insn_tlength(gen_ctx->temp_bb_insns), sVar90 != 0) {
      pbVar103 = VARR_bb_insn_tpop(gen_ctx->temp_bb_insns);
      pcVar88 = (char *)pbVar103->insn;
      if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
        fprintf((FILE *)gen_ctx->debug_file,"  Removing dead insn %-5lu",(ulong)pbVar103->index);
        print_bb_insn(gen_ctx,pbVar103,0);
      }
      type_regs[0]._0_1_ = (char)pcVar88;
      type_regs[0]._1_1_ = (char)((ulong)pcVar88 >> 8);
      type_regs._2_6_ = (undefined6)((ulong)pcVar88 >> 0x10);
      type_regs._8_8_ = ZEXT48(*(uint *)((long)&((FILE *)pcVar88)->_IO_read_base + 4));
      type_regs[4] = 0;
      type_regs[5] = 0;
      type_regs[6] = 0;
      type_regs[7] = 0;
      while (iVar78 = input_insn_var_iterator_next
                                (gen_ctx,(insn_var_iterator_t *)type_regs,&var_1,&op_num_1),
            iVar78 != 0) {
        ssa_edge = *(ssa_edge_t_conflict *)
                    (((FILE *)pcVar88)->_shortbuf + (long)op_num_1 * 0x30 + -99);
        if (ssa_edge != (ssa_edge_t_conflict)0x0) {
          pbVar103 = ssa_edge->def;
          remove_ssa_edge(ssa_edge);
          iVar78 = ssa_dead_insn_p(gen_ctx,pbVar103);
          if (iVar78 != 0) {
            VARR_bb_insn_tpush(gen_ctx->temp_bb_insns,pbVar103);
          }
        }
      }
      gen_delete_insn(gen_ctx,(MIR_insn_t)pcVar88);
      lVar135 = lVar135 + 1;
    }
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (0 < gen_ctx->debug_level)) {
      pcVar88 = "%5ld removed SSA dead insns\n";
      fprintf((FILE *)gen_ctx->debug_file,"%5ld removed SSA dead insns\n",lVar135);
      if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
        fwrite("+++++++++++++MIR after dead code elimination:\n",0x2e,1,(FILE *)gen_ctx->debug_file)
        ;
        pcVar88 = (char *)0x1;
        print_CFG(gen_ctx,1,1,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
      }
    }
    iVar78 = (int)pcVar88;
    if (gen_ctx->optimize_level < 2) goto LAB_001268ca;
    build_loop_tree(gen_ctx);
    if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      print_loop_tree(gen_ctx,iVar78);
    }
    pcVar88 = (char *)gen_ctx->curr_cfg->root_loop_node;
    pDVar114 = (DLIST_out_edge_t *)&((FILE *)pcVar88)->_IO_write_ptr;
    do {
      pbVar117 = (bb_t)pDVar114->head;
      if (pbVar117 == (bb_t)0x0) goto LAB_00125236;
      pDVar114 = &pbVar117->out_edges;
    } while (pbVar117->pre != 0);
    licm_add_loop_preheaders(gen_ctx,(loop_node_t_conflict)pcVar88);
    pcVar88 = (char *)gen_ctx->curr_cfg->root_loop_node;
    iVar78 = loop_licm(gen_ctx,(loop_node_t_conflict)pcVar88);
    if (((iVar78 != 0) && ((FILE *)gen_ctx->debug_file != (FILE *)0x0)) &&
       (1 < gen_ctx->debug_level)) {
      fwrite("+++++++++++++MIR after loop invariant motion:\n",0x2e,1,(FILE *)gen_ctx->debug_file);
      pcVar88 = (char *)0x1;
      print_CFG(gen_ctx,1,1,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
    }
LAB_00125236:
    destroy_loop_tree((gen_ctx_t)gen_ctx->curr_cfg->root_loop_node,(loop_node_t_conflict)pcVar88);
    pfVar89 = gen_ctx->curr_cfg;
    pfVar89->root_loop_node = (loop_node_t_conflict)0x0;
    if (gen_ctx->optimize_level < 2) goto LAB_001268ca;
    pMVar15 = gen_ctx->ctx;
    pMVar16 = (gen_ctx->curr_func_item->u).func;
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      pcVar88 = (char *)0x1e;
      fwrite("+++++++++++++Pressure Relief:\n",0x1e,1,(FILE *)gen_ctx->debug_file);
      pfVar89 = gen_ctx->curr_cfg;
    }
    bVar156 = false;
    pDVar106 = &pfVar89->bbs;
    while (pbVar96 = pDVar106->head, pbVar96 != (bb_t_conflict)0x0) {
      pbVar119 = (pbVar96->bb_insns).head;
      while (pbVar147 = pbVar119, pbVar147 != (bb_insn_t)0x0) {
        pMVar137 = pbVar147->insn;
        pbVar119 = (pbVar147->bb_insn_link).next;
        if ((((*(uint *)&pMVar137->field_0x18 & 0xfffffffc) == 0) &&
            (pMVar137->ops[0].field_0x8 == '\x02')) &&
           ((cVar74 = *(char *)&pMVar137[1].insn_link.prev, cVar74 != '\x02' &&
            (((cVar74 != '\v' &&
              (puVar20 = (undefined8 *)pMVar137->ops[0].data, puVar20 != (undefined8 *)0x0)) &&
             (puVar20[4] == 0)))))) {
          puVar20 = (undefined8 *)*puVar20;
          if (((bb_t_conflict)puVar20[6] != pbVar96) &&
             (pcVar88 = (char *)*puVar20, *(int *)&((FILE *)pcVar88)->_IO_read_base != 0xba)) {
            plVar121 = ((bb_t_conflict)puVar20[6])->loop_node;
            if (plVar121 == (loop_node_t_conflict)0x0) {
LAB_00125346:
              if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                fprintf((FILE *)gen_ctx->debug_file,"  Move insn %-5lu",(ulong)pbVar147->index);
                MIR_output_insn(pMVar15,gen_ctx->debug_file,pMVar137,pMVar16,0);
                fprintf((FILE *)gen_ctx->debug_file,"  before insn %-5lu",
                        (ulong)*(uint *)((long)puVar20 + 0xc));
                MIR_output_insn(pMVar15,gen_ctx->debug_file,(MIR_insn_t_conflict)*puVar20,pMVar16,1)
                ;
                pcVar88 = (char *)*puVar20;
              }
              gen_move_insn_before(gen_ctx,(MIR_insn_t)pcVar88,pMVar137);
              bVar156 = true;
            }
            else {
              do {
                plVar121 = plVar121->parent;
                if (plVar121 == (loop_node_t)0x0) goto LAB_00125346;
              } while (plVar121 != pbVar96->loop_node->parent);
            }
          }
        }
      }
      pDVar106 = (DLIST_bb_t *)&(pbVar96->bb_link).next;
    }
    if (((bVar156) && ((FILE *)gen_ctx->debug_file != (FILE *)0x0)) && (1 < gen_ctx->debug_level)) {
      fwrite("+++++++++++++MIR after pressure relief:\n",0x28,1,(FILE *)gen_ctx->debug_file);
      pcVar88 = (char *)0x1;
      print_CFG(gen_ctx,1,1,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
    }
    if (gen_ctx->optimize_level < 2) goto LAB_001268ca;
    pMVar15 = gen_ctx->ctx;
    pDVar106 = &gen_ctx->curr_cfg->bbs;
    while (pbVar96 = pDVar106->head, pbVar96 != (bb_t_conflict)0x0) {
      pFVar91 = (FILE *)(pbVar96->bb_insns).head;
LAB_00125467:
      pFVar92 = pFVar91;
      if (pFVar92 != (FILE *)0x0) {
        pMVar137 = *(MIR_insn_t *)pFVar92;
        pFVar91 = (FILE *)pFVar92->_IO_write_ptr;
        if (*(int *)&pMVar137->field_0x18 != 0xb4) {
          if (*(int *)&pMVar137->field_0x18 != 0xba) goto LAB_00125836;
          if ((pMVar137->ops[0].field_0x8 != '\x02') ||
             (uVar77 = pMVar137->ops[0].u.reg, uVar77 < 0x22)) {
            __assert_fail("insn->ops[0].mode == MIR_OP_VAR && insn->ops[0].u.var > ST1_HARD_REG",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0xa90,"void make_conventional_ssa(gen_ctx_t)");
          }
          MVar79 = MIR_reg_type(gen_ctx->ctx,uVar77 - 0x21,(gen_ctx->curr_func_item->u).func);
          MVar129 = MIR_FMOV;
          if (MVar79 != MIR_T_F) {
            if (MVar79 == MIR_T_D) {
              MVar129 = MIR_DMOV;
            }
            else {
              MVar129 = (uint)(MVar79 == MIR_T_LD) * 3;
            }
          }
          MVar76 = get_new_ssa_reg(gen_ctx,uVar77,0x25,1);
          if (MVar76 == 0xffffffff) {
            __assert_fail("dest_var != (4294967295U)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0xa95,"void make_conventional_ssa(gen_ctx_t)");
          }
          pMVar94 = pMVar137->ops;
          pDVar140 = &pbVar96->in_edges;
          for (uVar149 = 1; pMVar115 = pMVar94, uVar149 < *(uint *)&pMVar137->field_0x1c;
              uVar149 = uVar149 + 1) {
            peVar118 = pDVar140->head;
            puVar20 = (undefined8 *)pMVar94[uVar149].data;
            pMVar94[uVar149].data = (void *)0x0;
            _MIR_new_var_op(pMVar15,MVar76);
            pMVar93 = MIR_new_insn(pMVar15,MVar129);
            pbVar117 = peVar118->src;
            pbVar119 = (pbVar117->bb_insns).tail;
            if (pbVar119 == (bb_insn_t)0x0) {
              do {
                pbVar117 = (pbVar117->bb_link).prev;
                if (pbVar117 == (bb_t)0x0) {
                  MIR_prepend_insn(pMVar15,gen_ctx->curr_func_item,pMVar93);
                  goto LAB_00125667;
                }
                pbVar119 = (pbVar117->bb_insns).tail;
              } while (pbVar119 == (bb_insn_t)0x0);
              MIR_insert_insn_after(pMVar15,gen_ctx->curr_func_item,pbVar119->insn,pMVar93);
LAB_00125667:
              pbVar103 = create_bb_insn(gen_ctx,pMVar93,peVar118->src);
              DLIST_bb_insn_t_append(&peVar118->src->bb_insns,pbVar103);
            }
            else {
              pMVar99 = pbVar119->insn;
              iVar78 = (int)*(undefined8 *)&pMVar99->field_0x18;
              if (((iVar78 - 0xa5U < 0xffffffd1) && (iVar78 != 0xaa)) && (iVar78 != 0xa6)) {
                gen_add_insn_after(gen_ctx,pMVar99,pMVar93);
              }
              else {
                gen_add_insn_before(gen_ctx,pMVar99,pMVar93);
              }
            }
            pMVar93[1].data = puVar20;
            pbVar103 = (bb_insn_t_conflict)pMVar93->data;
            *puVar20 = pbVar103;
            *(undefined4 *)((long)puVar20 + 0x14) = 1;
            add_ssa_edge(gen_ctx,pbVar103,0,(bb_insn_t_conflict)pFVar92,(int)uVar149);
            pMVar94[uVar149].field_0x8 = 2;
            pDVar140 = (DLIST_in_edge_t *)&(peVar118->in_link).next;
            pMVar94[uVar149].u.reg = MVar76;
          }
          do {
            plVar22 = (long *)pMVar115->data;
            if (plVar22 == (long *)0x0) {
              pMVar137->ops[0].u.reg = MVar76;
              change_ssa_edge_list_def
                        ((ssa_edge_t_conflict)pMVar137->ops[0].data,(bb_insn_t_conflict)pFVar92,0,
                         uVar77,MVar76);
              pcVar88 = (char *)pFVar92;
              goto LAB_00125467;
            }
            pMVar115 = (MIR_op_t *)(plVar22 + 4);
          } while (*(bb_t_conflict *)(*plVar22 + 0x30) == pbVar96);
          _MIR_new_var_op(pMVar15,uVar77);
          _MIR_new_var_op(pMVar15,MVar76);
          pMVar93 = MIR_new_insn(pMVar15,MVar129);
          gen_add_insn_after(gen_ctx,pMVar137,pMVar93);
          pMVar93->ops[0].data = pMVar137->ops[0].data;
          auVar7 = *(undefined1 (*) [32])(pMVar93 + 1);
          pMVar137->ops[0].u = *(anon_union_32_12_57d33f68_for_u *)&pMVar93[1].insn_link.next;
          *(undefined1 (*) [32])pMVar94 = auVar7;
          pbVar103 = (bb_insn_t_conflict)pMVar93->data;
          while (pMVar93 = (MIR_insn_t_conflict)pMVar93->ops[0].data,
                pMVar93 != (MIR_insn_t_conflict)0x0) {
            (pMVar93->insn_link).prev = (MIR_insn_t)pbVar103;
            *(undefined2 *)((long)&(pMVar93->insn_link).next + 2) = 0;
          }
          add_ssa_edge(gen_ctx,(bb_insn_t_conflict)pFVar92,0,pbVar103,1);
          pcVar88 = (char *)pFVar92;
        }
        goto LAB_00125467;
      }
LAB_00125836:
      pDVar106 = (DLIST_bb_t *)&(pbVar96->bb_link).next;
    }
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fwrite("+++++++++++++MIR after transformation to conventional SSA:\n",0x3b,1,
             (FILE *)gen_ctx->debug_file);
      pcVar88 = (char *)0x1;
      print_CFG(gen_ctx,1,1,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
    }
    pDVar106 = &gen_ctx->curr_cfg->bbs;
    while (pbVar96 = pDVar106->head, pbVar96 != (bb_t_conflict)0x0) {
      if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
        pcVar88 = "Processing bb%lu\n";
        fprintf((FILE *)gen_ctx->debug_file,"Processing bb%lu\n",pbVar96->index);
      }
      pFVar91 = (FILE *)(pbVar96->bb_insns).tail;
      while (pFVar92 = pFVar91, pFVar92 != (FILE *)0x0) {
        local_3e0 = *(FILE **)pFVar92;
        pFVar91 = (FILE *)((DLIST_LINK_bb_t *)&pFVar92->_IO_write_base)->prev;
        pcVar88 = (char *)pFVar92;
        iVar78 = ssa_delete_insn_if_dead_p(gen_ctx,(bb_insn_t_conflict)pFVar92);
        if ((iVar78 == 0) &&
           ((uVar77 = *(int *)&local_3e0->_IO_read_base - 0xa7, 0xd < uVar77 ||
            ((0x2007U >> (uVar77 & 0x1f) & 1) == 0)))) {
          if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
            fwrite("  combining insn ",0x11,1,(FILE *)gen_ctx->debug_file);
            pcVar88 = (char *)pFVar92;
            print_bb_insn(gen_ctx,(bb_insn_t_conflict)pFVar92,0);
          }
          pMVar137 = *(MIR_insn_t *)pFVar92;
          if (((*(int *)&pMVar137->field_0x18 - 0x7bU < 0xfffffffc) ||
              (*(char *)&pMVar137[1].insn_link.prev != '\x02')) || (pMVar137[1].data == (void *)0x0)
             ) goto LAB_00125d1c;
          pFVar97 = *(FILE **)((long)pMVar137[1].data + 8);
          lVar135 = *(long *)pFVar97;
          if (0x25 < *(int *)(lVar135 + 0x18) - 0x48U) goto LAB_00125d1c;
          pMVar15 = gen_ctx->ctx;
          pbVar112 = (bb_t_conflict)((DLIST_in_edge_t *)&pFVar92->_IO_write_end)->head;
          uVar77 = *(int *)&pMVar137->field_0x18 - 0x79;
          switch(*(int *)(lVar135 + 0x18)) {
          case 0x48:
            bVar156 = uVar77 < 0xfffffffe;
            goto LAB_00125a0e;
          case 0x49:
            bVar156 = uVar77 < 0xfffffffe;
            goto LAB_00125a1f;
          case 0x4a:
            if (uVar77 < 0xfffffffe) goto LAB_00125d1c;
            MVar129 = MIR_FBEQ;
            goto LAB_00125bbe;
          case 0x4b:
            if (0xfffffffd < uVar77) {
              MVar129 = MIR_DBEQ;
              goto LAB_00125bbe;
            }
            goto LAB_00125d1c;
          case 0x4c:
            if (0xfffffffd < uVar77) {
              MVar129 = MIR_LDBEQ;
              goto LAB_00125bbe;
            }
            goto LAB_00125d1c;
          case 0x4d:
            bVar156 = 0xfffffffd < uVar77;
LAB_00125a0e:
            MVar129 = (uint)bVar156 * 5 + MIR_BEQ;
            goto LAB_00125bbe;
          case 0x4e:
            bVar156 = 0xfffffffd < uVar77;
LAB_00125a1f:
            MVar129 = (uint)bVar156 * 5 + MIR_BEQS;
            goto LAB_00125bbe;
          case 0x4f:
            pcVar88 = (char *)0x82;
            goto LAB_00125bb5;
          case 0x50:
            pcVar88 = (char *)0x83;
            goto LAB_00125bb5;
          case 0x51:
            pcVar88 = (char *)0x84;
            goto LAB_00125bb5;
          case 0x52:
            MVar133 = MIR_BGE;
            MVar129 = MIR_BLT;
            break;
          case 0x53:
            MVar133 = MIR_BGES;
            MVar129 = MIR_BLTS;
            break;
          case 0x54:
            MVar133 = MIR_UBGE;
            MVar129 = MIR_UBLT;
            break;
          case 0x55:
            MVar133 = MIR_UBGES;
            MVar129 = MIR_UBLTS;
            break;
          case 0x56:
            pcVar88 = (char *)0x89;
            goto LAB_00125bb5;
          case 0x57:
            pcVar88 = (char *)0x8a;
            goto LAB_00125bb5;
          case 0x58:
            pcVar88 = (char *)0x8b;
            goto LAB_00125bb5;
          case 0x59:
            MVar133 = MIR_BGT;
            MVar129 = MIR_BLE;
            break;
          case 0x5a:
            MVar133 = MIR_BGTS;
            MVar129 = MIR_BLES;
            break;
          case 0x5b:
            MVar133 = MIR_UBGT;
            MVar129 = MIR_UBLE;
            break;
          case 0x5c:
            MVar133 = MIR_UBGTS;
            MVar129 = MIR_UBLES;
            break;
          case 0x5d:
            pcVar88 = (char *)0x90;
            goto LAB_00125bb5;
          case 0x5e:
            pcVar88 = (char *)0x91;
            goto LAB_00125bb5;
          case 0x5f:
            pcVar88 = (char *)0x92;
            goto LAB_00125bb5;
          case 0x60:
            MVar133 = MIR_BLE;
            MVar129 = MIR_BGT;
            break;
          case 0x61:
            MVar133 = MIR_BLES;
            MVar129 = MIR_BGTS;
            break;
          case 0x62:
            MVar133 = MIR_UBLE;
            MVar129 = MIR_UBGT;
            break;
          case 99:
            MVar133 = MIR_UBLES;
            MVar129 = MIR_UBGTS;
            break;
          case 100:
            pcVar88 = (char *)0x97;
            goto LAB_00125bb5;
          case 0x65:
            pcVar88 = (char *)0x98;
            goto LAB_00125bb5;
          case 0x66:
            pcVar88 = (char *)0x99;
            goto LAB_00125bb5;
          case 0x67:
            MVar133 = MIR_BLT;
            MVar129 = MIR_BGE;
            break;
          case 0x68:
            MVar133 = MIR_BLTS;
            MVar129 = MIR_BGES;
            break;
          case 0x69:
            MVar133 = MIR_UBLT;
            MVar129 = MIR_UBGE;
            break;
          case 0x6a:
            MVar133 = MIR_UBLTS;
            MVar129 = MIR_UBGES;
            break;
          case 0x6b:
            pcVar88 = (char *)0x9e;
            goto LAB_00125bb5;
          case 0x6c:
            pcVar88 = (char *)0x9f;
            goto LAB_00125bb5;
          case 0x6d:
            pcVar88 = (char *)0xa0;
LAB_00125bb5:
            MVar129 = (MIR_insn_code_t)pcVar88;
            if (0xfffffffd < uVar77) goto LAB_00125bbe;
            goto LAB_00125d1c;
          }
          if (uVar77 < 0xfffffffe) {
            MVar129 = MVar133;
          }
LAB_00125bbe:
          pMVar93 = MIR_new_insn(pMVar15,MVar129);
          pMVar93[1].ops[0].u.i = 0;
          pMVar93[1].data = (void *)0x0;
          MIR_insert_insn_before(pMVar15,gen_ctx->curr_func_item,pMVar137,pMVar93);
          ssa_delete_insn(gen_ctx,pMVar137);
          pFVar116 = (FILE *)add_new_bb_insn(gen_ctx,pMVar93,pbVar112,1);
          lVar151 = *(long *)(lVar135 + 0x50);
          if (lVar151 != 0) {
            add_ssa_edge(gen_ctx,*(bb_insn_t_conflict *)(lVar151 + 8),
                         (uint)*(ushort *)(lVar151 + 0x12),(bb_insn_t_conflict)pFVar116,1);
          }
          lVar135 = *(long *)(lVar135 + 0x80);
          if (lVar135 != 0) {
            add_ssa_edge(gen_ctx,*(bb_insn_t_conflict *)(lVar135 + 8),
                         (uint)*(ushort *)(lVar135 + 0x12),(bb_insn_t_conflict)pFVar116,2);
          }
          if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
            fwrite("      changing to ",0x12,1,(FILE *)gen_ctx->debug_file);
            print_bb_insn(gen_ctx,(bb_insn_t_conflict)pFVar116,1);
          }
          ssa_delete_insn_if_dead_p(gen_ctx,(bb_insn_t_conflict)pFVar97);
          pcVar88 = (char *)pFVar97;
          if (pFVar116 != (FILE *)0x0) {
            local_3e0 = *(FILE **)pFVar116;
            pFVar91 = (FILE *)((DLIST_LINK_bb_t *)&pFVar116->_IO_write_base)->prev;
            pFVar92 = pFVar116;
          }
LAB_00125d1c:
          for (uVar149 = 0; uVar149 < *(uint *)((long)&local_3e0->_IO_read_base + 4);
              uVar149 = uVar149 + 1) {
            if (local_3e0->_shortbuf[uVar149 * 0x30 + -0x5b] == '\v') {
              pcVar107 = local_3e0->_shortbuf + uVar149 * 0x30 + -99;
              if (*(int *)(pcVar107 + 0x24) != -1) {
                __assert_fail("mem_op_ref->mode == MIR_OP_VAR_MEM && mem_op_ref->u.var_mem.index == (4294967295U)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x1623,
                              "int update_addr_p(gen_ctx_t, bb_t, MIR_op_t *, MIR_op_t *, addr_info_t *)"
                             );
              }
              if (*(MIR_reg_t *)(pcVar107 + 0x20) != 0xffffffff) {
                _MIR_new_var_op(gen_ctx->ctx,*(MIR_reg_t *)(pcVar107 + 0x20));
                auVar7 = _out_p_1;
                bVar156 = false;
                aStack_358.mem.base = type_regs[8];
                aStack_358.mem.index = type_regs[9];
                aStack_358.mem.disp._0_4_ = type_regs[10];
                aStack_358.mem.disp._4_4_ = type_regs[0xb];
                pMStack_360 = (MIR_insn_t)type_regs._8_8_;
                aStack_358.reg = type_regs[4];
                aStack_358.mem.alias = type_regs[5];
                aStack_358.str.s = (char *)type_regs._24_8_;
                op_num_1 = (int)*(undefined8 *)pcVar107;
                uStack_364 = (undefined4)((ulong)*(undefined8 *)pcVar107 >> 0x20);
                out_p_1._1_3_ = 0;
                out_p_1._0_1_ = pcVar107[0x10];
                _uStack_3a4 = auVar7._4_28_;
                auStack_3a0 = (undefined1  [8])*(undefined8 *)(pcVar107 + 0x28);
                local_388 = (char *)CONCAT71(local_388._1_7_,1);
                auStack_398 = (undefined1  [8])&op_num_1;
                pMStack_390 = (MIR_op_t *)0x0;
                bVar157 = true;
                bVar69 = true;
LAB_00125e11:
                do {
                  bVar128 = bVar69;
                  bVar68 = bVar157;
                  pFVar97 = (FILE *)&out_p_1;
                  var_1 = out_p_1;
                  aStack_318._16_8_ = local_388;
                  uStack_324 = uStack_3a4;
                  aStack_318.ref = (MIR_item_t)auStack_398;
                  pcStack_320 = (char *)auStack_3a0;
                  aStack_318.str.s = (char *)pMStack_390;
                  bVar69 = !bVar156;
                  bVar156 = true;
                  bVar157 = bVar68;
                  if (bVar69) {
                    iVar78 = var_plus_const(gen_ctx,(ssa_edge_t_conflict)*(void **)auStack_398,
                                            pbVar96,(MIR_op_t **)(auStack_3a0 + 8),&c);
                    if (iVar78 == 0) {
                      if ((char)local_388 == '\x01') {
                        iVar78 = var_mult_const(gen_ctx,*(ssa_edge_t_conflict *)auStack_398,pbVar96,
                                                (MIR_op_t **)(auStack_3a0 + 8),&c);
                        if (iVar78 != 0) {
                          bVar156 = false;
                          if (CONCAT44(c._4_4_,(MIR_reg_t)c) != 1) {
                            auVar33 = vpermilps_avx(_auStack_398,0x4e);
                            _auStack_398 = auVar33;
                            local_388 = (char *)CONCAT71(local_388._1_7_,(char)(MIR_reg_t)c);
                            bVar156 = bVar68;
                            bVar157 = false;
                          }
                          goto LAB_00125f4c;
                        }
                      }
                      bVar156 = false;
                      if (pMStack_390 == (MIR_op_t *)0x0) {
                        lVar135 = *(long *)auStack_398;
                        if (lVar135 != 0) {
                          if ((char)*(long *)((long)auStack_398 + 8) != '\x02') {
                            __assert_fail("*var_op_ref1 != ((void*)0) && (*var_op_ref1)->mode == MIR_OP_VAR && *var_op_ref2 == ((void*)0)"
                                          ,
                                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                          ,0x1601,
                                          "int var_plus_var(gen_ctx_t, ssa_edge_t, bb_t, MIR_op_t **, MIR_op_t **)"
                                         );
                          }
                          pcVar88 = MIR_reg_hard_reg_name
                                              (gen_ctx->ctx,
                                               (int)*(long *)((long)auStack_398 + 0x10) - 0x21,
                                               (gen_ctx->curr_func_item->u).func);
                          if (((pcVar88 == (char *)0x0) &&
                              (lVar135 = **(long **)(lVar135 + 8), *(int *)(lVar135 + 0x18) == 0x22)
                              ) && ((*(char *)(lVar135 + 0x58) == '\x02' &&
                                    (*(char *)(lVar135 + 0x88) == '\x02')))) {
                            lVar151 = *(long *)(lVar135 + 0x50);
                            if (((lVar151 == 0) ||
                                (pbVar103 = *(bb_insn_t_conflict *)(lVar151 + 8),
                                pbVar103->bb == pbVar96)) ||
                               (iVar78 = cycle_phi_p(pbVar103), iVar78 == 0)) {
                              lVar151 = *(long *)(lVar135 + 0x80);
                              if ((lVar151 != 0) &&
                                 (pbVar103 = *(bb_insn_t_conflict *)(lVar151 + 8),
                                 pbVar103->bb != pbVar96)) {
                                iVar78 = cycle_phi_p(pbVar103);
                                if (iVar78 != 0) goto LAB_00125f4c;
                              }
                              auStack_398 = (undefined1  [8])(lVar135 + 0x50);
                              bVar156 = false;
                              bVar157 = false;
                              pMStack_390 = (MIR_op_t *)(lVar135 + 0x80);
                              goto LAB_00125f4c;
                            }
                          }
                        }
                      }
                    }
                    else {
                      auStack_3a0 = (undefined1  [8])
                                    ((long)auStack_3a0 + CONCAT44(c._4_4_,(MIR_reg_t)c));
                    }
                    bVar156 = false;
                  }
LAB_00125f4c:
                  pcVar88 = (char *)&var_1;
                  iVar78 = addr_info_eq_p((addr_info_t *)pFVar97,(addr_info_t *)pcVar88);
                  if (iVar78 == 0) {
                    iVar78 = addr_info_ok_p(gen_ctx,(addr_info_t *)pFVar97);
                    pcVar88 = (char *)pFVar97;
                    bVar69 = false;
                    if (iVar78 != 0) goto LAB_00125e11;
                  }
                  uStack_3a4 = uStack_324;
                  out_p_1 = var_1;
                  auStack_3a0 = (undefined1  [8])pcStack_320;
                  auStack_398 = (undefined1  [8])aStack_318.i;
                  pMStack_390 = (MIR_op_t *)aStack_318.str.s;
                  local_388 = (char *)aStack_318._16_8_;
                  if (bVar68) goto LAB_001261d4;
                  iVar78 = var_plus_const(gen_ctx,*(ssa_edge_t_conflict *)aStack_318.str.s,pbVar96,
                                          &pMStack_390,&c);
                  if (iVar78 == 0) {
                    iVar78 = var_mult_const(gen_ctx,(ssa_edge_t_conflict)pMStack_390->data,pbVar96,
                                            &pMStack_390,&c);
                    if (iVar78 == 0) {
                      if ((char)local_388 == '\x01' && auStack_398 == (undefined1  [8])0x0) {
                        __assert_fail("addr_info->base != ((void*)0) || addr_info->scale != 1",
                                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                      ,0x164d,
                                      "int update_addr_p(gen_ctx_t, bb_t, MIR_op_t *, MIR_op_t *, addr_info_t *)"
                                     );
                      }
                    }
                    else {
                      local_388 = (char *)CONCAT71(local_388._1_7_,(char)local_388 * (char)c);
                    }
                  }
                  else {
                    auStack_3a0 = (undefined1  [8])
                                  ((long)auStack_3a0 +
                                  ((ulong)local_388 & 0xff) * CONCAT44(c._4_4_,(MIR_reg_t)c));
                  }
                  pFVar97 = (FILE *)&out_p_1;
                  pcVar88 = (char *)&var_1;
                  iVar78 = addr_info_eq_p((addr_info_t *)pFVar97,(addr_info_t *)pcVar88);
                  if (iVar78 != 0) break;
                  iVar78 = addr_info_ok_p(gen_ctx,(addr_info_t *)pFVar97);
                  bVar156 = true;
                  pcVar88 = (char *)pFVar97;
                  bVar157 = false;
                  bVar69 = false;
                } while (iVar78 != 0);
                uStack_3a4 = uStack_324;
                out_p_1 = var_1;
                auStack_3a0 = (undefined1  [8])pcStack_320;
                auStack_398 = (undefined1  [8])aStack_318.i;
                pMStack_390 = (MIR_op_t *)aStack_318.str.s;
LAB_001261d4:
                local_388 = (char *)aStack_318._16_8_;
                if (!bVar128) {
                  remove_ssa_edge(*(ssa_edge_t_conflict *)pcVar107);
                  *(undefined1 (*) [8])(pcVar107 + 0x28) = auStack_3a0;
                  *(undefined8 *)(pcVar107 + 0x20) = 0xffffffffffffffff;
                  if (auStack_398 != (undefined1  [8])0x0) {
                    *(int *)(pcVar107 + 0x20) = (int)*(long *)((long)auStack_398 + 0x10);
                    lVar135 = *(long *)auStack_398;
                    if (lVar135 != 0) {
                      pcVar88 = *(char **)(lVar135 + 8);
                      add_ssa_edge(gen_ctx,(bb_insn_t_conflict)pcVar88,
                                   (uint)*(ushort *)(lVar135 + 0x12),(bb_insn_t_conflict)pFVar92,
                                   (int)uVar149);
                    }
                  }
                  if (pMStack_390 != (MIR_op_t *)0x0) {
                    *(MIR_reg_t *)(pcVar107 + 0x24) = (pMStack_390->u).reg;
                    pvVar14 = pMStack_390->data;
                    if (pvVar14 != (void *)0x0) {
                      pcVar88 = *(char **)((long)pvVar14 + 8);
                      add_ssa_edge_1(gen_ctx,(bb_insn_t_conflict)pcVar88,
                                     (uint)*(ushort *)((long)pvVar14 + 0x12),
                                     (bb_insn_t_conflict)pFVar92,(int)uVar149,1);
                    }
                  }
                  pcVar107[0x11] = (char)local_388;
                  if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                    fprintf((FILE *)gen_ctx->debug_file,"    changing mem op %lu to ",uVar149);
                    pcVar88 = (char *)local_3e0;
                    print_insn(gen_ctx,(MIR_insn_t)local_3e0,1);
                  }
                }
              }
            }
          }
        }
      }
      pDVar106 = (DLIST_bb_t *)&(pbVar96->bb_link).next;
    }
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fwrite("+++++++++++++MIR after ssa combine:\n",0x24,1,(FILE *)gen_ctx->debug_file);
      pcVar88 = (char *)0x1;
      print_CFG(gen_ctx,1,1,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
    }
    undo_build_ssa(gen_ctx);
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fwrite("+++++++++++++MIR after destroying ssa:\n",0x27,1,(FILE *)gen_ctx->debug_file);
      print_varr_insns(gen_ctx,"undef init",gen_ctx->ssa_ctx->undef_insns);
      print_varr_insns(gen_ctx,"arg init",gen_ctx->ssa_ctx->arg_bb_insns);
      fputc(10,(FILE *)gen_ctx->debug_file);
      pcVar88 = (char *)0x1;
      print_CFG(gen_ctx,1,0,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
    }
    if (gen_ctx->optimize_level < 2) goto LAB_001268ca;
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fwrite("+++++++++++++Jump optimization:\n",0x20,1,(FILE *)gen_ctx->debug_file);
    }
    pMVar15 = gen_ctx->ctx;
    lVar135 = remove_unreachable_bbs(gen_ctx);
    if (((lVar135 != 0) && ((FILE *)gen_ctx->debug_file != (FILE *)0x0)) &&
       (0 < gen_ctx->debug_level)) {
      fprintf((FILE *)gen_ctx->debug_file,"%ld deleted unrechable bb insns\n",lVar135);
    }
    bitmap_clear(gen_ctx->temp_bitmap);
    for (pbVar117 = DLIST_bb_t_el(&gen_ctx->curr_cfg->bbs,2); pbVar117 != (bb_t_conflict)0x0;
        pbVar117 = (pbVar117->bb_link).next) {
      pbVar119 = (pbVar117->bb_insns).tail;
      if (pbVar119 != (bb_insn_t)0x0) {
        lVar135 = *(long *)&pbVar119->insn->field_0x18;
        iVar78 = (int)lVar135;
        if (iVar78 - 0x76U < 0x2f) {
          sStackY_4a0 = 0;
          lVar135 = 1;
        }
        else {
          if (iVar78 != 0xaa) goto LAB_001264ae;
          lVar135 = lVar135 >> 0x20;
          sStackY_4a0 = 1;
        }
        lVar151 = sStackY_4a0 * 0x30;
        for (; (long)sStackY_4a0 < lVar135; sStackY_4a0 = sStackY_4a0 + 1) {
          bitmap_set_bit_p(gen_ctx->temp_bitmap,
                           *(size_t *)(*(long *)((long)&pbVar119->insn->ops[0].u + lVar151) + 0x30))
          ;
          lVar151 = lVar151 + 0x30;
        }
      }
LAB_001264ae:
    }
    pcVar88 = (char *)0x2;
    pFVar91 = (FILE *)DLIST_bb_t_el(&gen_ctx->curr_cfg->bbs,2);
    bVar156 = false;
    do {
      while( true ) {
        pFVar92 = pFVar91;
        if (pFVar92 == (FILE *)0x0) {
          if (bVar156) {
            remove_unreachable_bbs(gen_ctx);
          }
          enumerate_bbs(gen_ctx);
          if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
            fwrite("+++++++++++++MIR after Jump optimization:\n",0x2a,1,(FILE *)gen_ctx->debug_file)
            ;
            pcVar88 = (char *)0x1;
            print_CFG(gen_ctx,1,0,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
          }
          goto LAB_001268ca;
        }
        plVar22 = (long *)pFVar92->_IO_save_end;
        pFVar91 = (FILE *)pFVar92->_IO_write_ptr;
        if (((*(long *)pFVar92 != 2) &&
            (peVar118 = (in_edge_t_conflict)pFVar92->_IO_write_end,
            peVar118 != (in_edge_t_conflict)0x0)) && ((peVar118->in_link).next == (in_edge_t)0x0))
        break;
        if (plVar22 != (long *)0x0) {
LAB_0012650d:
          pFVar97 = (FILE *)*plVar22;
          uVar77 = *(int *)&pFVar97->_IO_read_base - 0x76;
          if (((uVar77 < 0x2f) && (uVar77 != 0x2a)) || (*(int *)&pFVar97->_IO_read_base == 0xa0)) {
            if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
              pcVar88 = "  BB%lu:\n";
              fprintf((FILE *)gen_ctx->debug_file,"  BB%lu:\n",*(undefined8 *)pFVar92);
            }
            if (*(char *)&pFVar97->_IO_write_ptr != '\f') {
              __assert_fail("insn->ops[0].mode == MIR_OP_LABEL",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0x1a01,"void jump_opt(gen_ctx_t)");
            }
            peVar118 = (in_edge_t_conflict)pFVar97->_IO_read_end;
            if (((peVar118 == (in_edge_t_conflict)0x0) ||
                (*(int *)&(peVar118->in_link).next != 0xb4)) ||
               (peVar118 != ((DLIST_in_edge_t *)&pFVar97->_IO_write_end)->head)) {
LAB_001266e9:
              peVar118 = ((DLIST_in_edge_t *)&pFVar97->_IO_write_end)->head;
              peVar25 = peVar118;
              do {
                peVar148 = peVar25;
                peVar25 = (peVar148->in_link).prev;
                if (peVar25 == (in_edge_t)0x0) goto LAB_00126710;
                iVar78 = *(int *)&(peVar25->in_link).next;
              } while (iVar78 == 0xb4);
              if (iVar78 == 0x76) {
                peVar148 = *(in_edge_t_conflict *)&peVar25->fall_through_p;
              }
LAB_00126710:
              if (peVar118 != peVar148) {
                if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                  fwrite("  Changing label in branch insn ",0x20,1,(FILE *)gen_ctx->debug_file);
                  MIR_output_insn(pMVar15,gen_ctx->debug_file,(MIR_insn_t_conflict)pFVar97,
                                  (gen_ctx->curr_func_item->u).func,0);
                  peVar118 = ((DLIST_in_edge_t *)&pFVar97->_IO_write_end)->head;
                }
                pbVar117 = peVar118->src;
                ((DLIST_in_edge_t *)&pFVar97->_IO_write_end)->head = peVar148;
                peVar118 = (pbVar117->in_edges).head;
                peVar148 = (peVar148->src->in_edges).head;
                ppbVar138 = (bb_t *)&pFVar92->_IO_buf_end;
                if (peVar118 == peVar148) {
                  __assert_fail("label_bb_insn->bb != last_label_bb_insn->bb",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                ,0x1a21,"void jump_opt(gen_ctx_t)");
                }
                while ((pcVar88 = (char *)*ppbVar138, (FILE *)pcVar88 != (FILE *)0x0 &&
                       ((in_edge_t_conflict)((FILE *)pcVar88)->_IO_read_ptr != peVar118))) {
                  ppbVar138 = (bb_t *)&((FILE *)pcVar88)->_IO_write_ptr;
                }
                ((FILE *)pcVar88)->_IO_read_ptr = (char *)peVar148;
                DLIST_in_edge_t_remove
                          ((DLIST_in_edge_t *)&peVar118->fall_through_p,(in_edge_t_conflict)pcVar88)
                ;
                DLIST_in_edge_t_append
                          ((DLIST_in_edge_t *)(((FILE *)pcVar88)->_IO_read_ptr + 0x30),
                           (in_edge_t_conflict)pcVar88);
                bVar156 = true;
                if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) &&
                   (bVar156 = true, 1 < gen_ctx->debug_level)) {
                  fwrite("  , result insn ",0x10,1,(FILE *)gen_ctx->debug_file);
                  pcVar88 = (char *)gen_ctx->debug_file;
                  MIR_output_insn(pMVar15,(FILE *)pcVar88,(MIR_insn_t_conflict)pFVar97,
                                  (gen_ctx->curr_func_item->u).func,1);
                  bVar156 = true;
                }
                goto LAB_001266e9;
              }
            }
            else {
              if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                fwrite("  Removing trivial branch insn ",0x1f,1,(FILE *)gen_ctx->debug_file);
                MIR_output_insn(pMVar15,gen_ctx->debug_file,(MIR_insn_t_conflict)pFVar97,
                                (gen_ctx->curr_func_item->u).func,1);
              }
              pcVar88 = pFVar92->_IO_buf_end;
              pcVar88[0x30] = '\x01';
              e = *(edge_t_conflict *)(pcVar88 + 0x28);
              if (e != (edge_t_conflict)0x0) {
                if ((e->out_link).next != (out_edge_t)0x0) {
                  __assert_fail("e == ((void*)0) || (DLIST_out_edge_t_next (e)) == ((void*)0)",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                ,0x1a0b,"void jump_opt(gen_ctx_t)");
                }
                delete_edge(e);
              }
              gen_delete_insn(gen_ctx,(MIR_insn_t)pFVar97);
              pcVar88 = (char *)pFVar97;
              pFVar91 = pFVar92;
            }
          }
        }
      }
      if (plVar22 != (long *)0x0) {
        if (((*(int *)(*plVar22 + 0x18) == 0xb4) && (plVar22[5] == 0)) && (plVar22[4] == 0)) {
          pcVar88 = *(char **)(*plVar22 + 0x30);
          iVar78 = bitmap_bit_p(gen_ctx->temp_bitmap,(size_t)pcVar88);
          if (iVar78 == 0) goto LAB_0012666a;
        }
        goto LAB_0012650d;
      }
LAB_0012666a:
      peVar25 = (in_edge_t)pFVar92->_IO_buf_end;
      if (peVar25 == (in_edge_t)0x0) {
        __assert_fail("out_e != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x19f4,"void jump_opt(gen_ctx_t)");
      }
      peVar118->dst = peVar25->dst;
      DLIST_in_edge_t_remove((DLIST_in_edge_t *)&pFVar92->_IO_write_end,peVar118);
      pbVar117 = peVar25->dst;
      if ((pbVar117->in_edges).tail == (in_edge_t_conflict)0x0) {
LAB_0012a128:
        dlist_assert_fail("insert_before","in_edge_t");
      }
      peVar23 = (peVar25->in_link).prev;
      peVar24 = (pbVar117->in_edges).head;
      if (peVar23 == (in_edge_t)0x0) {
        if (peVar24 != peVar25) goto LAB_0012a128;
        (peVar25->in_link).prev = peVar118;
        (peVar118->in_link).next = peVar25;
        (peVar118->in_link).prev = (in_edge_t)0x0;
        (pbVar117->in_edges).head = peVar118;
      }
      else {
        if (peVar24 == (in_edge_t)0x0) goto LAB_0012a128;
        (peVar23->in_link).next = peVar118;
        (peVar118->in_link).prev = peVar23;
        (peVar25->in_link).prev = peVar118;
        (peVar118->in_link).next = peVar25;
      }
      if (pFVar92->_IO_write_end != (char *)0x0) {
        __assert_fail("(DLIST_in_edge_t_head (&(bb->in_edges))) == ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x19f8,"void jump_opt(gen_ctx_t)");
      }
      remove_bb(gen_ctx,(bb_t_conflict)pFVar92);
      pcVar88 = (char *)pFVar92;
    } while( true );
  }
LAB_001268ca:
  target_machinize(gen_ctx);
  if (gen_ctx->curr_func_item->item_type != MIR_func_item) {
    __assert_fail("gen_ctx->curr_func_item->item_type == MIR_func_item",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1bac,"void make_io_dup_op_insns(gen_ctx_t)");
  }
  pMVar15 = gen_ctx->ctx;
  pMVar16 = (gen_ctx->curr_func_item->u).func;
  for (lVar135 = 0; lVar135 != 0xac; lVar135 = lVar135 + 4) {
    pcVar88 = (char *)(ulong)*(uint *)((long)target_io_dup_op_insn_codes + lVar135);
    bitmap_set_bit_p(gen_ctx->insn_to_consider,(size_t)pcVar88);
  }
  for (lVar135 = 0; lVar135 != 0x13; lVar135 = lVar135 + 1) {
    type_regs[lVar135] = 0xffffffff;
  }
  pFVar91 = (FILE *)(pMVar16->insns).head;
LAB_00126932:
  pFVar92 = pFVar91;
  iVar78 = (int)pcVar88;
  if (pFVar92 != (FILE *)0x0) {
    pFVar91 = (FILE *)pFVar92->_IO_read_end;
    iVar78 = (int)pFVar92->_IO_read_base;
    if (((3 < iVar78 - 0x1eU) && (iVar78 != 0xb4)) && (iVar78 != 0xb9)) {
      pFVar97 = (FILE *)((ulong)pFVar92->_IO_read_base & 0xffffffff);
      iVar78 = bitmap_bit_p(gen_ctx->insn_to_consider,(size_t)pFVar97);
      if ((iVar78 != 0) &&
         (iVar78 = MIR_op_eq_p(pMVar15,*(MIR_op_t *)&pFVar92->_IO_write_base,
                               *(MIR_op_t *)&pFVar92->_IO_backup_base), iVar78 == 0)) {
        add_inout_reloads(gen_ctx,(MIR_insn_t)pFVar92);
      }
      pcVar88 = (char *)pFVar92;
      iVar78 = target_insn_ok_p(gen_ctx,(MIR_insn_t)pFVar92);
      if (iVar78 == 0) {
        pMVar94 = (MIR_op_t *)&pFVar92->_IO_write_base;
        pMVar115 = pMVar94;
        for (uVar149 = 0; uVar155 = (ulong)pFVar92->_IO_read_base >> 0x20, uVar149 < uVar155;
            uVar149 = uVar149 + 1) {
          if ((pMVar115->field_0x8 == '\v') &&
             ((pcVar88 = (char *)pFVar97,
              iVar78 = bitmap_bit_p(gen_ctx->insn_to_consider,(size_t)pFVar97), 1 < uVar149 ||
              (iVar78 == 0)))) {
            pcVar88 = (char *)pFVar92;
            MVar82 = MIR_insn_op_mode(pMVar15,(MIR_insn_t_conflict)pFVar92,uVar149,&out_p_1);
            MVar79 = MIR_T_F;
            if (MVar82 != MIR_OP_FLOAT) {
              if (MVar82 == MIR_OP_LDOUBLE) goto LAB_00126b2f;
              if (MVar82 == MIR_OP_DOUBLE) {
                MVar79 = MIR_T_D;
              }
              else {
                MVar79 = MIR_T_I64;
              }
            }
            MVar76 = type_regs[MVar79];
            if (MVar76 == 0xffffffff) {
              MVar76 = gen_new_temp_reg(gen_ctx,MVar79,(gen_ctx->curr_func_item->u).func);
              type_regs[MVar79] = MVar76;
            }
            pMStack_360 = *(MIR_insn_t *)&pMVar115->field_0x8;
            aStack_358.i = (pMVar115->u).i;
            aStack_358.str.s = (pMVar115->u).str.s;
            aStack_358._16_8_ = *(undefined8 *)((long)&pMVar115->u + 0x10);
            aStack_358.mem.disp = (pMVar115->u).mem.disp;
            op_num_1 = (int)pMVar115->data;
            uStack_364 = (undefined4)((ulong)pMVar115->data >> 0x20);
            _MIR_new_var_op(pMVar15,MVar76);
            auVar7._4_4_ = uStack_324;
            auVar7._0_4_ = var_1;
            auVar7._8_8_ = pcStack_320;
            auVar7._16_8_ = aStack_318.i;
            auVar7._24_8_ = aStack_318.str.s;
            aVar46.str.s = aStack_318.str.s;
            aVar46.i = aStack_318.i;
            aVar46._16_8_ = aStack_318._16_8_;
            aVar46.mem.disp = aStack_318.mem.disp;
            pMVar115->u = aVar46;
            *(undefined1 (*) [32])pMVar115 = auVar7;
            pcVar88 = (char *)pFVar92;
            iVar78 = target_insn_ok_p(gen_ctx,(MIR_insn_t)pFVar92);
            if (iVar78 != 0) {
              pcVar88 = (char *)pFVar92;
              add_reload(gen_ctx,(MIR_insn_t)pFVar92,(MIR_op_t *)&op_num_1,pMVar115,MVar79,out_p_1);
              type_regs[MVar79] = 0xffffffff;
              uVar155 = (ulong)*(uint *)((long)&pFVar92->_IO_read_base + 4);
              break;
            }
            auVar43._4_4_ = uStack_364;
            auVar43._0_4_ = op_num_1;
            auVar43._8_8_ = pMStack_360;
            auVar43._16_8_ = aStack_358.i;
            auVar43._24_8_ = aStack_358.str.s;
            aVar44.str.s = aStack_358.str.s;
            aVar44.i = aStack_358.i;
            aVar44._16_8_ = aStack_358._16_8_;
            aVar44.mem.disp = aStack_358.mem.disp;
            pMVar115->u = aVar44;
            *(undefined1 (*) [32])pMVar115 = auVar43;
          }
LAB_00126b2f:
          pMVar115 = pMVar115 + 1;
        }
        if (uVar155 <= uVar149) {
          pcVar88 = (char *)pFVar97;
          iVar78 = bitmap_bit_p(gen_ctx->insn_to_consider,(size_t)pFVar97);
          if ((iVar78 != 0) && (*(char *)&pFVar92->_IO_write_ptr == '\v')) {
            add_inout_reloads(gen_ctx,(MIR_insn_t)pFVar92);
            pcVar88 = (char *)pFVar92;
            iVar78 = target_insn_ok_p(gen_ctx,(MIR_insn_t)pFVar92);
            if (iVar78 != 0) goto LAB_00126932;
          }
          for (uVar149 = 0; uVar149 < *(uint *)((long)&pFVar92->_IO_read_base + 4);
              uVar149 = uVar149 + 1) {
            if ((pMVar94->field_0x8 == '\v') &&
               ((pcVar88 = (char *)pFVar97,
                iVar78 = bitmap_bit_p(gen_ctx->insn_to_consider,(size_t)pFVar97), 1 < uVar149 ||
                (iVar78 == 0)))) {
              pcVar88 = (char *)pFVar92;
              MVar82 = MIR_insn_op_mode(pMVar15,(MIR_insn_t_conflict)pFVar92,uVar149,&out_p_1);
              MVar79 = MIR_T_F;
              if (MVar82 != MIR_OP_FLOAT) {
                if (MVar82 == MIR_OP_LDOUBLE) goto LAB_00126cc1;
                if (MVar82 == MIR_OP_DOUBLE) {
                  MVar79 = MIR_T_D;
                }
                else {
                  MVar79 = MIR_T_I64;
                }
              }
              MVar76 = gen_new_temp_reg(gen_ctx,MVar79,(gen_ctx->curr_func_item->u).func);
              _MIR_new_var_op(pMVar15,MVar76);
              auVar45._4_4_ = uStack_324;
              auVar45._0_4_ = var_1;
              auVar45._8_8_ = pcStack_320;
              auVar45._16_8_ = aStack_318.i;
              auVar45._24_8_ = aStack_318.str.s;
              aVar47.str.s = aStack_318.str.s;
              aVar47.i = aStack_318.i;
              aVar47._16_8_ = aStack_318._16_8_;
              aVar47.mem.disp = aStack_318.mem.disp;
              pMVar94->u = aVar47;
              *(undefined1 (*) [32])pMVar94 = auVar45;
              pcVar88 = (char *)pFVar92;
              add_reload(gen_ctx,(MIR_insn_t)pFVar92,pMVar94,pMVar94,MVar79,out_p_1);
            }
LAB_00126cc1:
            pMVar94 = pMVar94 + 1;
          }
        }
      }
    }
    goto LAB_00126932;
  }
  if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
    fwrite("+++++++++++++MIR after machinize:\n",0x22,1,(FILE *)gen_ctx->debug_file);
    iVar78 = 0;
    print_CFG(gen_ctx,0,0,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
  }
  if (gen_ctx->optimize_level != 0) {
    build_loop_tree(gen_ctx);
    if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      print_loop_tree(gen_ctx,iVar78);
    }
    if (1 < gen_ctx->optimize_level) {
      pVVar26 = gen_ctx->coalesce_ctx->moves;
      if ((pVVar26 == (VARR_mv_t *)0x0) || (pVVar26->varr == (mv_t *)0x0)) {
        pcVar88 = "trunc";
LAB_00129ab0:
        mir_varr_assert_fail(pcVar88,"mv_t");
      }
      pVVar26->els_num = 0;
      pDVar106 = &gen_ctx->curr_cfg->bbs;
      while (pbVar96 = pDVar106->head, pbVar96 != (bb_t_conflict)0x0) {
        pDVar136 = &pbVar96->bb_insns;
        while (pbVar103 = pDVar136->head, pbVar103 != (bb_insn_t_conflict)0x0) {
          iVar78 = move_p(pbVar103->insn);
          if (iVar78 != 0) {
            iVar78 = bb_loop_level(pbVar96);
            uVar149 = 1;
            for (; 0 < iVar78; iVar78 = iVar78 + -1) {
              if (uVar149 < 0x1fffffffffffffff) {
                uVar149 = uVar149 * 5;
              }
            }
            pVVar26 = gen_ctx->coalesce_ctx->moves;
            __ptr_00 = pVVar26->varr;
            if (__ptr_00 == (mv_t *)0x0) {
              pcVar88 = "expand";
              goto LAB_00129ab0;
            }
            sVar90 = pVVar26->els_num;
            uVar155 = sVar90 + 1;
            if (pVVar26->size < uVar155) {
              sVar90 = (uVar155 >> 1) + uVar155;
              __ptr_00 = (mv_t *)realloc(__ptr_00,sVar90 * 0x10);
              pVVar26->varr = __ptr_00;
              pVVar26->size = sVar90;
              sVar90 = pVVar26->els_num;
              uVar155 = sVar90 + 1;
            }
            pVVar26->els_num = uVar155;
            __ptr_00[sVar90].bb_insn = pbVar103;
            __ptr_00[sVar90].freq = uVar149;
          }
          pDVar136 = (DLIST_bb_insn_t *)&(pbVar103->bb_insn_link).next;
        }
        pDVar106 = (DLIST_bb_t *)&(pbVar96->bb_link).next;
      }
      pVVar26 = gen_ctx->coalesce_ctx->moves;
      if (pVVar26 == (VARR_mv_t *)0x0) {
        pcVar88 = "addr";
        goto LAB_00129ab0;
      }
      __nmemb = pVVar26->els_num;
      qsort(pVVar26->varr,__nmemb,0x10,mv_freq_cmp);
      VARR_inttrunc(gen_ctx->lr_ctx->var_to_scan_var_map,__nmemb);
      VARR_MIR_reg_ttrunc(gen_ctx->lr_ctx->scan_var_to_var_map,__nmemb);
      bitmap_clear(gen_ctx->temp_bitmap);
      gen_ctx->lr_ctx->scan_vars_num = 0;
      for (uVar149 = 0; sVar90 = VARR_mv_tlength(gen_ctx->coalesce_ctx->moves), uVar149 < sVar90;
          uVar149 = uVar149 + 1) {
        mVar164 = VARR_mv_tget(gen_ctx->coalesce_ctx->moves,uVar149);
        pMVar137 = (mVar164.bb_insn)->insn;
        collect_scan_var(gen_ctx,pMVar137->ops[0].u.reg);
        collect_scan_var(gen_ctx,*(MIR_reg_t *)&pMVar137[1].insn_link.next);
      }
      if (gen_ctx->lr_ctx->scan_vars_num - 10000U < 0xffffd8f1) goto LAB_001279c4;
      uVar77 = 0;
      calculate_func_cfg_live_info(gen_ctx,0);
      pcVar88 = "Live info before coalesce";
      print_live_info(gen_ctx,"Live info before coalesce",1,0);
      if (gen_ctx->optimize_level == 0) {
        __assert_fail("gen_ctx->optimize_level > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1af0,"void coalesce(gen_ctx_t)");
      }
      pMVar15 = gen_ctx->ctx;
      VARR_MIR_reg_ttrunc(gen_ctx->coalesce_ctx->first_coalesced_reg,(size_t)pcVar88);
      VARR_MIR_reg_ttrunc(gen_ctx->coalesce_ctx->next_coalesced_reg,(size_t)pcVar88);
      for (; uVar77 <= gen_ctx->curr_cfg->max_var; uVar77 = uVar77 + 1) {
        VARR_MIR_reg_tpush(gen_ctx->coalesce_ctx->first_coalesced_reg,uVar77);
        VARR_MIR_reg_tpush(gen_ctx->coalesce_ctx->next_coalesced_reg,uVar77);
      }
      bitmap_clear(gen_ctx->coalesce_ctx->conflict_matrix);
      pDVar106 = &gen_ctx->curr_cfg->bbs;
      while (pbVar96 = pDVar106->head, pbVar96 != (bb_t_conflict)0x0) {
        pbVar119 = (pbVar96->bb_insns).head;
        if (pbVar119 != (bb_insn_t)0x0) {
          pMVar137 = pbVar119->insn;
          pMVar99 = ((pbVar96->bb_insns).tail)->insn;
          bitmap_clear(gen_ctx->lr_ctx->live_vars);
          pVVar102 = pbVar96->out;
          if (pVVar102 != (bitmap_t)0x0) {
            op_num_1 = (int)pVVar102;
            uStack_364 = (undefined4)((ulong)pVVar102 >> 0x20);
            pMStack_360 = (MIR_insn_t)0x0;
            while (iVar78 = bitmap_iterator_next((bitmap_iterator_t *)&op_num_1,(size_t *)&var_1),
                  iVar78 != 0) {
              bitmap_set_bit_p(gen_ctx->lr_ctx->live_vars,CONCAT44(uStack_324,var_1));
            }
          }
          while( true ) {
            iVar78 = move_p(pMVar99);
            MVar76 = 0xffffffff;
            if (iVar78 != 0) {
              MVar76 = var_to_scan_var(gen_ctx,*(MIR_reg_t *)&pMVar99[1].insn_link.next);
            }
            type_regs[0]._0_1_ = (char)pMVar99;
            cVar74 = (char)type_regs[0];
            type_regs[0]._1_1_ = (char)((ulong)pMVar99 >> 8);
            cVar72 = type_regs[0]._1_1_;
            type_regs._2_6_ = (undefined6)((ulong)pMVar99 >> 0x10);
            uVar73 = type_regs._2_6_;
            type_regs._8_8_ = ZEXT48(*(uint *)&pMVar99->field_0x1c);
            type_regs[4] = 0;
            type_regs[5] = 0;
            type_regs[6] = 0;
            type_regs[7] = 0;
            while (iVar78 = output_insn_var_iterator_next
                                      (gen_ctx,(insn_var_iterator_t *)type_regs,
                                       (MIR_reg_t *)&out_p_1,(int *)&c), iVar78 != 0) {
              uVar77 = var_to_scan_var(gen_ctx,out_p_1);
              if (-1 < (int)uVar77) {
                pVVar102 = gen_ctx->lr_ctx->live_vars;
                op_num_1 = (int)pVVar102;
                uStack_364 = (undefined4)((ulong)pVVar102 >> 0x20);
                pMStack_360 = (MIR_insn_t)0x0;
                while (iVar78 = bitmap_iterator_next
                                          ((bitmap_iterator_t *)&op_num_1,(size_t *)&var_1),
                      iVar78 != 0) {
                  if ((uVar77 != var_1) && (MVar76 != var_1)) {
                    uVar87 = var_1;
                    if ((int)var_1 < (int)uVar77) {
                      uVar87 = uVar77;
                    }
                    MVar83 = var_1;
                    if ((int)uVar77 < (int)var_1) {
                      MVar83 = uVar77;
                    }
                    bitmap_set_bit_p(gen_ctx->coalesce_ctx->conflict_matrix,
                                     (long)(int)(MVar83 * gen_ctx->lr_ctx->scan_vars_num + uVar87));
                  }
                }
                bitmap_clear_bit_p(gen_ctx->lr_ctx->live_vars,(ulong)uVar77);
              }
            }
            type_regs._8_8_ = ZEXT48(*(uint *)&pMVar99->field_0x1c);
            type_regs[4] = 0;
            type_regs[5] = 0;
            type_regs[6] = 0;
            type_regs[7] = 0;
            type_regs[0]._0_1_ = cVar74;
            type_regs[0]._1_1_ = cVar72;
            type_regs._2_6_ = uVar73;
            while (iVar78 = input_insn_var_iterator_next
                                      (gen_ctx,(insn_var_iterator_t *)type_regs,
                                       (MIR_reg_t *)&out_p_1,(int *)&c), iVar78 != 0) {
              uVar77 = var_to_scan_var(gen_ctx,out_p_1);
              if (-1 < (int)uVar77) {
                bitmap_set_bit_p(gen_ctx->lr_ctx->live_vars,(ulong)uVar77);
              }
            }
            if (pMVar99 == pMVar137) break;
            pMVar99 = (pMVar99->insn_link).prev;
          }
          iVar78 = bitmap_equal_p(pbVar96->in,gen_ctx->lr_ctx->live_vars);
          if (iVar78 == 0) {
            __assert_fail("bitmap_equal_p (bb->in, gen_ctx->lr_ctx->live_vars)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x1a73,
                          "void process_bb_conflicts(gen_ctx_t, bb_t, MIR_insn_t, MIR_insn_t)");
          }
        }
        pDVar106 = (DLIST_bb_t *)&(pbVar96->bb_link).next;
      }
      if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
        pVVar102 = gen_ctx->coalesce_ctx->conflict_matrix;
        if (pVVar102 == (bitmap_t)0x0) {
          mir_varr_assert_fail("size","bitmap_el_t");
        }
        fprintf((FILE *)gen_ctx->debug_file,"  Conflict matrix size=%lu, scan vars = %d\n",
                pVVar102->size << 3,(ulong)(uint)gen_ctx->lr_ctx->scan_vars_num);
      }
      iVar78 = 0;
      uVar149 = 0;
      do {
        uVar77 = 0x22;
        sVar90 = VARR_mv_tlength(gen_ctx->coalesce_ctx->moves);
        if (sVar90 <= uVar149) {
          prVar101 = VARR_reg_info_taddr(gen_ctx->curr_cfg->reg_info);
          for (; uVar77 <= gen_ctx->curr_cfg->max_var; uVar77 = uVar77 + 1) {
            uVar149 = (ulong)uVar77;
            MVar76 = VARR_MIR_reg_tget(gen_ctx->coalesce_ctx->first_coalesced_reg,uVar149);
            if (uVar77 != MVar76) {
              prVar101[MVar76].freq = prVar101[MVar76].freq + prVar101[uVar149].freq;
              prVar101[uVar149].freq = 0;
            }
          }
          uVar149 = 0;
          do {
            sVar90 = VARR_mv_tlength(gen_ctx->coalesce_ctx->moves);
            if (sVar90 <= uVar149) {
              pMVar137 = (((gen_ctx->curr_func_item->u).func)->insns).head;
              do {
                pMVar93 = pMVar137;
                if (pMVar93 == (MIR_insn_t_conflict)0x0) {
                  pDVar106 = &gen_ctx->curr_cfg->bbs;
                  while (pbVar96 = pDVar106->head, pbVar96 != (bb_t_conflict)0x0) {
                    update_bitmap_after_coalescing(gen_ctx,pbVar96->in);
                    update_bitmap_after_coalescing(gen_ctx,pbVar96->out);
                    pDVar106 = (DLIST_bb_t *)&(pbVar96->bb_link).next;
                  }
                  if ((gen_ctx->debug_file != (FILE *)0x0) && (0 < gen_ctx->debug_level)) {
                    sVar90 = VARR_mv_tlength(gen_ctx->coalesce_ctx->moves);
                    if (iVar78 != 0) {
                      fprintf((FILE *)gen_ctx->debug_file,
                              "Coalesced Moves = %d out of %d moves (%.1f%%)\n",iVar78,
                              sVar90 & 0xffffffff);
                    }
                    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level))
                    {
                      fwrite("+++++++++++++MIR after coalescing:\n",0x23,1,
                             (FILE *)gen_ctx->debug_file);
                      print_CFG(gen_ctx,1,1,1,1,output_bb_border_live_info);
                    }
                  }
                  goto LAB_001279c4;
                }
                pMVar137 = (pMVar93->insn_link).next;
                sVar90 = MIR_insn_nops(pMVar15,pMVar93);
                pMVar153 = &pMVar93->ops[0].u.mem.index;
                bVar156 = false;
                while (bVar157 = sVar90 != 0, sVar90 = sVar90 - 1, bVar157) {
                  if (*(char *)(pMVar153 + -7) == '\v') {
                    uVar77 = substitute_reg(gen_ctx,pMVar153 + -1);
                    uVar87 = substitute_reg(gen_ctx,pMVar153);
                    uVar87 = uVar87 | uVar77;
LAB_0012789e:
                    bVar156 = uVar87 != 0 || bVar156;
                  }
                  else if (*(char *)(pMVar153 + -7) == '\x02') {
                    uVar87 = substitute_reg(gen_ctx,(MIR_reg_t *)(pMVar153 + -5));
                    goto LAB_0012789e;
                  }
                  pMVar153 = pMVar153 + 0xc;
                }
                if (bVar156) {
                  for (puVar152 = (uint *)((long)pMVar93->data + 0x38);
                      puVar152 = *(uint **)puVar152, puVar152 != (uint *)0x0;
                      puVar152 = puVar152 + 4) {
                    uVar77 = *puVar152;
                    if ((0x21 < (ulong)uVar77) &&
                       (MVar76 = VARR_MIR_reg_tget(gen_ctx->coalesce_ctx->first_coalesced_reg,
                                                   (ulong)uVar77), MVar76 != uVar77)) {
                      *puVar152 = MVar76;
                    }
                  }
                }
              } while( true );
            }
            mVar164 = VARR_mv_tget(gen_ctx->coalesce_ctx->moves,uVar149);
            pbVar119 = mVar164.bb_insn;
            pMVar137 = pbVar119->insn;
            uVar155 = (ulong)*(uint *)&pMVar137[1].insn_link.next;
            if ((uVar155 < 0x22) || (uVar77 = pMVar137->ops[0].u.reg, uVar77 < 0x22)) {
              __assert_fail("sreg > ST1_HARD_REG && dreg > ST1_HARD_REG",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0x1b27,"void coalesce(gen_ctx_t)");
            }
            pbVar96 = pbVar119->bb;
            MVar76 = VARR_MIR_reg_tget(gen_ctx->coalesce_ctx->first_coalesced_reg,uVar155);
            MVar83 = VARR_MIR_reg_tget(gen_ctx->coalesce_ctx->first_coalesced_reg,(ulong)uVar77);
            if (MVar76 == MVar83) {
              if (((pbVar96->bb_insns).tail == pbVar119) && ((pbVar96->bb_insns).head == pbVar119))
              {
                pMVar93 = MIR_new_label(pMVar15);
                MIR_insert_insn_before(pMVar15,gen_ctx->curr_func_item,pMVar137,pMVar93);
                add_new_bb_insn(gen_ctx,pMVar93,pbVar96,0);
                if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                  fwrite("Adding label for becoming empty BB ",0x23,1,(FILE *)gen_ctx->debug_file);
                  MIR_output_insn(pMVar15,gen_ctx->debug_file,pMVar93,
                                  (gen_ctx->curr_func_item->u).func,1);
                  goto LAB_00127739;
                }
              }
              else {
LAB_00127739:
                if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                  fwrite("Deleting coalesced move ",0x18,1,(FILE *)gen_ctx->debug_file);
                  MIR_output_insn(pMVar15,gen_ctx->debug_file,pMVar137,
                                  (gen_ctx->curr_func_item->u).func,1);
                }
              }
              gen_delete_insn(gen_ctx,pMVar137);
            }
            uVar149 = uVar149 + 1;
          } while( true );
        }
        mVar164 = VARR_mv_tget(gen_ctx->coalesce_ctx->moves,uVar149);
        pbVar103 = mVar164.bb_insn;
        uVar77 = *(uint *)&pbVar103->insn[1].insn_link.next;
        uVar155 = (ulong)uVar77;
        if (uVar155 < 0x22) {
LAB_00129c6c:
          __assert_fail("sreg > ST1_HARD_REG && dreg > ST1_HARD_REG",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x1aff,"void coalesce(gen_ctx_t)");
        }
        uVar87 = pbVar103->insn->ops[0].u.reg;
        uVar139 = (ulong)uVar87;
        if (uVar87 < 0x22) goto LAB_00129c6c;
        MVar76 = VARR_MIR_reg_tget(gen_ctx->coalesce_ctx->first_coalesced_reg,uVar155);
        MVar83 = VARR_MIR_reg_tget(gen_ctx->coalesce_ctx->first_coalesced_reg,uVar139);
        if (MVar76 == MVar83) {
          iVar78 = iVar78 + 1;
          if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
            fprintf((FILE *)gen_ctx->debug_file,"Coalescing move r%d-r%d (freq=%llud):",uVar155,
                    (ulong)uVar87);
            print_bb_insn(gen_ctx,pbVar103,1);
          }
        }
        else {
          sVar90 = (size_t)MVar76;
          MVar80 = VARR_MIR_reg_tget(gen_ctx->coalesce_ctx->first_coalesced_reg,sVar90);
          if (MVar80 != MVar76) {
            __assert_fail("var1 == (VARR_MIR_reg_tget (gen_ctx->coalesce_ctx->first_coalesced_reg, var1))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x1a93,"int var_conflict_p(gen_ctx_t, MIR_reg_t, MIR_reg_t)");
          }
          MVar80 = VARR_MIR_reg_tget(gen_ctx->coalesce_ctx->first_coalesced_reg,(ulong)MVar83);
          if (MVar80 != MVar83) {
            __assert_fail("var2 == (VARR_MIR_reg_tget (gen_ctx->coalesce_ctx->first_coalesced_reg, var2))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x1a94,"int var_conflict_p(gen_ctx_t, MIR_reg_t, MIR_reg_t)");
          }
          pVVar145 = gen_ctx->coalesce_ctx->next_coalesced_reg;
          while( true ) {
            MVar80 = VARR_MIR_reg_tget(pVVar145,sVar90);
            iVar84 = var_to_scan_var(gen_ctx,MVar80);
            pVVar145 = gen_ctx->coalesce_ctx->next_coalesced_reg;
            ix = (ulong)MVar83;
            while( true ) {
              var_00 = VARR_MIR_reg_tget(pVVar145,ix);
              iVar85 = var_to_scan_var(gen_ctx,var_00);
              iVar81 = iVar85;
              if (iVar85 < iVar84) {
                iVar81 = iVar84;
              }
              if (iVar84 < iVar85) {
                iVar85 = iVar84;
              }
              iVar81 = bitmap_bit_p(gen_ctx->coalesce_ctx->conflict_matrix,
                                    (long)(iVar85 * gen_ctx->lr_ctx->scan_vars_num + iVar81));
              if (iVar81 != 0) goto LAB_0012749a;
              if (var_00 == MVar83) break;
              ix = (ulong)var_00;
              pVVar145 = gen_ctx->coalesce_ctx->next_coalesced_reg;
            }
            if (MVar80 == MVar76) break;
            sVar90 = (size_t)MVar80;
            pVVar145 = gen_ctx->coalesce_ctx->next_coalesced_reg;
          }
          pcVar88 = MIR_reg_hard_reg_name(pMVar15,MVar76 - 0x21,(gen_ctx->curr_func_item->u).func);
          if ((pcVar88 == (char *)0x0) ||
             (pcVar88 = MIR_reg_hard_reg_name
                                  (pMVar15,MVar83 - 0x21,(gen_ctx->curr_func_item->u).func),
             pcVar88 == (char *)0x0)) {
            if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
              fprintf((FILE *)gen_ctx->debug_file,"Coalescing move r%d-r%d (freq=%llu):",uVar155,
                      uVar139);
              print_bb_insn(gen_ctx,pbVar103,1);
            }
            iVar78 = iVar78 + 1;
            uVar86 = VARR_MIR_reg_tget(gen_ctx->coalesce_ctx->first_coalesced_reg,uVar155);
            MVar76 = VARR_MIR_reg_tget(gen_ctx->coalesce_ctx->first_coalesced_reg,uVar139);
            if (MVar76 != uVar86) {
              pcVar88 = MIR_reg_hard_reg_name
                                  (gen_ctx->ctx,MVar76 - 0x21,(gen_ctx->curr_func_item->u).func);
              if ((pcVar88 != (char *)0x0) ||
                 ((pcVar88 = MIR_reg_hard_reg_name
                                       (gen_ctx->ctx,uVar86 - 0x21,(gen_ctx->curr_func_item->u).func
                                       ), MVar83 = uVar87, pcVar88 == (char *)0x0 &&
                  (MVar76 < uVar86)))) {
                uVar139 = uVar155;
                uVar87 = uVar77;
                MVar83 = uVar77;
                uVar86 = MVar76;
              }
              do {
                uVar155 = (ulong)uVar87;
                uVar87 = VARR_MIR_reg_tget(gen_ctx->coalesce_ctx->next_coalesced_reg,uVar139);
                VARR_MIR_reg_tset(gen_ctx->coalesce_ctx->first_coalesced_reg,(ulong)uVar87,uVar86);
                uVar139 = (ulong)uVar87;
              } while (uVar87 != MVar83);
              MVar76 = VARR_MIR_reg_tget(gen_ctx->coalesce_ctx->next_coalesced_reg,(ulong)uVar86);
              VARR_MIR_reg_tset(gen_ctx->coalesce_ctx->next_coalesced_reg,(ulong)uVar86,MVar83);
              VARR_MIR_reg_tset(gen_ctx->coalesce_ctx->next_coalesced_reg,uVar155,MVar76);
            }
          }
        }
LAB_0012749a:
        uVar149 = uVar149 + 1;
      } while( true );
    }
  }
LAB_001279c4:
  gen_ctx->lr_ctx->scan_vars_num = 0;
  calculate_func_cfg_live_info(gen_ctx,1);
  pcVar88 = "Live info before RA";
  print_live_info(gen_ctx,"Live info before RA",(uint)(gen_ctx->optimize_level != 0),1);
  reg_alloc(gen_ctx);
  if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
    fwrite("+++++++++++++MIR after RA:\n",0x1b,1,(FILE *)gen_ctx->debug_file);
    pcVar88 = (char *)0x1;
    print_CFG(gen_ctx,1,0,1,0,(_func_void_gen_ctx_t_bb_t *)0x0);
  }
  uVar77 = gen_ctx->optimize_level;
  if (local_36c != 0 && uVar77 < 2) {
    plVar27 = (loop_node_t_conflict)(((gen_ctx->curr_func_item->u).func)->insns).head;
    while (plVar121 = plVar27, plVar121 != (loop_node_t_conflict)0x0) {
      plVar27 = plVar121->entry;
      pcVar88 = (char *)plVar121;
      if (*(int *)&plVar121->parent - 0xb6U < 3) {
        remove_property_insn(gen_ctx,(MIR_insn_t)plVar121);
        pcVar88 = (char *)plVar121;
      }
    }
    uVar77 = gen_ctx->optimize_level;
  }
  if (uVar77 != 0) {
    gen_ctx->lr_ctx->scan_vars_num = 0;
    calculate_func_cfg_live_info(gen_ctx,0);
    add_bb_insn_dead_vars(gen_ctx);
    print_live_info(gen_ctx,"Live info before combine",0,0);
    pMVar15 = gen_ctx->ctx;
    auVar70._24_8_ = 0;
    auVar70._0_24_ = _auStack_3a0;
    _out_p_1 = auVar70 << 0x40;
    if (gen_ctx->optimize_level == 0) {
      __assert_fail("gen_ctx->optimize_level > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x2317,"void combine(gen_ctx_t, int)");
    }
    pDVar106 = &gen_ctx->curr_cfg->bbs;
    while (pbVar96 = pDVar106->head, pbVar96 != (bb_t_conflict)0x0) {
      do {
        if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
          fprintf((FILE *)gen_ctx->debug_file,"Processing bb%lu\n",pbVar96->index);
        }
        pcVar120 = gen_ctx->combine_ctx;
        bVar157 = false;
        psVar2 = &pcVar120->curr_bb_var_ref_age;
        *psVar2 = *psVar2 + 1;
        pcVar120->last_mem_ref_insn_num = 0;
        pbVar119 = (pbVar96->bb_insns).head;
        var_1 = (MIR_reg_t)pbVar119;
        uStack_324 = (undefined4)((ulong)pbVar119 >> 0x20);
        local_400 = (MIR_context_t)0x1;
        bVar156 = true;
        while (pbVar119 != (bb_insn_t_conflict)0x0) {
          pMVar137 = pbVar119->insn;
          pbVar147 = (pbVar119->bb_insn_link).next;
          sVar90 = MIR_insn_nops(pMVar15,pMVar137);
          iVar78 = *(int *)&pMVar137->field_0x18;
          if (iVar78 == 0xb4) {
            if (bVar156) {
              bVar156 = true;
              goto LAB_00127ee6;
            }
            if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
              fwrite("  Remove label inside BB ",0x19,1,(FILE *)gen_ctx->debug_file);
              print_bb_insn(gen_ctx,pbVar119,1);
            }
            gen_delete_insn(gen_ctx,pMVar137);
LAB_00127ee4:
            bVar156 = false;
          }
          else {
            if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
              fwrite("  Processing ",0xd,1,(FILE *)gen_ctx->debug_file);
              print_bb_insn(gen_ctx,pbVar119,1);
              iVar78 = (int)*(undefined8 *)&pMVar137->field_0x18;
            }
            if (2 < iVar78 - 0xb6U) {
              target_get_early_clobbered_hard_regs(pMVar137,(MIR_reg_t *)&c,(MIR_reg_t *)&temp_op);
              if ((MIR_reg_t)c != 0xffffffff) {
                setup_var_ref(gen_ctx,(MIR_reg_t)c,pMVar137,0,(size_t)local_400,1);
              }
              if ((MIR_reg_t)temp_op.data != 0xffffffff) {
                setup_var_ref(gen_ctx,(MIR_reg_t)temp_op.data,pMVar137,0,(size_t)local_400,1);
              }
              uVar149 = *(ulong *)&pMVar137->field_0x18;
              uVar77 = (uint)uVar149;
              if (uVar77 - 0xaa < 0xfffffffd) {
                if (uVar77 != 0xab) {
                  if (uVar77 == 0xb1) {
                    gen_ctx->combine_ctx->last_mem_ref_insn_num = (size_t)local_400;
                    goto LAB_00127d92;
                  }
                  pMVar99 = pbVar119->insn;
                  uVar155 = *(ulong *)&pMVar99->field_0x18;
                  uVar87 = (int)uVar155 - 4;
                  if ((uVar87 < 6) && (*(char *)&pMVar99[1].insn_link.prev == '\x02')) {
                    uVar86 = *(uint *)(&DAT_0017e838 + (ulong)uVar87 * 4);
                    iVar78 = safe_var_substitution_p
                                       (gen_ctx,*(MIR_reg_t *)&pMVar99[1].insn_link.next,pbVar119);
                    if (iVar78 != 0) {
                      uVar13 = *(uint *)&pMVar99[1].insn_link.next;
                      pvVar28 = gen_ctx->combine_ctx->var_refs_addr;
                      pMVar29 = pvVar28[uVar13].insn;
                      iVar78 = *(int *)&pMVar29->field_0x18;
                      uVar131 = iVar78 - 4;
                      if (uVar131 < 6) {
                        local_2f0 = (bb_t_conflict)
                                    CONCAT44(local_2f0._4_4_,
                                             *(undefined4 *)(&DAT_0017e838 + (ulong)uVar131 * 4));
                        uVar6 = pMVar29[1].data;
                        uVar8 = pMVar29[1].insn_link.prev;
                        uVar9 = pMVar29[1].insn_link.next;
                        op.u.i = uVar9;
                        op._8_8_ = uVar8;
                        uVar10 = *(undefined8 *)&pMVar29[1].field_0x18;
                        op.u.str.s = (char *)uVar10;
                        op.data = (void *)uVar6;
                        auVar7 = *(undefined1 (*) [32])&pMVar29[1].insn_link.next;
                        op.u._16_8_ = auVar7._16_8_;
                        op.u.mem.disp = auVar7._24_8_;
                        iVar84 = obsolete_op_p(gen_ctx,op,pvVar28[uVar13].insn_num);
                        if (iVar84 == 0) {
                          pMVar42 = pMVar99 + 1;
                          pMVar3 = pMVar29 + 1;
                          if ((uint)local_2f0 < uVar86) {
                            if ((uVar87 < 3) || (iVar78 - 7U < 0xfffffffd)) {
                              pvVar14 = pMVar42->data;
                              type_regs._8_8_ = pMVar99[1].insn_link.prev;
                              type_regs._16_8_ = pMVar99[1].insn_link.next;
                              type_regs[6] = *(MIR_reg_t *)&pMVar99[1].field_0x18;
                              type_regs[7] = *(MIR_reg_t *)&pMVar99[1].field_0x1c;
                              type_regs._32_8_ = pMVar99[1].ops[0].data;
                              type_regs[10] = *(MIR_reg_t *)&pMVar99[1].ops[0].field_0x8;
                              type_regs[0xb] = *(MIR_reg_t *)&pMVar99[1].ops[0].field_0xc;
                              type_regs[0]._0_1_ = (char)pvVar14;
                              type_regs[0]._1_1_ = (char)((ulong)pvVar14 >> 8);
                              type_regs._2_6_ = (undefined6)((ulong)pvVar14 >> 0x10);
                              pvVar14 = pMVar3->data;
                              pMVar36 = pMVar29[1].insn_link.prev;
                              pMVar37 = pMVar29[1].insn_link.next;
                              uVar158 = *(undefined8 *)&pMVar29[1].field_0x18;
                              uVar34 = *(undefined8 *)&pMVar29[1].field_0x18;
                              pvVar38 = pMVar29[1].ops[0].data;
                              uVar35 = *(undefined8 *)&pMVar29[1].ops[0].field_0x8;
                              pMVar99[1].insn_link.next = pMVar29[1].insn_link.next;
                              *(undefined8 *)&pMVar99[1].field_0x18 = uVar34;
                              pMVar99[1].ops[0].data = pvVar38;
                              *(undefined8 *)&pMVar99[1].ops[0].field_0x8 = uVar35;
                              pMVar42->data = pvVar14;
                              pMVar99[1].insn_link.prev = pMVar36;
                              pMVar99[1].insn_link.next = pMVar37;
                              *(undefined8 *)&pMVar99[1].field_0x18 = uVar158;
                              *(ulong *)&pMVar99->field_0x18 =
                                   *(ulong *)&pMVar99->field_0x18 & 0xffffffff00000000 |
                                   (ulong)*(uint *)&pMVar29->field_0x18;
                              iVar78 = target_insn_ok_p(gen_ctx,pMVar99);
                              uVar51 = type_regs[0]._1_1_;
                              uVar48 = (char)type_regs[0];
                              uVar49 = CONCAT11(uVar51,uVar48);
                              uVar52 = type_regs._2_6_;
                              uVar50 = CONCAT62(uVar52,uVar49);
                              uVar53 = type_regs[2];
                              uVar54 = type_regs[3];
                              auVar165._12_4_ = uVar54;
                              auVar165._8_4_ = uVar53;
                              auVar165._0_8_ = uVar50;
                              uVar55 = type_regs[4];
                              uVar56 = type_regs[5];
                              auVar165._20_4_ = uVar56;
                              auVar165._16_4_ = uVar55;
                              uVar166._0_4_ = type_regs[6];
                              uVar166._4_4_ = type_regs[7];
                              auVar66._8_4_ = type_regs[6];
                              auVar66._12_4_ = type_regs[7];
                              auVar66._0_4_ = type_regs[4];
                              auVar66._4_4_ = type_regs[5];
                              auVar66._16_4_ = type_regs[8];
                              auVar66._20_4_ = type_regs[9];
                              auVar66._24_4_ = type_regs[10];
                              auVar66._28_4_ = type_regs[0xb];
                              pMVar42->data = (void *)uVar50;
                              (pMVar42->insn_link).prev = (MIR_insn_t)SUB168(auVar165._8_16_,0);
                              (pMVar42->insn_link).next = (MIR_insn_t)SUB168(auVar165._8_16_,8);
                              *(undefined8 *)&pMVar42->field_0x18 = uVar166;
                              *(undefined1 (*) [32])&pMVar99[1].insn_link.next = auVar66;
                              uVar139 = *(ulong *)&pMVar99->field_0x18 & 0xffffffff00000000;
                              *(ulong *)&pMVar99->field_0x18 = uVar155 & 0xffffffff | uVar139;
                              if (iVar78 != 0) {
                                if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) &&
                                   (1 < gen_ctx->debug_level)) {
                                  fwrite("      changing ",0xf,1,(FILE *)gen_ctx->debug_file);
                                  print_bb_insn(gen_ctx,pbVar119,0);
                                  uVar139 = *(ulong *)&pMVar99->field_0x18 & 0xffffffff00000000;
                                }
                                pvVar14 = pMVar3->data;
                                DVar71 = pMVar3->insn_link;
                                uVar158 = *(undefined8 *)&pMVar3->field_0x18;
                                *(undefined1 (*) [32])&pMVar99[1].insn_link.next =
                                     *(undefined1 (*) [32])&pMVar29[1].insn_link.next;
                                pMVar42->data = pvVar14;
                                pMVar42->insn_link = DVar71;
                                *(undefined8 *)&pMVar42->field_0x18 = uVar158;
                                *(ulong *)&pMVar99->field_0x18 =
                                     *(uint *)&pMVar29->field_0x18 | uVar139;
                                if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) &&
                                   (1 < gen_ctx->debug_level)) {
                                  fwrite(" to ",4,1,(FILE *)gen_ctx->debug_file);
                                  goto LAB_00128268;
                                }
                                goto LAB_00128278;
                              }
                            }
                          }
                          else {
                            pvVar14 = pMVar42->data;
                            type_regs._8_8_ = pMVar99[1].insn_link.prev;
                            type_regs._16_8_ = pMVar99[1].insn_link.next;
                            type_regs[6] = *(MIR_reg_t *)&pMVar99[1].field_0x18;
                            type_regs[7] = *(MIR_reg_t *)&pMVar99[1].field_0x1c;
                            type_regs._32_8_ = pMVar99[1].ops[0].data;
                            type_regs[10] = *(MIR_reg_t *)&pMVar99[1].ops[0].field_0x8;
                            type_regs[0xb] = *(MIR_reg_t *)&pMVar99[1].ops[0].field_0xc;
                            type_regs[0]._0_1_ = (char)pvVar14;
                            type_regs[0]._1_1_ = (char)((ulong)pvVar14 >> 8);
                            type_regs._2_6_ = (undefined6)((ulong)pvVar14 >> 0x10);
                            pvVar14 = pMVar3->data;
                            DVar71 = pMVar3->insn_link;
                            uVar158 = *(undefined8 *)&pMVar3->field_0x18;
                            *(undefined1 (*) [32])&pMVar99[1].insn_link.next =
                                 *(undefined1 (*) [32])&pMVar29[1].insn_link.next;
                            pMVar42->data = pvVar14;
                            pMVar42->insn_link = DVar71;
                            *(undefined8 *)&pMVar42->field_0x18 = uVar158;
                            iVar78 = target_insn_ok_p(gen_ctx,pMVar99);
                            if (iVar78 != 0) {
                              if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) &&
                                 (1 < gen_ctx->debug_level)) {
                                fwrite("      changing to ",0x12,1,(FILE *)gen_ctx->debug_file);
LAB_00128268:
                                print_bb_insn(gen_ctx,pbVar119,1);
                              }
LAB_00128278:
                              iVar78 = combine_delete_insn(gen_ctx,pMVar29,pbVar119);
                              if (iVar78 != 0) {
                                _out_p_1 = _out_p_1 + 1;
                              }
                              var_1 = (MIR_reg_t)pMVar99->data;
                              uStack_324 = (undefined4)((ulong)pMVar99->data >> 0x20);
                              sVar90 = MIR_insn_nops(pMVar15,pMVar99);
                              bVar157 = true;
                              pMVar137 = pMVar99;
                              goto LAB_00127d92;
                            }
                            uVar60 = type_regs[0]._1_1_;
                            uVar57 = (char)type_regs[0];
                            uVar58 = CONCAT11(uVar60,uVar57);
                            uVar61 = type_regs._2_6_;
                            uVar59 = CONCAT62(uVar61,uVar58);
                            uVar62 = type_regs[2];
                            uVar63 = type_regs[3];
                            auVar167._12_4_ = uVar63;
                            auVar167._8_4_ = uVar62;
                            auVar167._0_8_ = uVar59;
                            uVar64 = type_regs[4];
                            uVar65 = type_regs[5];
                            auVar167._20_4_ = uVar65;
                            auVar167._16_4_ = uVar64;
                            uVar168._0_4_ = type_regs[6];
                            uVar168._4_4_ = type_regs[7];
                            auVar67._8_4_ = type_regs[6];
                            auVar67._12_4_ = type_regs[7];
                            auVar67._0_4_ = type_regs[4];
                            auVar67._4_4_ = type_regs[5];
                            auVar67._16_4_ = type_regs[8];
                            auVar67._20_4_ = type_regs[9];
                            auVar67._24_4_ = type_regs[10];
                            auVar67._28_4_ = type_regs[0xb];
                            *(undefined1 (*) [32])&pMVar99[1].insn_link.next = auVar67;
                            pMVar42->data = (void *)uVar59;
                            (pMVar42->insn_link).prev = (MIR_insn_t)SUB168(auVar167._8_16_,0);
                            (pMVar42->insn_link).next = (MIR_insn_t)SUB168(auVar167._8_16_,8);
                            *(undefined8 *)&pMVar42->field_0x18 = uVar168;
                          }
                        }
                      }
                    }
                  }
                  iVar78 = combine_substitute(gen_ctx,(bb_insn_t_conflict *)&var_1,(long *)&out_p_1)
                  ;
                  if (iVar78 == 0) {
                    uVar155 = *(ulong *)&pMVar137->field_0x18;
                    sStackY_4a0 = uVar155;
                    switch((int)uVar155) {
                    case 0x22:
                    case 0x23:
                    case 0x24:
                    case 0x25:
                    case 0x26:
                    case 0x2c:
                    case 0x2d:
                    case 0x2e:
                    case 0x2f:
                    case 0x30:
                    case 0x3c:
                    case 0x3d:
                    case 0x3e:
                    case 0x3f:
                    case 0x40:
                    case 0x41:
                    case 0x48:
                    case 0x49:
                    case 0x4a:
                    case 0x4b:
                    case 0x4c:
                    case 0x4d:
                    case 0x4e:
                    case 0x4f:
                    case 0x50:
                    case 0x51:
                    case 0x72:
                    case 0x73:
                    case 0x74:
                    case 0x75:
                    case 0x7b:
                    case 0x7c:
                    case 0x7d:
                    case 0x7e:
                    case 0x7f:
                    case 0x80:
                    case 0x81:
                    case 0x82:
                    case 0x83:
                    case 0x84:
                      break;
                    default:
                      goto switchD_0012803d_caseD_27;
                    case 0x52:
                      sStackY_4a0 = 0x60;
                      break;
                    case 0x53:
                      sStackY_4a0 = 0x61;
                      break;
                    case 0x54:
                      sStackY_4a0 = 0x62;
                      break;
                    case 0x55:
                      sStackY_4a0 = 99;
                      break;
                    case 0x59:
                      sStackY_4a0 = 0x67;
                      break;
                    case 0x5a:
                      sStackY_4a0 = 0x68;
                      break;
                    case 0x5b:
                      sStackY_4a0 = 0x69;
                      break;
                    case 0x5c:
                      sStackY_4a0 = 0x6a;
                      break;
                    case 0x60:
                      sStackY_4a0 = 0x52;
                      break;
                    case 0x61:
                      sStackY_4a0 = 0x53;
                      break;
                    case 0x62:
                      sStackY_4a0 = 0x54;
                      break;
                    case 99:
                      sStackY_4a0 = 0x55;
                      break;
                    case 0x67:
                      sStackY_4a0 = 0x59;
                      break;
                    case 0x68:
                      sStackY_4a0 = 0x5a;
                      break;
                    case 0x69:
                      sStackY_4a0 = 0x5b;
                      break;
                    case 0x6a:
                      sStackY_4a0 = 0x5c;
                      break;
                    case 0x85:
                      sStackY_4a0 = 0x93;
                      break;
                    case 0x86:
                      sStackY_4a0 = 0x94;
                      break;
                    case 0x87:
                      sStackY_4a0 = 0x95;
                      break;
                    case 0x88:
                      sStackY_4a0 = 0x96;
                      break;
                    case 0x8c:
                      sStackY_4a0 = 0x9a;
                      break;
                    case 0x8d:
                      sStackY_4a0 = 0x9b;
                      break;
                    case 0x8e:
                      sStackY_4a0 = 0x9c;
                      break;
                    case 0x8f:
                      sStackY_4a0 = 0x9d;
                      break;
                    case 0x93:
                      sStackY_4a0 = 0x85;
                      break;
                    case 0x94:
                      sStackY_4a0 = 0x86;
                      break;
                    case 0x95:
                      sStackY_4a0 = 0x87;
                      break;
                    case 0x96:
                      sStackY_4a0 = 0x88;
                      break;
                    case 0x9a:
                      sStackY_4a0 = 0x8c;
                      break;
                    case 0x9b:
                      sStackY_4a0 = 0x8d;
                      break;
                    case 0x9c:
                      sStackY_4a0 = 0x8e;
                      break;
                    case 0x9d:
                      sStackY_4a0 = 0x8f;
                    }
                    *(ulong *)&pMVar137->field_0x18 =
                         uVar155 & 0xffffffff00000000 | sStackY_4a0 & 0xffffffff;
                    iVar126 = ((anon_union_32_12_57d33f68_for_u *)(pMVar137 + 1))->i;
                    pMStack_360 = pMVar137[1].insn_link.prev;
                    ppMVar39 = &pMVar137[1].insn_link.next;
                    aStack_358.i = (int64_t)*ppMVar39;
                    aStack_358.str.s = (char *)*(undefined8 *)&pMVar137[1].field_0x18;
                    aVar46 = *(anon_union_32_12_57d33f68_for_u *)(pMVar137 + 1);
                    aStack_358._16_8_ = pMVar137[1].ops[0].data;
                    aStack_358.mem.disp = *(undefined8 *)&pMVar137[1].ops[0].field_0x8;
                    auVar7 = *(undefined1 (*) [32])ppMVar39;
                    op_num_1 = (int)iVar126;
                    uStack_364 = (undefined4)((ulong)iVar126 >> 0x20);
                    pvVar14 = (void *)pMVar137[1].ops[0].u.i;
                    pMVar99 = (MIR_insn_t)pMVar137[1].ops[0].u.str.s;
                    pMVar29 = *(MIR_insn_t *)((long)&pMVar137[1].ops[0].u + 0x10);
                    MVar40 = pMVar137[1].ops[0].u.mem.disp;
                    MVar41 = pMVar137[1].ops[0].u.mem.disp;
                    pvVar38 = pMVar137[2].data;
                    pMVar42 = pMVar137[2].insn_link.prev;
                    pMVar137[1].insn_link.next = *(MIR_insn_t *)((long)&pMVar137[1].ops[0].u + 0x10)
                    ;
                    *(MIR_disp_t *)&pMVar137[1].field_0x18 = MVar41;
                    pMVar137[1].ops[0].data = pvVar38;
                    *(MIR_insn_t *)&pMVar137[1].ops[0].field_0x8 = pMVar42;
                    pMVar137[1].data = pvVar14;
                    pMVar137[1].insn_link.prev = pMVar99;
                    pMVar137[1].insn_link.next = pMVar29;
                    *(MIR_disp_t *)&pMVar137[1].field_0x18 = MVar40;
                    pMVar137[1].ops[0].u = aVar46;
                    *(undefined1 (*) [32])((long)&pMVar137[1].ops[0].u + 0x10) = auVar7;
                    iVar78 = combine_substitute(gen_ctx,(bb_insn_t_conflict *)&var_1,
                                                (long *)&out_p_1);
                    if (iVar78 != 0) goto LAB_00128430;
                    paVar150 = (anon_union_32_12_57d33f68_for_u *)(pMVar137 + 1);
                    paVar146 = &pMVar137[1].ops[0].u;
                    *(ulong *)&pMVar137->field_0x18 =
                         *(ulong *)&pMVar137->field_0x18 & 0xffffffff00000000 | uVar149 & 0xffffffff
                    ;
                    pMStack_360 = pMVar137[1].insn_link.prev;
                    ppMVar39 = &pMVar137[1].insn_link.next;
                    aStack_358.i = (int64_t)*ppMVar39;
                    aStack_358.str.s = (char *)*(undefined8 *)&pMVar137[1].field_0x18;
                    aVar46 = *paVar150;
                    aStack_358._16_8_ = pMVar137[1].ops[0].data;
                    aStack_358.mem.disp = *(undefined8 *)&pMVar137[1].ops[0].field_0x8;
                    auVar7 = *(undefined1 (*) [32])ppMVar39;
                    op_num_1 = (int)paVar150->i;
                    uStack_364 = (undefined4)((ulong)paVar150->i >> 0x20);
                    iVar126 = paVar146->i;
                    pMVar99 = (MIR_insn_t)pMVar137[1].ops[0].u.str.s;
                    pMVar29 = *(MIR_insn_t *)((long)&pMVar137[1].ops[0].u + 0x10);
                    MVar40 = pMVar137[1].ops[0].u.mem.disp;
                    MVar41 = pMVar137[1].ops[0].u.mem.disp;
                    pvVar14 = pMVar137[2].data;
                    pMVar42 = pMVar137[2].insn_link.prev;
                    pMVar137[1].insn_link.next = *(MIR_insn_t *)((long)&pMVar137[1].ops[0].u + 0x10)
                    ;
                    *(MIR_disp_t *)&pMVar137[1].field_0x18 = MVar41;
                    pMVar137[1].ops[0].data = pvVar14;
                    *(MIR_insn_t *)&pMVar137[1].ops[0].field_0x8 = pMVar42;
                    paVar150->i = iVar126;
                    pMVar137[1].insn_link.prev = pMVar99;
                    pMVar137[1].insn_link.next = pMVar29;
                    *(MIR_disp_t *)&pMVar137[1].field_0x18 = MVar40;
                    *(undefined1 (*) [32])((long)&pMVar137[1].ops[0].u + 0x10) = auVar7;
                    *paVar146 = aVar46;
                  }
                  else {
LAB_00128430:
                    pMVar137 = *(MIR_insn_t *)CONCAT44(uStack_324,var_1);
                    sVar90 = MIR_insn_nops(pMVar15,pMVar137);
                    bVar157 = true;
switchD_0012803d_caseD_27:
                  }
                  if ((uVar77 & 0xfffffffe) == 0xae) {
                    pcVar120 = gen_ctx->combine_ctx;
                    goto LAB_00127d83;
                  }
                }
              }
              else {
                for (sVar141 = 0; sVar141 != 0x22; sVar141 = sVar141 + 1) {
                  iVar78 = bitmap_bit_p(gen_ctx->call_used_hard_regs[0x12],sVar141);
                  if (iVar78 != 0) {
                    setup_var_ref(gen_ctx,(MIR_reg_t)sVar141,pMVar137,0,(size_t)local_400,1);
                  }
                }
                pcVar120 = gen_ctx->combine_ctx;
LAB_00127d83:
                pcVar120->last_mem_ref_insn_num = (size_t)local_400;
              }
LAB_00127d92:
              for (lVar135 = 0; lVar135 != 2; lVar135 = lVar135 + 1) {
                pMVar153 = &pMVar137->ops[0].u.mem.index;
                for (sVar141 = 0; sVar90 != sVar141; sVar141 = sVar141 + 1) {
                  MIR_insn_op_mode(pMVar15,pMVar137,sVar141,&out_p);
                  if (*(char *)(pMVar153 + -7) == '\v') {
                    if ((lVar135 == 1) && (out_p != 0)) {
                      gen_ctx->combine_ctx->last_mem_ref_insn_num = (size_t)local_400;
                    }
                    else if (lVar135 == 0) {
                      setup_var_ref(gen_ctx,pMVar153[-1],pMVar137,sVar141,(size_t)local_400,0);
                      MVar76 = *pMVar153;
                      uVar77 = 0;
                      goto LAB_00127ebb;
                    }
                  }
                  else if ((*(char *)(pMVar153 + -7) == '\x02') &&
                          (((uint)(out_p == 0) ^ (uint)lVar135) == 1)) {
                    MVar76 = *(MIR_reg_t *)(pMVar153 + -5);
                    uVar77 = (uint)(lVar135 == 1);
LAB_00127ebb:
                    setup_var_ref(gen_ctx,MVar76,pMVar137,sVar141,(size_t)local_400,uVar77);
                  }
                  pMVar153 = pMVar153 + 0xc;
                }
              }
              goto LAB_00127ee4;
            }
            bVar156 = false;
            if (local_36c != 0) {
              remove_property_insn(gen_ctx,pMVar137);
              bVar156 = false;
            }
          }
LAB_00127ee6:
          local_400 = (MIR_context_t)((long)local_400 + 1);
          var_1 = (MIR_reg_t)pbVar147;
          uStack_324 = (undefined4)((ulong)pbVar147 >> 0x20);
          pbVar119 = pbVar147;
        }
      } while (bVar157);
      pDVar106 = (DLIST_bb_t *)&(pbVar96->bb_link).next;
    }
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (0 < gen_ctx->debug_level)) {
      fprintf((FILE *)gen_ctx->debug_file,"%5ld deleted combine insns out of %ld (%.1f%%)\n");
      if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
        fwrite("+++++++++++++MIR after combine:\n",0x20,1,(FILE *)gen_ctx->debug_file);
        print_CFG(gen_ctx,0,0,1,0,(_func_void_gen_ctx_t_bb_t *)0x0);
      }
    }
    pcVar88 = (char *)gen_ctx->curr_func_item->module;
    pVVar102 = (bitmap_t)
               _MIR_get_module_global_var_hard_regs(gen_ctx->ctx,(MIR_module_t_conflict)pcVar88);
    if (gen_ctx->optimize_level == 0) {
      __assert_fail("gen_ctx->optimize_level > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x23b8,"void dead_code_elimination(gen_ctx_t)");
    }
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      pcVar88 = (char *)0x24;
      fwrite("+++++++++++++Dead code elimination:\n",0x24,1,(FILE *)gen_ctx->debug_file);
    }
    plVar121 = (loop_node_t_conflict)bitmap_create2(0x100);
    _last_reg1 = (bb_t_conflict)0x0;
    pDVar106 = &gen_ctx->curr_cfg->bbs;
    while (pbVar96 = pDVar106->head, pbVar96 != (bb_t_conflict)0x0) {
      pcVar88 = (char *)pbVar96->out;
      bitmap_copy((bitmap_t)plVar121,(const_bitmap_t)pcVar88);
      pbVar119 = (pbVar96->bb_insns).tail;
LAB_00128646:
      pbVar147 = pbVar119;
      if (pbVar147 != (bb_insn_t)0x0) {
        plVar142 = (loop_node_t_conflict)pbVar147->insn;
        pbVar119 = (pbVar147->bb_insn_link).prev;
        type_regs[0]._0_1_ = (char)plVar142;
        cVar74 = (char)type_regs[0];
        type_regs[0]._1_1_ = (char)((ulong)plVar142 >> 8);
        cVar72 = type_regs[0]._1_1_;
        type_regs._2_6_ = (undefined6)((ulong)plVar142 >> 0x10);
        uVar73 = type_regs._2_6_;
        type_regs._8_8_ = ZEXT48(*(uint *)((long)&plVar142->parent + 4));
        type_regs[4] = 0;
        type_regs[5] = 0;
        type_regs[6] = 0;
        type_regs[7] = 0;
        bVar156 = true;
LAB_0012869e:
        bVar69 = bVar156;
        bVar157 = false;
        while (iVar78 = output_insn_var_iterator_next
                                  (gen_ctx,(insn_var_iterator_t *)type_regs,(MIR_reg_t *)&op_num_1,
                                   (int *)&c), iVar78 != 0) {
          uVar149 = (ulong)(uint)op_num_1;
          iVar78 = bitmap_clear_bit_p((bitmap_t)plVar121,uVar149);
          bVar156 = false;
          if ((iVar78 != 0) ||
             (iVar78 = bitmap_bit_p(gen_ctx->addr_regs,uVar149), bVar157 = bVar69, iVar78 != 0))
          goto LAB_0012869e;
        }
        iVar78 = *(int *)&plVar142->parent;
        if (bVar157) {
          if (iVar78 - 0xaaU < 0xfffffffd) {
            if ((((8 < iVar78 - 0xabU) || (iVar78 - 0xabU == 6)) &&
                ((iVar78 - 0x76U < 0xfffffff8 ||
                 (iVar78 = reachable_bo_exists_p((pbVar147->bb_insn_link).next), iVar78 == 0)))) &&
               ((*(char *)&(plVar142->children).head != '\x02' ||
                ((((anon_union_32_12_57d33f68_for_u *)&(plVar142->children).tail)->reg & 0xfffffffe)
                 != 4)))) {
              if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                fprintf((FILE *)gen_ctx->debug_file,"  Removing dead insn %-5lu",
                        (ulong)pbVar147->index);
                MIR_output_insn(gen_ctx->ctx,gen_ctx->debug_file,(MIR_insn_t_conflict)plVar142,
                                (gen_ctx->curr_func_item->u).func,1);
              }
              pbVar30 = (pbVar96->bb_insns).head;
              if (pbVar30 == (pbVar96->bb_insns).tail) {
                if (pbVar147 != pbVar30) {
                  __assert_fail("bb_insn == (DLIST_bb_insn_t_head (&(bb->bb_insns)))",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                ,0x23d3,"void dead_code_elimination(gen_ctx_t)");
                }
                pMVar93 = MIR_new_insn_arr(gen_ctx->ctx,MIR_USE,0,(MIR_op_t *)0x0);
                if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                  fprintf((FILE *)gen_ctx->debug_file,"  Adding nop to keep bb%lu non-empty: ",
                          pbVar96->index);
                  MIR_output_insn(gen_ctx->ctx,gen_ctx->debug_file,pMVar93,
                                  (gen_ctx->curr_func_item->u).func,1);
                }
                gen_add_insn_after(gen_ctx,(MIR_insn_t)plVar142,pMVar93);
              }
              gen_delete_insn(gen_ctx,(MIR_insn_t)plVar142);
              _last_reg1 = (bb_t_conflict)((long)_last_reg1 + 1);
              pcVar88 = (char *)plVar142;
              goto LAB_00128646;
            }
          }
          else {
LAB_00128870:
            bitmap_and_compl((bitmap_t)plVar121,(bitmap_t)plVar121,
                             gen_ctx->call_used_hard_regs[0x12]);
            if (pVVar102 != (bitmap_t)0x0) {
              bitmap_ior((bitmap_t)plVar121,(bitmap_t)plVar121,pVVar102);
            }
          }
        }
        else if (0xfffffffc < iVar78 - 0xaaU) goto LAB_00128870;
        type_regs._8_8_ = ZEXT48(*(uint *)((long)&plVar142->parent + 4));
        type_regs[4] = 0;
        type_regs[5] = 0;
        type_regs[6] = 0;
        type_regs[7] = 0;
        type_regs[0]._0_1_ = cVar74;
        type_regs[0]._1_1_ = cVar72;
        type_regs._2_6_ = uVar73;
        while (iVar78 = input_insn_var_iterator_next
                                  (gen_ctx,(insn_var_iterator_t *)type_regs,(MIR_reg_t *)&op_num_1,
                                   (int *)&c), iVar78 != 0) {
          bitmap_set_bit_p((bitmap_t)plVar121,(ulong)(uint)op_num_1);
        }
        target_get_early_clobbered_hard_regs((MIR_insn_t)plVar142,&var_1,(MIR_reg_t *)&out_p_1);
        if ((ulong)var_1 != 0xffffffff) {
          bitmap_clear_bit_p((bitmap_t)plVar121,(ulong)var_1);
        }
        pcVar88 = (char *)(ulong)(uint)out_p_1;
        if ((loop_node_t_conflict)pcVar88 != (loop_node_t_conflict)0xffffffff) {
          bitmap_clear_bit_p((bitmap_t)plVar121,(size_t)pcVar88);
        }
        if (0xfffffffc < *(int *)&plVar142->parent - 0xaaU) {
          pcVar88 = (char *)plVar121;
          bitmap_ior((bitmap_t)plVar121,(bitmap_t)plVar121,pbVar147->call_hard_reg_args);
        }
        goto LAB_00128646;
      }
      pDVar106 = (DLIST_bb_t *)&(pbVar96->bb_link).next;
    }
    bitmap_destroy((bitmap_t)plVar121);
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (0 < gen_ctx->debug_level)) {
      pcVar88 = "%5ld removed dead insns\n";
      fprintf((FILE *)gen_ctx->debug_file,"%5ld removed dead insns\n",_last_reg1);
      if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
        fwrite("+++++++++++++MIR after dead code elimination after 2nd combine:\n",0x40,1,
               (FILE *)gen_ctx->debug_file);
        pcVar88 = (char *)0x1;
        print_CFG(gen_ctx,1,1,1,0,output_bb_live_info);
      }
    }
  }
  if (gen_ctx->curr_func_item->item_type != MIR_func_item) {
    __assert_fail("curr_func_item->item_type == MIR_func_item",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                  ,0x492,"void target_make_prolog_epilog(gen_ctx_t, bitmap_t, size_t)");
  }
  bm = gen_ctx->func_used_hard_regs;
  sVar90 = gen_ctx->func_stack_slots_num;
  pMVar15 = gen_ctx->ctx;
  pMVar16 = (gen_ctx->curr_func_item->u).func;
  lVar135 = 0;
  for (plVar121 = (loop_node_t_conflict)0x0; plVar121 != (loop_node_t_conflict)0x10;
      plVar121 = (loop_node_t_conflict)((long)&plVar121->index + 1)) {
    iVar78 = target_call_used_hard_reg_p((MIR_reg_t)plVar121,(MIR_type_t)pcVar88);
    if (iVar78 == 0) {
      pcVar88 = (char *)plVar121;
      iVar78 = bitmap_bit_p(bm,(size_t)plVar121);
      if (iVar78 != 0) {
        lVar135 = lVar135 + 8;
      }
    }
  }
  ptVar31 = gen_ctx->target_ctx;
  if (((((ptVar31->leaf_p == '\0') || (ptVar31->alloca_p != '\0')) ||
       (ptVar31->block_arg_func_p != '\0')) || ((lVar135 != 0 || (sVar90 != 0)))) ||
     (pMVar16->vararg_p != '\0')) {
    plVar121 = (loop_node_t_conflict)(pMVar16->insns).head;
    _MIR_new_var_op(pMVar15,4);
    if (gen_ctx->target_ctx->keep_fp_p == '\0') {
      bVar156 = true;
    }
    else {
      _MIR_new_var_op(pMVar15,5);
      _MIR_new_var_mem_op((MIR_op_t *)&var_1,pMVar15,MIR_T_I64,-8,4,0xffffffff,'\x01');
      pMVar93 = MIR_new_insn(pMVar15,MIR_MOV);
      gen_add_insn_before(gen_ctx,(MIR_insn_t)plVar121,pMVar93);
      MIR_new_int_op(pMVar15,-8);
      pMVar93 = MIR_new_insn(pMVar15,MIR_ADD);
      gen_add_insn_before(gen_ctx,(MIR_insn_t)plVar121,pMVar93);
      bVar156 = gen_ctx->target_ctx->keep_fp_p == '\0';
    }
    lVar151 = 0xb0;
    if (pMVar16->vararg_p == '\0') {
      lVar151 = 0;
    }
    lVar132 = lVar151 + 8;
    if (pMVar16->jret_p != '\0') {
      lVar132 = lVar151;
    }
    uVar149 = sVar90 * 8 + 0xf & 0xfffffffffffffff0;
    if (!bVar156) {
      uVar149 = sVar90 << 3;
    }
    uVar155 = lVar135 + 0xf + uVar149;
    uVar139 = uVar155 & 0xfffffffffffffff0;
    lVar132 = lVar132 + uVar139;
    MIR_new_int_op(pMVar15,lVar132);
    pMVar93 = MIR_new_insn(pMVar15,MIR_SUB);
    pcVar88 = (char *)plVar121;
    gen_add_insn_before(gen_ctx,(MIR_insn_t)plVar121,pMVar93);
    if (pMVar16->vararg_p != '\0') {
      uVar77 = (uint)uVar155;
      isave(gen_ctx,(MIR_insn_t)plVar121,uVar77 & 0xfffffff0,7);
      isave(gen_ctx,(MIR_insn_t)plVar121,uVar77 & 0xfffffff0 | 8,6);
      iVar78 = (int)uVar139;
      isave(gen_ctx,(MIR_insn_t)plVar121,iVar78 + 0x10,2);
      isave(gen_ctx,(MIR_insn_t)plVar121,iVar78 + 0x18,1);
      isave(gen_ctx,(MIR_insn_t)plVar121,iVar78 + 0x20,8);
      isave(gen_ctx,(MIR_insn_t)plVar121,iVar78 + 0x28,9);
      dsave(gen_ctx,(MIR_insn_t)plVar121,iVar78 + 0x30,0x10);
      dsave(gen_ctx,(MIR_insn_t)plVar121,iVar78 + 0x40,0x11);
      dsave(gen_ctx,(MIR_insn_t)plVar121,iVar78 + 0x50,0x12);
      dsave(gen_ctx,(MIR_insn_t)plVar121,iVar78 + 0x60,0x13);
      dsave(gen_ctx,(MIR_insn_t)plVar121,iVar78 + 0x70,0x14);
      dsave(gen_ctx,(MIR_insn_t)plVar121,iVar78 + 0x80,0x15);
      dsave(gen_ctx,(MIR_insn_t)plVar121,iVar78 + 0x90,0x16);
      pcVar88 = (char *)plVar121;
      dsave(gen_ctx,(MIR_insn_t)plVar121,iVar78 + 0xa0,0x17);
      uVar139 = uVar139 + 0xb0;
    }
    bVar156 = gen_ctx->target_ctx->keep_fp_p == '\0';
    uVar155 = -uVar139;
    if (bVar156) {
      uVar155 = uVar149;
    }
    uVar77 = bVar156 ^ 5;
    for (plVar142 = (loop_node_t_conflict)0x0; plVar142 != (loop_node_t_conflict)0x10;
        plVar142 = (loop_node_t_conflict)((long)&plVar142->index + 1)) {
      iVar78 = target_call_used_hard_reg_p((MIR_reg_t)plVar142,(MIR_type_t)pcVar88);
      if ((iVar78 == 0) &&
         (pcVar88 = (char *)plVar142, iVar78 = bitmap_bit_p(bm,(size_t)plVar142), iVar78 != 0)) {
        _MIR_new_var_mem_op(&temp_op,pMVar15,MIR_T_I64,uVar155,uVar77,0xffffffff,'\x01');
        _MIR_new_var_op(pMVar15,(MIR_reg_t)plVar142);
        pMVar93 = MIR_new_insn(pMVar15,MIR_MOV);
        pcVar88 = (char *)plVar121;
        gen_add_insn_before(gen_ctx,(MIR_insn_t)plVar121,pMVar93);
        uVar155 = uVar155 + 8;
      }
    }
    plVar121 = (loop_node_t_conflict)&pMVar16->insns;
    do {
      plVar121 = (loop_node_t_conflict)((DLIST_LINK_MIR_insn_t *)&plVar121->bb)->prev;
      if (plVar121 == (loop_node_t_conflict)0x0) goto LAB_0012917c;
    } while (1 < *(int *)&plVar121->parent - 0xabU);
    uVar155 = -uVar139;
    if (gen_ctx->target_ctx->keep_fp_p == '\0') {
      uVar155 = uVar149;
    }
    for (plVar142 = (loop_node_t_conflict)0x0; plVar142 != (loop_node_t_conflict)0x10;
        plVar142 = (loop_node_t_conflict)((long)&plVar142->index + 1)) {
      iVar78 = target_call_used_hard_reg_p((MIR_reg_t)plVar142,(MIR_type_t)pcVar88);
      if ((iVar78 == 0) &&
         (pcVar88 = (char *)plVar142, iVar78 = bitmap_bit_p(bm,(size_t)plVar142), iVar78 != 0)) {
        _MIR_new_var_op(pMVar15,(MIR_reg_t)plVar142);
        _MIR_new_var_mem_op(local_f8,pMVar15,MIR_T_I64,uVar155,uVar77,0xffffffff,'\x01');
        pMVar93 = MIR_new_insn(pMVar15,MIR_MOV);
        pcVar88 = (char *)plVar121;
        gen_add_insn_before(gen_ctx,(MIR_insn_t)plVar121,pMVar93);
        uVar155 = uVar155 + 8;
      }
    }
    if (gen_ctx->target_ctx->keep_fp_p == '\0') {
      MIR_new_int_op(pMVar15,lVar132);
      MVar129 = MIR_ADD;
    }
    else {
      MIR_new_int_op(pMVar15,8);
      pMVar93 = MIR_new_insn(pMVar15,MIR_ADD);
      gen_add_insn_before(gen_ctx,(MIR_insn_t)plVar121,pMVar93);
      _MIR_new_var_mem_op((MIR_op_t *)&iter,pMVar15,MIR_T_I64,-8,4,0xffffffff,'\x01');
      MVar129 = MIR_MOV;
    }
    pMVar93 = MIR_new_insn(pMVar15,MVar129);
    gen_add_insn_before(gen_ctx,(MIR_insn_t)plVar121,pMVar93);
    pcVar88 = (char *)plVar121;
  }
LAB_0012917c:
  if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
    fwrite("+++++++++++++MIR after forming prolog/epilog and insn splitting:\n",0x41,1,
           (FILE *)gen_ctx->debug_file);
    pcVar88 = (char *)0x0;
    print_CFG(gen_ctx,0,0,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
  }
  if (local_36c == 0) {
    sVar90 = 0;
    puVar123 = (uint8_t *)0x0;
  }
  else {
    if (gen_ctx->curr_func_item->item_type != MIR_func_item) {
      __assert_fail("gen_ctx->curr_func_item->item_type == MIR_func_item",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                    ,0xb44,"uint8_t *target_translate(gen_ctx_t, size_t *)");
    }
    pMVar15 = gen_ctx->ctx;
    VARR_uint8_ttrunc(gen_ctx->target_ctx->result_code,(size_t)pcVar88);
    VARR_uint64_ttrunc(gen_ctx->target_ctx->const_pool,(size_t)pcVar88);
    VARR_const_ref_ttrunc(gen_ctx->target_ctx->const_refs,(size_t)pcVar88);
    VARR_label_ref_ttrunc(gen_ctx->target_ctx->label_refs,(size_t)pcVar88);
    VARR_uint64_ttrunc(gen_ctx->target_ctx->abs_address_locs,(size_t)pcVar88);
    VARR_inttrunc(gen_ctx->target_ctx->insn_pattern_indexes,(size_t)pcVar88);
    sVar90 = 0;
    pDVar127 = &((gen_ctx->curr_func_item->u).func)->insns;
    while (pMVar137 = pDVar127->head, pMVar137 != (MIR_insn_t)0x0) {
      if (*(int *)&pMVar137->field_0x18 != 0xb9) {
        if (*(int *)&pMVar137->field_0x18 == 0xb4) {
          iVar78 = gen_nested_loop_label_p(gen_ctx,pMVar137);
          if (iVar78 != 0) {
            sVar90 = sVar90 + 8;
          }
          set_label_disp(gen_ctx,pMVar137,sVar90);
        }
        else {
          iVar78 = find_insn_pattern(gen_ctx,pMVar137,&op_num_1);
          if (iVar78 < 0) {
            fwrite("Fatal failure in matching insn:",0x1f,1,_stderr);
            MIR_output_insn(pMVar15,(FILE *)_stderr,pMVar137,(gen_ctx->curr_func_item->u).func,1);
            exit(1);
          }
          uVar149 = (ulong)((int)(*(ulong *)&pMVar137->field_0x18 >> 0x1d) - 8U & 0xfffffff8);
          if ((int)*(ulong *)&pMVar137->field_0x18 != 0xaa) {
            uVar149 = 0;
          }
          sVar90 = sVar90 + (long)op_num_1 + uVar149;
          VARR_intpush(gen_ctx->target_ctx->insn_pattern_indexes,iVar78);
        }
      }
      pDVar127 = (DLIST_MIR_insn_t *)&(pMVar137->insn_link).next;
    }
    sVar90 = 0;
    pDVar127 = &((gen_ctx->curr_func_item->u).func)->insns;
    while (pMVar137 = pDVar127->head, pMVar137 != (MIR_insn_t)0x0) {
      if (*(int *)&pMVar137->field_0x18 != 0xb9) {
        if (*(int *)&pMVar137->field_0x18 == 0xb4) {
          iVar78 = gen_nested_loop_label_p(gen_ctx,pMVar137);
          if (iVar78 != 0) {
            sVar141 = VARR_uint8_tlength(gen_ctx->target_ctx->result_code);
            uVar87 = (uint)sVar141 & 7;
            uVar77 = 8 - uVar87;
            if ((sVar141 & 7) == 0) {
              uVar77 = uVar87;
            }
            uVar149 = (ulong)uVar77;
            if (7 < uVar77) {
              __assert_fail("(size_t) padn < sizeof (nop_pats) / sizeof (char *)",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                            ,0xb5f,"uint8_t *target_translate(gen_ctx_t, size_t *)");
            }
            if ((sVar141 & 7) != 0) {
              iVar78 = *(int *)(nop_pats_rel + uVar149 * 4);
              varr_01 = gen_ctx->target_ctx->result_code;
              VARR_uint8_texpand(varr_01,varr_01->els_num + uVar149);
              for (uVar155 = 0; uVar149 != uVar155; uVar155 = uVar155 + 1) {
                sVar141 = varr_01->els_num;
                varr_01->els_num = sVar141 + 1;
                varr_01->varr[sVar141] = nop_pats_rel[(long)iVar78 + uVar155];
              }
            }
          }
          sVar141 = VARR_uint8_tlength(gen_ctx->target_ctx->result_code);
          set_label_disp(gen_ctx,pMVar137,sVar141);
        }
        else {
          uVar77 = VARR_intget(gen_ctx->target_ctx->insn_pattern_indexes,sVar90);
          if (*(int *)&pMVar137->field_0x18 - 0x76U < 0x2f) {
            uVar77 = find_insn_pattern(gen_ctx,pMVar137,(int *)0x0);
          }
          if ((int)uVar77 < 0) {
            __assert_fail("ind >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                          ,0xb67,"uint8_t *target_translate(gen_ctx_t, size_t *)");
          }
          sVar90 = sVar90 + 1;
          sVar141 = VARR_uint8_tlength(gen_ctx->target_ctx->result_code);
          out_insn(gen_ctx,pMVar137,patterns[uVar77].replacement,(void **)0x0);
          sVar122 = VARR_uint8_tlength(gen_ctx->target_ctx->result_code);
          if (((ulong)(long)patterns[uVar77].max_insn_size < sVar122 - sVar141) &&
             (*(int *)&pMVar137->field_0x18 != 0xaa)) {
            fprintf(_stderr,"\"%s\" max size(%d) < real size(%d)\n",patterns[uVar77].replacement,
                    (long)patterns[uVar77].max_insn_size,sVar122 - sVar141 & 0xffffffff);
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                          ,0xb71,"uint8_t *target_translate(gen_ctx_t, size_t *)");
          }
        }
      }
      pDVar127 = (DLIST_MIR_insn_t *)&(pMVar137->insn_link).next;
    }
    for (uVar149 = 0; sVar90 = VARR_label_ref_tlength(gen_ctx->target_ctx->label_refs),
        uVar149 < sVar90; uVar149 = uVar149 + 1) {
      VARR_label_ref_tget((label_ref_t *)type_regs,gen_ctx->target_ctx->label_refs,uVar149);
      if ((char)type_regs[0] == '\0') {
        if (type_regs[0]._1_1_ == '\0') {
          puVar123 = VARR_uint8_taddr(gen_ctx->target_ctx->result_code);
          puVar123 = puVar123 + type_regs._8_8_;
          sVar90 = get_label_disp(gen_ctx,(MIR_insn_t)type_regs._24_8_);
          lVar135 = sVar90 - type_regs._16_8_;
          iVar78 = 4;
        }
        else {
          sVar90 = get_label_disp(gen_ctx,(MIR_insn_t)type_regs._24_8_);
          lVar135 = sVar90 - type_regs._16_8_;
          if ((char)lVar135 != lVar135) {
            __assert_fail("-128 <= disp && disp < 128",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                          ,0xb1a,"uint8_t *translate_finish(gen_ctx_t, size_t *)");
          }
          puVar123 = VARR_uint8_taddr(gen_ctx->target_ctx->result_code);
          puVar123 = puVar123 + type_regs._8_8_;
          iVar78 = 1;
        }
        set_int64(puVar123,lVar135,iVar78);
      }
      else {
        puVar123 = VARR_uint8_taddr(gen_ctx->target_ctx->result_code);
        uVar158 = type_regs._8_8_;
        puVar123 = puVar123 + type_regs._8_8_;
        sVar90 = get_label_disp(gen_ctx,(MIR_insn_t)type_regs._24_8_);
        set_int64(puVar123,sVar90,8);
        VARR_uint64_tpush(gen_ctx->target_ctx->abs_address_locs,uVar158);
      }
    }
    while (sVar90 = VARR_uint8_tlength(gen_ctx->target_ctx->result_code), (sVar90 & 0xf) != 0) {
      VARR_uint8_tpush(gen_ctx->target_ctx->result_code,'\0');
    }
    for (uVar149 = 0; sVar90 = VARR_const_ref_tlength(gen_ctx->target_ctx->const_refs),
        uVar149 < sVar90; uVar149 = uVar149 + 1) {
      VARR_const_ref_tget((const_ref_t *)type_regs,gen_ctx->target_ctx->const_refs,uVar149);
      puVar123 = VARR_uint8_taddr(gen_ctx->target_ctx->result_code);
      puVar123 = puVar123 + type_regs._16_8_;
      sVar90 = VARR_uint8_tlength(gen_ctx->target_ctx->result_code);
      set_int64(puVar123,sVar90 - type_regs._24_8_,4);
      uVar124 = VARR_uint64_tget(gen_ctx->target_ctx->const_pool,type_regs._32_8_);
      put_uint64(gen_ctx,uVar124,8);
      put_uint64(gen_ctx,0,8);
    }
    sVar90 = VARR_uint8_tlength(gen_ctx->target_ctx->result_code);
    puVar125 = VARR_uint8_taddr(gen_ctx->target_ctx->result_code);
    puVar123 = _MIR_publish_code(local_378,puVar125,sVar90);
    ((local_2e0->u).func)->call_addr = puVar123;
    base = (uint8_t *)((local_2e0->u).func)->call_addr;
    VARR_MIR_code_reloc_ttrunc(gen_ctx->target_ctx->relocs,(size_t)puVar125);
    for (uVar149 = 0; sVar141 = VARR_uint64_tlength(gen_ctx->target_ctx->abs_address_locs),
        uVar149 < sVar141; uVar149 = uVar149 + 1) {
      uVar155 = uVar149;
      uVar124 = VARR_uint64_tget(gen_ctx->target_ctx->abs_address_locs,uVar149);
      iVar126 = get_int64(base + uVar124,(int)uVar155);
      obj_00.value = base + iVar126;
      obj_00.offset = uVar124;
      VARR_MIR_code_reloc_tpush(gen_ctx->target_ctx->relocs,obj_00);
    }
    pMVar15 = gen_ctx->ctx;
    sVar141 = VARR_MIR_code_reloc_tlength(gen_ctx->target_ctx->relocs);
    relocs = VARR_MIR_code_reloc_taddr(gen_ctx->target_ctx->relocs);
    _MIR_update_code_arr(pMVar15,base,sVar141,relocs);
    change_calls(gen_ctx,base);
    ppMVar134 = &((gen_ctx->curr_func_item->u).func)->first_lref;
    while (pMVar17 = *ppMVar134, pMVar17 != (MIR_lref_data *)0x0) {
      sVar141 = get_label_disp(gen_ctx,pMVar17->label);
      lVar135 = pMVar17->disp;
      puVar125 = base;
      if (pMVar17->label2 != (MIR_insn_t)0x0) {
        sVar122 = get_label_disp(gen_ctx,pMVar17->label2);
        puVar125 = (uint8_t *)-sVar122;
      }
      *(uint8_t **)pMVar17->load_addr = puVar125 + sVar141 + lVar135;
      ppMVar134 = &pMVar17->next;
    }
    if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      _MIR_dump_code((char *)0x0,puVar123,sVar90);
      fprintf((FILE *)gen_ctx->debug_file,"code size = %lu:\n",sVar90);
    }
    pcVar88 = (char *)local_2e0->addr;
    _MIR_redirect_thunk(local_378,pcVar88,((local_2e0->u).func)->call_addr);
  }
  if (gen_ctx->optimize_level != 0) {
    destroy_loop_tree((gen_ctx_t)gen_ctx->curr_cfg->root_loop_node,(loop_node_t_conflict)pcVar88);
  }
  pMVar32 = gen_ctx->curr_func_item;
  if ((pMVar32->item_type != MIR_func_item) || (pMVar32->data == (void *)0x0)) {
    __assert_fail("gen_ctx->curr_func_item->item_type == MIR_func_item && gen_ctx->curr_func_item->data != ((void*)0)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x751,"void destroy_func_cfg(gen_ctx_t)");
  }
  pDVar127 = &((pMVar32->u).func)->insns;
  while (pMVar137 = pDVar127->head, pMVar137 != (MIR_insn_t)0x0) {
    pbVar103 = (bb_insn_t_conflict)pMVar137->data;
    if (gen_ctx->optimize_level == 0) {
      if (pbVar103 == (bb_insn_t_conflict)0x0) {
        __assert_fail("insn->data != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x755,"void destroy_func_cfg(gen_ctx_t)");
      }
      delete_insn_data(pMVar137);
    }
    else {
      if (pbVar103 == (bb_insn_t_conflict)0x0) {
        __assert_fail("bb_insn != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x759,"void destroy_func_cfg(gen_ctx_t)");
      }
      delete_bb_insn(gen_ctx,pbVar103);
    }
    pDVar127 = (DLIST_MIR_insn_t *)&(pMVar137->insn_link).next;
  }
  pbVar96 = (gen_ctx->curr_cfg->bbs).head;
  while (pbVar96 != (bb_t_conflict)0x0) {
    pbVar117 = (pbVar96->bb_link).next;
    delete_bb(gen_ctx,pbVar96);
    pbVar96 = pbVar117;
  }
  pfVar89 = gen_ctx->curr_cfg;
  pVVar100 = pfVar89->reg_info;
  if ((pVVar100 == (VARR_reg_info_t *)0x0) || (pVVar100->varr == (reg_info_t *)0x0)) {
    mir_varr_assert_fail("destroy","reg_info_t");
  }
  free(pVVar100->varr);
  free(pVVar100);
  pfVar89->reg_info = (VARR_reg_info_t *)0x0;
  bitmap_destroy(gen_ctx->curr_cfg->call_crossed_regs);
  free(gen_ctx->curr_func_item->data);
  pMVar32 = local_2e0;
  gen_ctx->curr_func_item->data = (void *)0x0;
  if (local_36c == 0) {
    return (void *)0x0;
  }
  pFVar130 = (FILE *)gen_ctx->debug_file;
  if ((pFVar130 != (FILE *)0x0) && (-1 < gen_ctx->debug_level)) {
    pcVar88 = MIR_item_name(local_378,local_2e0);
    lVar135 = 0;
    for (pDVar127 = &((pMVar32->u).func)->insns; pDVar127->head != (MIR_insn_t_conflict)0x0;
        pDVar127 = (DLIST_MIR_insn_t *)&(pDVar127->head->insn_link).next) {
      lVar135 = lVar135 + 1;
    }
    dVar161 = real_usec_time();
    fprintf(pFVar130,
            "  Code generation for %s: %lu MIR insns (addr=%llx, len=%lu) -- time %.2f ms\n",
            (dVar161 - dVar160) / 1000.0,pcVar88,lVar135,puVar123,sVar90);
  }
  pMVar32 = local_2e0;
  _MIR_restore_func_insns(local_378,local_2e0);
  ppvVar154 = &pMVar32->addr;
  ((pMVar32->u).func)->machine_code = puVar123;
  goto LAB_00129a53;
code_r0x00121f4a:
  VARR_MIR_op_ttrunc(gen_ctx->temp_ops,(size_t)pbVar96);
  for (uVar149 = 0; sVar90 = VARR_MIR_var_tlength(pMVar16->global_vars), uVar149 < sVar90;
      uVar149 = uVar149 + 1) {
    VARR_MIR_var_tget((MIR_var_t *)&op_num_1,pMVar16->global_vars,uVar149);
    MVar76 = MIR_reg(pMVar15,(char *)pMStack_360,pMVar16);
    varr = gen_ctx->temp_ops;
    _MIR_new_var_op(pMVar15,MVar76 + 0x21);
    obj.data._1_1_ = type_regs[0]._1_1_;
    obj.data._0_1_ = (char)type_regs[0];
    obj.data._2_6_ = type_regs._2_6_;
    in_ZMM1 = ZEXT1664(CONCAT88(type_regs._24_8_,type_regs._16_8_));
    obj._8_4_ = type_regs[2];
    obj._12_4_ = type_regs[3];
    obj.u._0_4_ = type_regs[4];
    obj.u._4_4_ = type_regs[5];
    obj.u.str.s = (char *)type_regs._24_8_;
    obj.u._16_4_ = type_regs[8];
    obj.u._20_4_ = type_regs[9];
    obj.u._24_4_ = type_regs[10];
    obj.u._28_4_ = type_regs[0xb];
    VARR_MIR_op_tpush(varr,obj);
  }
  sVar90 = VARR_MIR_op_tlength(gen_ctx->temp_ops);
  pMVar94 = VARR_MIR_op_taddr(gen_ctx->temp_ops);
  local_3e0 = (FILE *)MIR_new_insn_arr(pMVar15,MIR_USE,sVar90,pMVar94);
  pbVar96 = (bb_t_conflict)gen_ctx->curr_func_item;
  MIR_insert_insn_before
            (pMVar15,(MIR_item_t_conflict)pbVar96,(MIR_insn_t_conflict)pbVar112,
             (MIR_insn_t_conflict)local_3e0);
  local_3f8 = pbVar112;
  goto LAB_00121ef0;
LAB_00122a17:
  iVar78 = bitmap_bit_p(gen_ctx->addr_regs,(ulong)pMVar93->ops[0].u.reg);
  if (iVar78 != 0) {
    pFVar130 = (FILE *)gen_ctx->debug_file;
    if ((pFVar130 != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      pcVar88 = "  deleting phi for pseudo transformed into memory ";
      sStackY_4a0 = 0x32;
      goto LAB_00123186;
    }
LAB_0012319e:
    ssa_delete_insn(gen_ctx,pMVar93);
  }
  goto LAB_001228f2;
code_r0x001236bc:
  if (pVVar19->varr == (expr_t *)0x0) {
    pcVar88 = "pop";
    goto LAB_00129cf8;
  }
  pcVar88 = (char *)(sVar90 - 1);
  pVVar19->els_num = (size_t)pcVar88;
  free(pVVar19->varr[sVar90 - 1]);
  goto LAB_001236a0;
}

Assistant:

static void *generate_func_code (MIR_context_t ctx, MIR_item_t func_item, int machine_code_p) {
  gen_ctx_t gen_ctx = *gen_ctx_loc (ctx);
  uint8_t *code;
  void *machine_code = NULL;
  size_t code_len = 0;
  double start_time = real_usec_time ();
  uint32_t bbs_num;

  gen_assert (func_item->item_type == MIR_func_item && func_item->data == NULL);
  if (func_item->u.func->machine_code != NULL) {
    gen_assert (func_item->u.func->call_addr != NULL);
    _MIR_redirect_thunk (ctx, func_item->addr, func_item->u.func->call_addr);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++The code for %s has been already generated\n",
               MIR_item_name (ctx, func_item));
    });
    return func_item->addr;
  }
  DEBUG (0, {
    fprintf (debug_file, "Code generation of function %s:\n", MIR_item_name (ctx, func_item));
  });
  DEBUG (2, {
    fprintf (debug_file, "+++++++++++++MIR before generator:\n");
    MIR_output_item (ctx, debug_file, func_item);
  });
  curr_func_item = func_item;
  _MIR_duplicate_func_insns (ctx, func_item);
  curr_cfg = func_item->data = gen_malloc (gen_ctx, sizeof (struct func_cfg));
  build_func_cfg (gen_ctx);
  bbs_num = curr_bb_index;
  DEBUG (2, {
    fprintf (debug_file, "+++++++++++++MIR after building CFG:\n");
    print_CFG (gen_ctx, TRUE, FALSE, TRUE, FALSE, NULL);
  });
  if (optimize_level >= 2 && !addr_insn_p && clone_bbs (gen_ctx)) {
    /* do not clone bbs before addr transformation: it can prevent addr transformations */
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after cloning BBs:\n");
      print_CFG (gen_ctx, TRUE, FALSE, TRUE, FALSE, NULL);
    });
  }
  if (optimize_level >= 2) {
    build_ssa (gen_ctx, !addr_insn_p);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after building SSA%s:\n",
               addr_insn_p ? " for address transformation" : "");
      print_varr_insns (gen_ctx, "undef init", undef_insns);
      print_varr_insns (gen_ctx, "arg init", arg_bb_insns);
      fprintf (debug_file, "\n");
      print_CFG (gen_ctx, TRUE, FALSE, TRUE, TRUE, NULL);
    });
  }
  if (optimize_level >= 2 && addr_insn_p) {
    DEBUG (2, { fprintf (debug_file, "+++++++++++++Transform Addr Insns and cloning BBs:\n"); });
    transform_addrs (gen_ctx);
    undo_build_ssa (gen_ctx);
    clone_bbs (gen_ctx);
    build_ssa (gen_ctx, TRUE);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after Addr Insns Transformation and cloning BBs:\n");
      print_varr_insns (gen_ctx, "undef init", undef_insns);
      print_varr_insns (gen_ctx, "arg init", arg_bb_insns);
      fprintf (debug_file, "\n");
      print_CFG (gen_ctx, TRUE, FALSE, TRUE, TRUE, NULL);
    });
  }
  if (optimize_level >= 2) {
    DEBUG (2, { fprintf (debug_file, "+++++++++++++GVN:\n"); });
    gvn (gen_ctx);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after GVN:\n");
      print_CFG (gen_ctx, TRUE, FALSE, TRUE, TRUE, NULL);
    });
    gvn_clear (gen_ctx);
  }
  if (optimize_level >= 2) {
    DEBUG (2, { fprintf (debug_file, "+++++++++++++Copy Propagation:\n"); });
    copy_prop (gen_ctx);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after Copy Propagation:\n");
      print_CFG (gen_ctx, TRUE, FALSE, TRUE, TRUE, NULL);
    });
  }
  if (optimize_level >= 2) {
    DEBUG (2, { fprintf (debug_file, "+++++++++++++DSE:\n"); });
    dse (gen_ctx);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after DSE:\n");
      print_CFG (gen_ctx, TRUE, FALSE, TRUE, TRUE, NULL);
    });
  }
  if (optimize_level >= 2) {
    ssa_dead_code_elimination (gen_ctx);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after dead code elimination:\n");
      print_CFG (gen_ctx, TRUE, TRUE, TRUE, TRUE, NULL);
    });
  }
  if (optimize_level >= 2) {
    build_loop_tree (gen_ctx);
    DEBUG (2, { print_loop_tree (gen_ctx, TRUE); });
    if (licm (gen_ctx)) {
      DEBUG (2, {
        fprintf (debug_file, "+++++++++++++MIR after loop invariant motion:\n");
        print_CFG (gen_ctx, TRUE, TRUE, TRUE, TRUE, NULL);
      });
    }
    destroy_loop_tree (gen_ctx, curr_cfg->root_loop_node);
    curr_cfg->root_loop_node = NULL;
  }
  if (optimize_level >= 2 && pressure_relief (gen_ctx)) {
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after pressure relief:\n");
      print_CFG (gen_ctx, TRUE, TRUE, TRUE, TRUE, NULL);
    });
  }
  if (optimize_level >= 2) {
    make_conventional_ssa (gen_ctx);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after transformation to conventional SSA:\n");
      print_CFG (gen_ctx, TRUE, TRUE, TRUE, TRUE, NULL);
    });
    ssa_combine (gen_ctx);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after ssa combine:\n");
      print_CFG (gen_ctx, TRUE, TRUE, TRUE, TRUE, NULL);
    });
    undo_build_ssa (gen_ctx);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after destroying ssa:\n");
      print_varr_insns (gen_ctx, "undef init", undef_insns);
      print_varr_insns (gen_ctx, "arg init", arg_bb_insns);
      fprintf (debug_file, "\n");
      print_CFG (gen_ctx, TRUE, FALSE, TRUE, TRUE, NULL);
    });
  }
  if (optimize_level >= 2) {
    DEBUG (2, { fprintf (debug_file, "+++++++++++++Jump optimization:\n"); });
    jump_opt (gen_ctx);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after Jump optimization:\n");
      print_CFG (gen_ctx, TRUE, FALSE, TRUE, TRUE, NULL);
    });
  }
  target_machinize (gen_ctx);
  make_io_dup_op_insns (gen_ctx);
  DEBUG (2, {
    fprintf (debug_file, "+++++++++++++MIR after machinize:\n");
    print_CFG (gen_ctx, FALSE, FALSE, TRUE, TRUE, NULL);
  });
  if (optimize_level >= 1) {
    build_loop_tree (gen_ctx);
    DEBUG (2, { print_loop_tree (gen_ctx, TRUE); });
  }
  if (optimize_level >= 2) {
    collect_moves (gen_ctx);
    if (consider_move_vars_only (gen_ctx)) {
      calculate_func_cfg_live_info (gen_ctx, FALSE);
      print_live_info (gen_ctx, "Live info before coalesce", TRUE, FALSE);
      coalesce (gen_ctx);
      DEBUG (2, {
        fprintf (debug_file, "+++++++++++++MIR after coalescing:\n");
        print_CFG (gen_ctx, TRUE, TRUE, TRUE, TRUE, output_bb_border_live_info);
      });
    }
  }
  consider_all_live_vars (gen_ctx);
  calculate_func_cfg_live_info (gen_ctx, TRUE);
  print_live_info (gen_ctx, "Live info before RA", optimize_level > 0, TRUE);
  reg_alloc (gen_ctx);
  DEBUG (2, {
    fprintf (debug_file, "+++++++++++++MIR after RA:\n");
    print_CFG (gen_ctx, TRUE, FALSE, TRUE, FALSE, NULL);
  });
  if (optimize_level < 2 && machine_code_p) remove_property_insns (gen_ctx);
  if (optimize_level >= 1) {
    consider_all_live_vars (gen_ctx);
    calculate_func_cfg_live_info (gen_ctx, FALSE);
    add_bb_insn_dead_vars (gen_ctx);
    print_live_info (gen_ctx, "Live info before combine", FALSE, FALSE);
    combine (gen_ctx, machine_code_p); /* After combine the BB live info is still valid */
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after combine:\n");
      print_CFG (gen_ctx, FALSE, FALSE, TRUE, FALSE, NULL);
    });
    dead_code_elimination (gen_ctx);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after dead code elimination after 2nd combine:\n");
      print_CFG (gen_ctx, TRUE, TRUE, TRUE, FALSE, output_bb_live_info);
    });
  }
  target_make_prolog_epilog (gen_ctx, func_used_hard_regs, func_stack_slots_num);
  target_split_insns (gen_ctx);
  DEBUG (2, {
    fprintf (debug_file, "+++++++++++++MIR after forming prolog/epilog and insn splitting:\n");
    print_CFG (gen_ctx, FALSE, FALSE, TRUE, TRUE, NULL);
  });
  if (machine_code_p) {
    code = target_translate (gen_ctx, &code_len);
    machine_code = func_item->u.func->call_addr = _MIR_publish_code (ctx, code, code_len);
    target_rebase (gen_ctx, func_item->u.func->call_addr);
#if MIR_GEN_CALL_TRACE
    func_item->u.func->call_addr = _MIR_get_wrapper (ctx, func_item, print_and_execute_wrapper);
#endif
    DEBUG (2, {
      _MIR_dump_code (NULL, machine_code, code_len);
      fprintf (debug_file, "code size = %lu:\n", (unsigned long) code_len);
    });
    _MIR_redirect_thunk (ctx, func_item->addr, func_item->u.func->call_addr);
  }
  if (optimize_level != 0) destroy_loop_tree (gen_ctx, curr_cfg->root_loop_node);
  destroy_func_cfg (gen_ctx);
  if (collect_bb_stat_p) overall_bbs_num += bbs_num;
  if (!machine_code_p) return NULL;
  DEBUG (0, {
    fprintf (debug_file,
             "  Code generation for %s: %lu MIR insns (addr=%llx, len=%lu) -- time %.2f ms\n",
             MIR_item_name (ctx, func_item),
             (long unsigned) DLIST_LENGTH (MIR_insn_t, func_item->u.func->insns),
             (unsigned long long) machine_code, (unsigned long) code_len,
             (real_usec_time () - start_time) / 1000.0);
  });
  _MIR_restore_func_insns (ctx, func_item);
  /* ??? We should use atomic here but c2mir does not implement them yet.  */
  func_item->u.func->machine_code = machine_code;
  return func_item->addr;
}